

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Primitive PVar27;
  Geometry *pGVar28;
  __int_type_conflict _Var29;
  long lVar30;
  long lVar31;
  RTCFilterFunctionN p_Var32;
  RTCRayQueryContext *pRVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  bool bVar96;
  bool bVar97;
  bool bVar98;
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar117;
  ulong uVar118;
  uint uVar119;
  long lVar120;
  long lVar121;
  uint uVar122;
  long lVar123;
  ulong uVar124;
  ulong uVar125;
  bool bVar126;
  float fVar127;
  float fVar129;
  float fVar161;
  float fVar163;
  __m128 a;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar128;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar170;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar171;
  float fVar210;
  float fVar212;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar214;
  undefined1 auVar191 [32];
  float fVar211;
  undefined1 auVar192 [32];
  float fVar213;
  float fVar215;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar239;
  float fVar259;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [28];
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar262;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  float fVar263;
  float fVar279;
  float fVar281;
  float fVar282;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar274 [28];
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  undefined1 auVar277 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar278 [32];
  float fVar289;
  float fVar306;
  float fVar308;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar297 [32];
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar298 [32];
  float fVar318;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar319;
  float fVar320;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar331;
  float fVar333;
  float fVar337;
  float fVar339;
  float fVar341;
  undefined1 auVar324 [32];
  float fVar335;
  undefined1 auVar325 [32];
  float fVar332;
  float fVar334;
  float fVar336;
  float fVar338;
  float fVar340;
  float fVar342;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar343;
  float fVar356;
  float fVar357;
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar365;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar358;
  float fVar360;
  float fVar362;
  float fVar364;
  float fVar366;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [64];
  float fVar367;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar380;
  float fVar383;
  float fVar389;
  float fVar392;
  float fVar395;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar368;
  float fVar369;
  undefined1 auVar377 [32];
  float fVar381;
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar390;
  float fVar391;
  float fVar393;
  float fVar394;
  float fVar396;
  float fVar397;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar399 [16];
  float fVar398;
  undefined1 auVar400 [28];
  float fVar408;
  float fVar409;
  float fVar411;
  float fVar413;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float fVar410;
  float fVar412;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar406 [32];
  undefined1 auVar407 [64];
  undefined1 auVar417 [16];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [16];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  float fVar434;
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  float fVar435;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float in_register_0000151c;
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  float fVar447;
  undefined1 auVar440 [32];
  float fVar448;
  float fVar456;
  float fVar457;
  float fVar458;
  float fVar459;
  float fVar460;
  float fVar461;
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  float fVar462;
  float fVar467;
  float fVar468;
  float fVar469;
  float fVar470;
  float fVar471;
  float fVar472;
  float in_register_0000159c;
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  float fVar473;
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  float fVar474;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float in_register_000015dc;
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined1 (*local_a70) [32];
  ulong local_a68;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  ulong local_760;
  undefined1 auStack_758 [24];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar433 [64];
  
  PVar27 = prim[1];
  uVar124 = (ulong)(byte)PVar27;
  lVar121 = uVar124 * 0x25;
  auVar175 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar175 = vinsertps_avx(auVar175,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar175 = vsubps_avx(auVar175,*(undefined1 (*) [16])(prim + lVar121 + 6));
  fVar239 = *(float *)(prim + lVar121 + 0x12);
  auVar172._0_4_ = fVar239 * auVar175._0_4_;
  auVar172._4_4_ = fVar239 * auVar175._4_4_;
  auVar172._8_4_ = fVar239 * auVar175._8_4_;
  auVar172._12_4_ = fVar239 * auVar175._12_4_;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar290._0_4_ = fVar239 * auVar40._0_4_;
  auVar290._4_4_ = fVar239 * auVar40._4_4_;
  auVar290._8_4_ = fVar239 * auVar40._8_4_;
  auVar290._12_4_ = fVar239 * auVar40._12_4_;
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 10)));
  auVar142._16_16_ = auVar40;
  auVar142._0_16_ = auVar175;
  auVar142 = vcvtdq2ps_avx(auVar142);
  lVar1 = uVar124 * 5;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar228._16_16_ = auVar40;
  auVar228._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 10)));
  auVar151 = vcvtdq2ps_avx(auVar228);
  auVar250._16_16_ = auVar40;
  auVar250._0_16_ = auVar175;
  auVar34 = vcvtdq2ps_avx(auVar250);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 10)));
  auVar251._16_16_ = auVar40;
  auVar251._0_16_ = auVar175;
  auVar35 = vcvtdq2ps_avx(auVar251);
  lVar123 = (ulong)(byte)PVar27 * 0x10;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 10)));
  auVar324._16_16_ = auVar40;
  auVar324._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar124 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar324);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar124 + 10)));
  auVar344._16_16_ = auVar40;
  auVar344._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 6)));
  auVar37 = vcvtdq2ps_avx(auVar344);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 10)));
  auVar345._16_16_ = auVar40;
  auVar345._0_16_ = auVar175;
  auVar378 = vcvtdq2ps_avx(auVar345);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 10)));
  auVar401._16_16_ = auVar40;
  auVar401._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 10)));
  auVar38 = vcvtdq2ps_avx(auVar401);
  auVar418._16_16_ = auVar40;
  auVar418._0_16_ = auVar175;
  auVar39 = vcvtdq2ps_avx(auVar418);
  auVar175 = vshufps_avx(auVar290,auVar290,0);
  auVar40 = vshufps_avx(auVar290,auVar290,0x55);
  auVar180 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar239 = auVar180._0_4_;
  fVar318 = auVar180._4_4_;
  fVar258 = auVar180._8_4_;
  fVar129 = auVar180._12_4_;
  fVar238 = auVar40._0_4_;
  fVar280 = auVar40._4_4_;
  fVar259 = auVar40._8_4_;
  fVar211 = auVar40._12_4_;
  fVar260 = auVar175._0_4_;
  fVar261 = auVar175._4_4_;
  fVar262 = auVar175._8_4_;
  fVar263 = auVar175._12_4_;
  auVar436._0_4_ = fVar260 * auVar142._0_4_ + fVar238 * auVar151._0_4_ + fVar239 * auVar34._0_4_;
  auVar436._4_4_ = fVar261 * auVar142._4_4_ + fVar280 * auVar151._4_4_ + fVar318 * auVar34._4_4_;
  auVar436._8_4_ = fVar262 * auVar142._8_4_ + fVar259 * auVar151._8_4_ + fVar258 * auVar34._8_4_;
  auVar436._12_4_ = fVar263 * auVar142._12_4_ + fVar211 * auVar151._12_4_ + fVar129 * auVar34._12_4_
  ;
  auVar436._16_4_ = fVar260 * auVar142._16_4_ + fVar238 * auVar151._16_4_ + fVar239 * auVar34._16_4_
  ;
  auVar436._20_4_ = fVar261 * auVar142._20_4_ + fVar280 * auVar151._20_4_ + fVar318 * auVar34._20_4_
  ;
  auVar436._24_4_ = fVar262 * auVar142._24_4_ + fVar259 * auVar151._24_4_ + fVar258 * auVar34._24_4_
  ;
  auVar436._28_4_ = fVar211 + in_register_000015dc + in_register_0000151c;
  auVar426._0_4_ = fVar260 * auVar35._0_4_ + fVar238 * auVar36._0_4_ + auVar37._0_4_ * fVar239;
  auVar426._4_4_ = fVar261 * auVar35._4_4_ + fVar280 * auVar36._4_4_ + auVar37._4_4_ * fVar318;
  auVar426._8_4_ = fVar262 * auVar35._8_4_ + fVar259 * auVar36._8_4_ + auVar37._8_4_ * fVar258;
  auVar426._12_4_ = fVar263 * auVar35._12_4_ + fVar211 * auVar36._12_4_ + auVar37._12_4_ * fVar129;
  auVar426._16_4_ = fVar260 * auVar35._16_4_ + fVar238 * auVar36._16_4_ + auVar37._16_4_ * fVar239;
  auVar426._20_4_ = fVar261 * auVar35._20_4_ + fVar280 * auVar36._20_4_ + auVar37._20_4_ * fVar318;
  auVar426._24_4_ = fVar262 * auVar35._24_4_ + fVar259 * auVar36._24_4_ + auVar37._24_4_ * fVar258;
  auVar426._28_4_ = fVar211 + in_register_000015dc + in_register_0000159c;
  auVar297._0_4_ = fVar260 * auVar378._0_4_ + fVar238 * auVar38._0_4_ + auVar39._0_4_ * fVar239;
  auVar297._4_4_ = fVar261 * auVar378._4_4_ + fVar280 * auVar38._4_4_ + auVar39._4_4_ * fVar318;
  auVar297._8_4_ = fVar262 * auVar378._8_4_ + fVar259 * auVar38._8_4_ + auVar39._8_4_ * fVar258;
  auVar297._12_4_ = fVar263 * auVar378._12_4_ + fVar211 * auVar38._12_4_ + auVar39._12_4_ * fVar129;
  auVar297._16_4_ = fVar260 * auVar378._16_4_ + fVar238 * auVar38._16_4_ + auVar39._16_4_ * fVar239;
  auVar297._20_4_ = fVar261 * auVar378._20_4_ + fVar280 * auVar38._20_4_ + auVar39._20_4_ * fVar318;
  auVar297._24_4_ = fVar262 * auVar378._24_4_ + fVar259 * auVar38._24_4_ + auVar39._24_4_ * fVar258;
  auVar297._28_4_ = fVar263 + fVar211 + fVar129;
  auVar175 = vshufps_avx(auVar172,auVar172,0);
  auVar40 = vshufps_avx(auVar172,auVar172,0x55);
  auVar180 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar239 = auVar180._0_4_;
  fVar318 = auVar180._4_4_;
  fVar258 = auVar180._8_4_;
  fVar129 = auVar180._12_4_;
  fVar261 = auVar40._0_4_;
  fVar262 = auVar40._4_4_;
  fVar263 = auVar40._8_4_;
  fVar279 = auVar40._12_4_;
  fVar238 = auVar151._28_4_ + auVar34._28_4_;
  fVar280 = auVar175._0_4_;
  fVar259 = auVar175._4_4_;
  fVar211 = auVar175._8_4_;
  fVar260 = auVar175._12_4_;
  auVar188._0_4_ = fVar280 * auVar142._0_4_ + fVar261 * auVar151._0_4_ + fVar239 * auVar34._0_4_;
  auVar188._4_4_ = fVar259 * auVar142._4_4_ + fVar262 * auVar151._4_4_ + fVar318 * auVar34._4_4_;
  auVar188._8_4_ = fVar211 * auVar142._8_4_ + fVar263 * auVar151._8_4_ + fVar258 * auVar34._8_4_;
  auVar188._12_4_ = fVar260 * auVar142._12_4_ + fVar279 * auVar151._12_4_ + fVar129 * auVar34._12_4_
  ;
  auVar188._16_4_ = fVar280 * auVar142._16_4_ + fVar261 * auVar151._16_4_ + fVar239 * auVar34._16_4_
  ;
  auVar188._20_4_ = fVar259 * auVar142._20_4_ + fVar262 * auVar151._20_4_ + fVar318 * auVar34._20_4_
  ;
  auVar188._24_4_ = fVar211 * auVar142._24_4_ + fVar263 * auVar151._24_4_ + fVar258 * auVar34._24_4_
  ;
  auVar188._28_4_ = auVar142._28_4_ + fVar238;
  auVar143._0_4_ = fVar280 * auVar35._0_4_ + auVar37._0_4_ * fVar239 + fVar261 * auVar36._0_4_;
  auVar143._4_4_ = fVar259 * auVar35._4_4_ + auVar37._4_4_ * fVar318 + fVar262 * auVar36._4_4_;
  auVar143._8_4_ = fVar211 * auVar35._8_4_ + auVar37._8_4_ * fVar258 + fVar263 * auVar36._8_4_;
  auVar143._12_4_ = fVar260 * auVar35._12_4_ + auVar37._12_4_ * fVar129 + fVar279 * auVar36._12_4_;
  auVar143._16_4_ = fVar280 * auVar35._16_4_ + auVar37._16_4_ * fVar239 + fVar261 * auVar36._16_4_;
  auVar143._20_4_ = fVar259 * auVar35._20_4_ + auVar37._20_4_ * fVar318 + fVar262 * auVar36._20_4_;
  auVar143._24_4_ = fVar211 * auVar35._24_4_ + auVar37._24_4_ * fVar258 + fVar263 * auVar36._24_4_;
  auVar143._28_4_ = auVar142._28_4_ + auVar37._28_4_ + auVar34._28_4_;
  auVar346._8_4_ = 0x7fffffff;
  auVar346._0_8_ = 0x7fffffff7fffffff;
  auVar346._12_4_ = 0x7fffffff;
  auVar346._16_4_ = 0x7fffffff;
  auVar346._20_4_ = 0x7fffffff;
  auVar346._24_4_ = 0x7fffffff;
  auVar346._28_4_ = 0x7fffffff;
  auVar372._8_4_ = 0x219392ef;
  auVar372._0_8_ = 0x219392ef219392ef;
  auVar372._12_4_ = 0x219392ef;
  auVar372._16_4_ = 0x219392ef;
  auVar372._20_4_ = 0x219392ef;
  auVar372._24_4_ = 0x219392ef;
  auVar372._28_4_ = 0x219392ef;
  auVar142 = vandps_avx(auVar436,auVar346);
  auVar142 = vcmpps_avx(auVar142,auVar372,1);
  auVar151 = vblendvps_avx(auVar436,auVar372,auVar142);
  auVar142 = vandps_avx(auVar426,auVar346);
  auVar142 = vcmpps_avx(auVar142,auVar372,1);
  auVar34 = vblendvps_avx(auVar426,auVar372,auVar142);
  auVar142 = vandps_avx(auVar297,auVar346);
  auVar142 = vcmpps_avx(auVar142,auVar372,1);
  auVar142 = vblendvps_avx(auVar297,auVar372,auVar142);
  auVar229._0_4_ = fVar280 * auVar378._0_4_ + fVar261 * auVar38._0_4_ + auVar39._0_4_ * fVar239;
  auVar229._4_4_ = fVar259 * auVar378._4_4_ + fVar262 * auVar38._4_4_ + auVar39._4_4_ * fVar318;
  auVar229._8_4_ = fVar211 * auVar378._8_4_ + fVar263 * auVar38._8_4_ + auVar39._8_4_ * fVar258;
  auVar229._12_4_ = fVar260 * auVar378._12_4_ + fVar279 * auVar38._12_4_ + auVar39._12_4_ * fVar129;
  auVar229._16_4_ = fVar280 * auVar378._16_4_ + fVar261 * auVar38._16_4_ + auVar39._16_4_ * fVar239;
  auVar229._20_4_ = fVar259 * auVar378._20_4_ + fVar262 * auVar38._20_4_ + auVar39._20_4_ * fVar318;
  auVar229._24_4_ = fVar211 * auVar378._24_4_ + fVar263 * auVar38._24_4_ + auVar39._24_4_ * fVar258;
  auVar229._28_4_ = fVar238 + auVar36._28_4_ + fVar129;
  auVar35 = vrcpps_avx(auVar151);
  fVar239 = auVar35._0_4_;
  fVar258 = auVar35._4_4_;
  auVar36._4_4_ = auVar151._4_4_ * fVar258;
  auVar36._0_4_ = auVar151._0_4_ * fVar239;
  fVar238 = auVar35._8_4_;
  auVar36._8_4_ = auVar151._8_4_ * fVar238;
  fVar259 = auVar35._12_4_;
  auVar36._12_4_ = auVar151._12_4_ * fVar259;
  fVar260 = auVar35._16_4_;
  auVar36._16_4_ = auVar151._16_4_ * fVar260;
  fVar261 = auVar35._20_4_;
  auVar36._20_4_ = auVar151._20_4_ * fVar261;
  fVar262 = auVar35._24_4_;
  auVar36._24_4_ = auVar151._24_4_ * fVar262;
  auVar36._28_4_ = auVar151._28_4_;
  auVar373._8_4_ = 0x3f800000;
  auVar373._0_8_ = &DAT_3f8000003f800000;
  auVar373._12_4_ = 0x3f800000;
  auVar373._16_4_ = 0x3f800000;
  auVar373._20_4_ = 0x3f800000;
  auVar373._24_4_ = 0x3f800000;
  auVar373._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar373,auVar36);
  auVar36 = vrcpps_avx(auVar34);
  fVar239 = fVar239 + fVar239 * auVar37._0_4_;
  fVar258 = fVar258 + fVar258 * auVar37._4_4_;
  fVar238 = fVar238 + fVar238 * auVar37._8_4_;
  fVar259 = fVar259 + fVar259 * auVar37._12_4_;
  fVar260 = fVar260 + fVar260 * auVar37._16_4_;
  fVar261 = fVar261 + fVar261 * auVar37._20_4_;
  fVar262 = fVar262 + fVar262 * auVar37._24_4_;
  fVar263 = auVar36._0_4_;
  fVar279 = auVar36._4_4_;
  auVar151._4_4_ = fVar279 * auVar34._4_4_;
  auVar151._0_4_ = fVar263 * auVar34._0_4_;
  fVar281 = auVar36._8_4_;
  auVar151._8_4_ = fVar281 * auVar34._8_4_;
  fVar282 = auVar36._12_4_;
  auVar151._12_4_ = fVar282 * auVar34._12_4_;
  fVar283 = auVar36._16_4_;
  auVar151._16_4_ = fVar283 * auVar34._16_4_;
  fVar285 = auVar36._20_4_;
  auVar151._20_4_ = fVar285 * auVar34._20_4_;
  fVar287 = auVar36._24_4_;
  auVar151._24_4_ = fVar287 * auVar34._24_4_;
  auVar151._28_4_ = auVar34._28_4_;
  auVar34 = vsubps_avx(auVar373,auVar151);
  fVar263 = fVar263 + fVar263 * auVar34._0_4_;
  fVar279 = fVar279 + fVar279 * auVar34._4_4_;
  fVar281 = fVar281 + fVar281 * auVar34._8_4_;
  fVar282 = fVar282 + fVar282 * auVar34._12_4_;
  fVar283 = fVar283 + fVar283 * auVar34._16_4_;
  fVar285 = fVar285 + fVar285 * auVar34._20_4_;
  fVar287 = fVar287 + fVar287 * auVar34._24_4_;
  auVar151 = vrcpps_avx(auVar142);
  fVar289 = auVar151._0_4_;
  fVar306 = auVar151._4_4_;
  auVar378._4_4_ = fVar306 * auVar142._4_4_;
  auVar378._0_4_ = fVar289 * auVar142._0_4_;
  fVar308 = auVar151._8_4_;
  auVar378._8_4_ = fVar308 * auVar142._8_4_;
  fVar310 = auVar151._12_4_;
  auVar378._12_4_ = fVar310 * auVar142._12_4_;
  fVar312 = auVar151._16_4_;
  auVar378._16_4_ = fVar312 * auVar142._16_4_;
  fVar314 = auVar151._20_4_;
  auVar378._20_4_ = fVar314 * auVar142._20_4_;
  fVar316 = auVar151._24_4_;
  auVar378._24_4_ = fVar316 * auVar142._24_4_;
  auVar378._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar373,auVar378);
  fVar289 = fVar289 + fVar289 * auVar142._0_4_;
  fVar306 = fVar306 + fVar306 * auVar142._4_4_;
  fVar308 = fVar308 + fVar308 * auVar142._8_4_;
  fVar310 = fVar310 + fVar310 * auVar142._12_4_;
  fVar312 = fVar312 + fVar312 * auVar142._16_4_;
  fVar314 = fVar314 + fVar314 * auVar142._20_4_;
  fVar316 = fVar316 + fVar316 * auVar142._24_4_;
  auVar175 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar121 + 0x16)) *
                           *(float *)(prim + lVar121 + 0x1a)));
  auVar43 = vshufps_avx(auVar175,auVar175,0);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar175 = vpmovsxwd_avx(auVar175);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar124 * 7 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar347._16_16_ = auVar40;
  auVar347._0_16_ = auVar175;
  auVar142 = vcvtdq2ps_avx(auVar347);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 6);
  auVar175 = vpmovsxwd_avx(auVar180);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 0xe);
  auVar40 = vpmovsxwd_avx(auVar11);
  auVar374._16_16_ = auVar40;
  auVar374._0_16_ = auVar175;
  auVar151 = vcvtdq2ps_avx(auVar374);
  auVar151 = vsubps_avx(auVar151,auVar142);
  fVar318 = auVar43._0_4_;
  fVar129 = auVar43._4_4_;
  fVar280 = auVar43._8_4_;
  fVar211 = auVar43._12_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar175 = vpmovsxwd_avx(auVar43);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar124 * 9 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar134);
  auVar348._0_4_ = auVar151._0_4_ * fVar318 + auVar142._0_4_;
  auVar348._4_4_ = auVar151._4_4_ * fVar129 + auVar142._4_4_;
  auVar348._8_4_ = auVar151._8_4_ * fVar280 + auVar142._8_4_;
  auVar348._12_4_ = auVar151._12_4_ * fVar211 + auVar142._12_4_;
  auVar348._16_4_ = auVar151._16_4_ * fVar318 + auVar142._16_4_;
  auVar348._20_4_ = auVar151._20_4_ * fVar129 + auVar142._20_4_;
  auVar348._24_4_ = auVar151._24_4_ * fVar280 + auVar142._24_4_;
  auVar348._28_4_ = auVar151._28_4_ + auVar142._28_4_;
  auVar375._16_16_ = auVar40;
  auVar375._0_16_ = auVar175;
  auVar142 = vcvtdq2ps_avx(auVar375);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 6);
  auVar175 = vpmovsxwd_avx(auVar221);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 0xe);
  auVar40 = vpmovsxwd_avx(auVar243);
  auVar402._16_16_ = auVar40;
  auVar402._0_16_ = auVar175;
  auVar151 = vcvtdq2ps_avx(auVar402);
  auVar151 = vsubps_avx(auVar151,auVar142);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 6);
  auVar175 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar13);
  auVar376._0_4_ = auVar142._0_4_ + auVar151._0_4_ * fVar318;
  auVar376._4_4_ = auVar142._4_4_ + auVar151._4_4_ * fVar129;
  auVar376._8_4_ = auVar142._8_4_ + auVar151._8_4_ * fVar280;
  auVar376._12_4_ = auVar142._12_4_ + auVar151._12_4_ * fVar211;
  auVar376._16_4_ = auVar142._16_4_ + auVar151._16_4_ * fVar318;
  auVar376._20_4_ = auVar142._20_4_ + auVar151._20_4_ * fVar129;
  auVar376._24_4_ = auVar142._24_4_ + auVar151._24_4_ * fVar280;
  auVar376._28_4_ = auVar142._28_4_ + auVar151._28_4_;
  auVar403._16_16_ = auVar40;
  auVar403._0_16_ = auVar175;
  auVar142 = vcvtdq2ps_avx(auVar403);
  uVar118 = (ulong)(uint)((int)lVar1 << 2);
  lVar121 = uVar124 * 2 + uVar118;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar175 = vpmovsxwd_avx(auVar14);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar179);
  auVar419._16_16_ = auVar40;
  auVar419._0_16_ = auVar175;
  auVar151 = vcvtdq2ps_avx(auVar419);
  auVar151 = vsubps_avx(auVar151,auVar142);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar118 + 6);
  auVar175 = vpmovsxwd_avx(auVar15);
  auVar404._0_4_ = auVar142._0_4_ + auVar151._0_4_ * fVar318;
  auVar404._4_4_ = auVar142._4_4_ + auVar151._4_4_ * fVar129;
  auVar404._8_4_ = auVar142._8_4_ + auVar151._8_4_ * fVar280;
  auVar404._12_4_ = auVar142._12_4_ + auVar151._12_4_ * fVar211;
  auVar404._16_4_ = auVar142._16_4_ + auVar151._16_4_ * fVar318;
  auVar404._20_4_ = auVar142._20_4_ + auVar151._20_4_ * fVar129;
  auVar404._24_4_ = auVar142._24_4_ + auVar151._24_4_ * fVar280;
  auVar404._28_4_ = auVar142._28_4_ + auVar151._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar118 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar16);
  auVar420._16_16_ = auVar40;
  auVar420._0_16_ = auVar175;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 6);
  auVar175 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar18);
  auVar142 = vcvtdq2ps_avx(auVar420);
  auVar427._16_16_ = auVar40;
  auVar427._0_16_ = auVar175;
  auVar151 = vcvtdq2ps_avx(auVar427);
  auVar151 = vsubps_avx(auVar151,auVar142);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 6);
  auVar175 = vpmovsxwd_avx(auVar19);
  auVar421._0_4_ = auVar142._0_4_ + auVar151._0_4_ * fVar318;
  auVar421._4_4_ = auVar142._4_4_ + auVar151._4_4_ * fVar129;
  auVar421._8_4_ = auVar142._8_4_ + auVar151._8_4_ * fVar280;
  auVar421._12_4_ = auVar142._12_4_ + auVar151._12_4_ * fVar211;
  auVar421._16_4_ = auVar142._16_4_ + auVar151._16_4_ * fVar318;
  auVar421._20_4_ = auVar142._20_4_ + auVar151._20_4_ * fVar129;
  auVar421._24_4_ = auVar142._24_4_ + auVar151._24_4_ * fVar280;
  auVar421._28_4_ = auVar142._28_4_ + auVar151._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 0xe);
  auVar40 = vpmovsxwd_avx(auVar20);
  lVar121 = uVar124 + (ulong)(byte)PVar27 * 0x20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar180 = vpmovsxwd_avx(auVar21);
  auVar428._16_16_ = auVar40;
  auVar428._0_16_ = auVar175;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar175 = vpmovsxwd_avx(auVar22);
  auVar437._16_16_ = auVar175;
  auVar437._0_16_ = auVar180;
  auVar142 = vcvtdq2ps_avx(auVar428);
  auVar151 = vcvtdq2ps_avx(auVar437);
  auVar151 = vsubps_avx(auVar151,auVar142);
  auVar429._0_4_ = auVar142._0_4_ + auVar151._0_4_ * fVar318;
  auVar429._4_4_ = auVar142._4_4_ + auVar151._4_4_ * fVar129;
  auVar429._8_4_ = auVar142._8_4_ + auVar151._8_4_ * fVar280;
  auVar429._12_4_ = auVar142._12_4_ + auVar151._12_4_ * fVar211;
  auVar429._16_4_ = auVar142._16_4_ + auVar151._16_4_ * fVar318;
  auVar429._20_4_ = auVar142._20_4_ + auVar151._20_4_ * fVar129;
  auVar429._24_4_ = auVar142._24_4_ + auVar151._24_4_ * fVar280;
  auVar429._28_4_ = auVar142._28_4_ + auVar151._28_4_;
  lVar121 = (ulong)(byte)PVar27 * 0x20 - uVar124;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar175 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar24);
  auVar438._16_16_ = auVar40;
  auVar438._0_16_ = auVar175;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 6);
  auVar175 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 0xe);
  auVar40 = vpmovsxwd_avx(auVar26);
  auVar449._16_16_ = auVar40;
  auVar449._0_16_ = auVar175;
  auVar142 = vcvtdq2ps_avx(auVar438);
  auVar151 = vcvtdq2ps_avx(auVar449);
  auVar151 = vsubps_avx(auVar151,auVar142);
  auVar439._0_4_ = auVar142._0_4_ + auVar151._0_4_ * fVar318;
  auVar439._4_4_ = auVar142._4_4_ + auVar151._4_4_ * fVar129;
  auVar439._8_4_ = auVar142._8_4_ + auVar151._8_4_ * fVar280;
  auVar439._12_4_ = auVar142._12_4_ + auVar151._12_4_ * fVar211;
  auVar439._16_4_ = auVar142._16_4_ + auVar151._16_4_ * fVar318;
  auVar439._20_4_ = auVar142._20_4_ + auVar151._20_4_ * fVar129;
  auVar439._24_4_ = auVar142._24_4_ + auVar151._24_4_ * fVar280;
  auVar439._28_4_ = auVar142._28_4_ + fVar211;
  auVar142 = vsubps_avx(auVar348,auVar188);
  auVar321._0_4_ = fVar239 * auVar142._0_4_;
  auVar321._4_4_ = fVar258 * auVar142._4_4_;
  auVar321._8_4_ = fVar238 * auVar142._8_4_;
  auVar321._12_4_ = fVar259 * auVar142._12_4_;
  auVar38._16_4_ = fVar260 * auVar142._16_4_;
  auVar38._0_16_ = auVar321;
  auVar38._20_4_ = fVar261 * auVar142._20_4_;
  auVar38._24_4_ = fVar262 * auVar142._24_4_;
  auVar38._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar376,auVar188);
  auVar240._0_4_ = fVar239 * auVar142._0_4_;
  auVar240._4_4_ = fVar258 * auVar142._4_4_;
  auVar240._8_4_ = fVar238 * auVar142._8_4_;
  auVar240._12_4_ = fVar259 * auVar142._12_4_;
  auVar39._16_4_ = fVar260 * auVar142._16_4_;
  auVar39._0_16_ = auVar240;
  auVar39._20_4_ = fVar261 * auVar142._20_4_;
  auVar39._24_4_ = fVar262 * auVar142._24_4_;
  auVar39._28_4_ = auVar35._28_4_ + auVar37._28_4_;
  auVar142 = vsubps_avx(auVar404,auVar143);
  auVar173._0_4_ = fVar263 * auVar142._0_4_;
  auVar173._4_4_ = fVar279 * auVar142._4_4_;
  auVar173._8_4_ = fVar281 * auVar142._8_4_;
  auVar173._12_4_ = fVar282 * auVar142._12_4_;
  auVar35._16_4_ = fVar283 * auVar142._16_4_;
  auVar35._0_16_ = auVar173;
  auVar35._20_4_ = fVar285 * auVar142._20_4_;
  auVar35._24_4_ = fVar287 * auVar142._24_4_;
  auVar35._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar421,auVar143);
  auVar264._0_4_ = fVar263 * auVar142._0_4_;
  auVar264._4_4_ = fVar279 * auVar142._4_4_;
  auVar264._8_4_ = fVar281 * auVar142._8_4_;
  auVar264._12_4_ = fVar282 * auVar142._12_4_;
  auVar37._16_4_ = fVar283 * auVar142._16_4_;
  auVar37._0_16_ = auVar264;
  auVar37._20_4_ = fVar285 * auVar142._20_4_;
  auVar37._24_4_ = fVar287 * auVar142._24_4_;
  auVar37._28_4_ = auVar36._28_4_ + auVar34._28_4_;
  auVar142 = vsubps_avx(auVar429,auVar229);
  auVar130._0_4_ = fVar289 * auVar142._0_4_;
  auVar130._4_4_ = fVar306 * auVar142._4_4_;
  auVar130._8_4_ = fVar308 * auVar142._8_4_;
  auVar130._12_4_ = fVar310 * auVar142._12_4_;
  auVar34._16_4_ = fVar312 * auVar142._16_4_;
  auVar34._0_16_ = auVar130;
  auVar34._20_4_ = fVar314 * auVar142._20_4_;
  auVar34._24_4_ = fVar316 * auVar142._24_4_;
  auVar34._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar439,auVar229);
  auVar219._0_4_ = fVar289 * auVar142._0_4_;
  auVar219._4_4_ = fVar306 * auVar142._4_4_;
  auVar219._8_4_ = fVar308 * auVar142._8_4_;
  auVar219._12_4_ = fVar310 * auVar142._12_4_;
  auVar44._16_4_ = fVar312 * auVar142._16_4_;
  auVar44._0_16_ = auVar219;
  auVar44._20_4_ = fVar314 * auVar142._20_4_;
  auVar44._24_4_ = fVar316 * auVar142._24_4_;
  auVar44._28_4_ = auVar142._28_4_;
  auVar175 = vpminsd_avx(auVar38._16_16_,auVar39._16_16_);
  auVar40 = vpminsd_avx(auVar321,auVar240);
  auVar377._16_16_ = auVar175;
  auVar377._0_16_ = auVar40;
  auVar175 = vpminsd_avx(auVar35._16_16_,auVar37._16_16_);
  auVar40 = vpminsd_avx(auVar173,auVar264);
  auVar430._16_16_ = auVar175;
  auVar430._0_16_ = auVar40;
  auVar142 = vmaxps_avx(auVar377,auVar430);
  auVar175 = vpminsd_avx(auVar34._16_16_,auVar44._16_16_);
  auVar40 = vpminsd_avx(auVar130,auVar219);
  auVar450._16_16_ = auVar175;
  auVar450._0_16_ = auVar40;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar463._4_4_ = uVar9;
  auVar463._0_4_ = uVar9;
  auVar463._8_4_ = uVar9;
  auVar463._12_4_ = uVar9;
  auVar463._16_4_ = uVar9;
  auVar463._20_4_ = uVar9;
  auVar463._24_4_ = uVar9;
  auVar463._28_4_ = uVar9;
  auVar151 = vmaxps_avx(auVar450,auVar463);
  auVar142 = vmaxps_avx(auVar142,auVar151);
  local_400._4_4_ = auVar142._4_4_ * 0.99999964;
  local_400._0_4_ = auVar142._0_4_ * 0.99999964;
  local_400._8_4_ = auVar142._8_4_ * 0.99999964;
  local_400._12_4_ = auVar142._12_4_ * 0.99999964;
  local_400._16_4_ = auVar142._16_4_ * 0.99999964;
  local_400._20_4_ = auVar142._20_4_ * 0.99999964;
  local_400._24_4_ = auVar142._24_4_ * 0.99999964;
  local_400._28_4_ = auVar142._28_4_;
  auVar175 = vpmaxsd_avx(auVar38._16_16_,auVar39._16_16_);
  auVar40 = vpmaxsd_avx(auVar321,auVar240);
  auVar252._16_16_ = auVar175;
  auVar252._0_16_ = auVar40;
  auVar175 = vpmaxsd_avx(auVar35._16_16_,auVar37._16_16_);
  auVar40 = vpmaxsd_avx(auVar173,auVar264);
  auVar189._16_16_ = auVar175;
  auVar189._0_16_ = auVar40;
  auVar142 = vminps_avx(auVar252,auVar189);
  auVar175 = vpmaxsd_avx(auVar34._16_16_,auVar44._16_16_);
  auVar40 = vpmaxsd_avx(auVar130,auVar219);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar230._4_4_ = uVar9;
  auVar230._0_4_ = uVar9;
  auVar230._8_4_ = uVar9;
  auVar230._12_4_ = uVar9;
  auVar230._16_4_ = uVar9;
  auVar230._20_4_ = uVar9;
  auVar230._24_4_ = uVar9;
  auVar230._28_4_ = uVar9;
  auVar144._16_16_ = auVar175;
  auVar144._0_16_ = auVar40;
  auVar151 = vminps_avx(auVar144,auVar230);
  auVar142 = vminps_avx(auVar142,auVar151);
  auVar379._4_4_ = auVar142._4_4_ * 1.0000004;
  auVar379._0_4_ = auVar142._0_4_ * 1.0000004;
  auVar379._8_4_ = auVar142._8_4_ * 1.0000004;
  auVar379._12_4_ = auVar142._12_4_ * 1.0000004;
  auVar379._16_4_ = auVar142._16_4_ * 1.0000004;
  auVar379._20_4_ = auVar142._20_4_ * 1.0000004;
  auVar379._24_4_ = auVar142._24_4_ * 1.0000004;
  auVar379._28_4_ = auVar142._28_4_;
  auVar142 = vcmpps_avx(local_400,auVar379,2);
  auVar175 = vpshufd_avx(ZEXT116((byte)PVar27),0);
  auVar190._16_16_ = auVar175;
  auVar190._0_16_ = auVar175;
  auVar151 = vcvtdq2ps_avx(auVar190);
  auVar151 = vcmpps_avx(_DAT_02020f40,auVar151,1);
  auVar142 = vandps_avx(auVar142,auVar151);
  uVar117 = vmovmskps_avx(auVar142);
  if (uVar117 == 0) {
    return;
  }
  uVar117 = uVar117 & 0xff;
  auVar145._16_16_ = mm_lookupmask_ps._240_16_;
  auVar145._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar145,ZEXT832(0) << 0x20,0x80);
  uVar119 = 1 << ((byte)k & 0x1f);
  local_a70 = (undefined1 (*) [32])&local_540;
  local_a78 = (undefined8 *)(mm_lookupmask_ps + ((uVar119 & 0xf) << 4));
  local_a80 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar119 >> 4) * 0x10);
  auVar355 = ZEXT1664((undefined1  [16])0x0);
  local_930 = prim;
LAB_0125101d:
  local_928 = (ulong)uVar117;
  lVar121 = 0;
  if (local_928 != 0) {
    for (; (uVar117 >> lVar121 & 1) == 0; lVar121 = lVar121 + 1) {
    }
  }
  uVar117 = *(uint *)(local_930 + 2);
  local_a68 = (ulong)*(uint *)(local_930 + lVar121 * 4 + 6);
  pGVar28 = (context->scene->geometries).items[uVar117].ptr;
  uVar124 = (ulong)*(uint *)(*(long *)&pGVar28->field_0x58 +
                            local_a68 *
                            pGVar28[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar239 = (pGVar28->time_range).lower;
  fVar239 = pGVar28->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar239) / ((pGVar28->time_range).upper - fVar239));
  auVar175 = vroundss_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),9);
  auVar175 = vminss_avx(auVar175,ZEXT416((uint)(pGVar28->fnumTimeSegments + -1.0)));
  auVar175 = vmaxss_avx(auVar355._0_16_,auVar175);
  fVar239 = fVar239 - auVar175._0_4_;
  _Var29 = pGVar28[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar120 = (long)(int)auVar175._0_4_ * 0x38;
  lVar123 = *(long *)(_Var29 + 0x10 + lVar120);
  lVar30 = *(long *)(_Var29 + 0x38 + lVar120);
  lVar31 = *(long *)(_Var29 + 0x48 + lVar120);
  auVar175 = vshufps_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),0);
  pfVar2 = (float *)(lVar30 + lVar31 * uVar124);
  fVar211 = auVar175._0_4_;
  fVar260 = auVar175._4_4_;
  fVar261 = auVar175._8_4_;
  fVar262 = auVar175._12_4_;
  lVar1 = uVar124 + 1;
  pfVar3 = (float *)(lVar30 + lVar31 * lVar1);
  p_Var32 = pGVar28[4].occlusionFilterN;
  auVar175 = vshufps_avx(ZEXT416((uint)(1.0 - fVar239)),ZEXT416((uint)(1.0 - fVar239)),0);
  pfVar4 = (float *)(*(long *)(_Var29 + lVar120) + lVar123 * uVar124);
  fVar129 = auVar175._0_4_;
  fVar238 = auVar175._4_4_;
  fVar280 = auVar175._8_4_;
  fVar259 = auVar175._12_4_;
  pfVar5 = (float *)(*(long *)(_Var29 + lVar120) + lVar123 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var32 + lVar120 + 0x38) +
                    uVar124 * *(long *)(p_Var32 + lVar120 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var32 + lVar120 + 0x38) +
                    *(long *)(p_Var32 + lVar120 + 0x48) * lVar1);
  pfVar8 = (float *)(*(long *)(p_Var32 + lVar120) + *(long *)(p_Var32 + lVar120 + 0x10) * uVar124);
  auVar174._0_4_ = fVar129 * *pfVar4 + fVar211 * *pfVar2;
  auVar174._4_4_ = fVar238 * pfVar4[1] + fVar260 * pfVar2[1];
  auVar174._8_4_ = fVar280 * pfVar4[2] + fVar261 * pfVar2[2];
  auVar174._12_4_ = fVar259 * pfVar4[3] + fVar262 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var32 + lVar120) + *(long *)(p_Var32 + lVar120 + 0x10) * lVar1);
  auVar220._0_4_ = fVar129 * *pfVar5 + fVar211 * *pfVar3;
  auVar220._4_4_ = fVar238 * pfVar5[1] + fVar260 * pfVar3[1];
  auVar220._8_4_ = fVar280 * pfVar5[2] + fVar261 * pfVar3[2];
  auVar220._12_4_ = fVar259 * pfVar5[3] + fVar262 * pfVar3[3];
  auVar175 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar40 = vinsertps_avx(auVar175,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar239 = *(float *)(ray + k * 4 + 0x80);
  auVar399._4_4_ = fVar239;
  auVar399._0_4_ = fVar239;
  auVar399._8_4_ = fVar239;
  auVar399._12_4_ = fVar239;
  fStack_850 = fVar239;
  _local_860 = auVar399;
  fStack_84c = fVar239;
  fStack_848 = fVar239;
  fStack_844 = fVar239;
  fVar318 = *(float *)(ray + k * 4 + 0xa0);
  auVar417._4_4_ = fVar318;
  auVar417._0_4_ = fVar318;
  auVar417._8_4_ = fVar318;
  auVar417._12_4_ = fVar318;
  fStack_870 = fVar318;
  _local_880 = auVar417;
  fStack_86c = fVar318;
  fStack_868 = fVar318;
  fStack_864 = fVar318;
  auVar175 = vunpcklps_avx(auVar399,auVar417);
  fVar258 = *(float *)(ray + k * 4 + 0xc0);
  auVar425._4_4_ = fVar258;
  auVar425._0_4_ = fVar258;
  auVar425._8_4_ = fVar258;
  auVar425._12_4_ = fVar258;
  fStack_8f0 = fVar258;
  _local_900 = auVar425;
  fStack_8ec = fVar258;
  fStack_8e8 = fVar258;
  fStack_8e4 = fVar258;
  auVar433 = ZEXT3264(_local_900);
  _local_9d0 = vinsertps_avx(auVar175,auVar425,0x28);
  auVar265._0_4_ = auVar174._0_4_ + (fVar129 * *pfVar8 + fVar211 * *pfVar6) * 0.33333334;
  auVar265._4_4_ = auVar174._4_4_ + (fVar238 * pfVar8[1] + fVar260 * pfVar6[1]) * 0.33333334;
  auVar265._8_4_ = auVar174._8_4_ + (fVar280 * pfVar8[2] + fVar261 * pfVar6[2]) * 0.33333334;
  auVar265._12_4_ = auVar174._12_4_ + (fVar259 * pfVar8[3] + fVar262 * pfVar6[3]) * 0.33333334;
  auVar131._0_4_ = (fVar129 * *pfVar2 + fVar211 * *pfVar7) * 0.33333334;
  auVar131._4_4_ = (fVar238 * pfVar2[1] + fVar260 * pfVar7[1]) * 0.33333334;
  auVar131._8_4_ = (fVar280 * pfVar2[2] + fVar261 * pfVar7[2]) * 0.33333334;
  auVar131._12_4_ = (fVar259 * pfVar2[3] + fVar262 * pfVar7[3]) * 0.33333334;
  auVar11 = vsubps_avx(auVar220,auVar131);
  auVar132._0_4_ = (auVar220._0_4_ + auVar174._0_4_ + auVar265._0_4_ + auVar11._0_4_) * 0.25;
  auVar132._4_4_ = (auVar220._4_4_ + auVar174._4_4_ + auVar265._4_4_ + auVar11._4_4_) * 0.25;
  auVar132._8_4_ = (auVar220._8_4_ + auVar174._8_4_ + auVar265._8_4_ + auVar11._8_4_) * 0.25;
  auVar132._12_4_ = (auVar220._12_4_ + auVar174._12_4_ + auVar265._12_4_ + auVar11._12_4_) * 0.25;
  auVar175 = vsubps_avx(auVar132,auVar40);
  auVar175 = vdpps_avx(auVar175,_local_9d0,0x7f);
  local_9e0 = vdpps_avx(_local_9d0,_local_9d0,0x7f);
  auVar180 = vrcpss_avx(local_9e0,local_9e0);
  fVar129 = auVar175._0_4_ * auVar180._0_4_ * (2.0 - local_9e0._0_4_ * auVar180._0_4_);
  auVar355 = ZEXT464((uint)fVar129);
  auVar180 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
  auVar241._0_4_ = auVar40._0_4_ + local_9d0._0_4_ * auVar180._0_4_;
  auVar241._4_4_ = auVar40._4_4_ + local_9d0._4_4_ * auVar180._4_4_;
  auVar241._8_4_ = auVar40._8_4_ + local_9d0._8_4_ * auVar180._8_4_;
  auVar241._12_4_ = auVar40._12_4_ + local_9d0._12_4_ * auVar180._12_4_;
  auVar175 = vblendps_avx(auVar241,_DAT_01feba10,8);
  _local_ae0 = vsubps_avx(auVar174,auVar175);
  auVar330 = ZEXT1664(_local_ae0);
  _local_af0 = vsubps_avx(auVar11,auVar175);
  _local_b00 = vsubps_avx(auVar265,auVar175);
  _local_b10 = vsubps_avx(auVar220,auVar175);
  auVar257 = ZEXT1664(_local_b10);
  auVar175 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar175;
  _local_1a0 = auVar175;
  auVar175 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar175;
  _local_1c0 = auVar175;
  auVar175 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar175;
  _local_1e0 = auVar175;
  auVar175 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar175;
  _local_200 = auVar175;
  auVar175 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar175;
  _local_220 = auVar175;
  auVar175 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar175;
  _local_240 = auVar175;
  auVar175 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar175;
  _local_260 = auVar175;
  auVar175 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar175;
  _local_280 = auVar175;
  auVar175 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar175;
  _local_2a0 = auVar175;
  auVar175 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar175;
  _local_2c0 = auVar175;
  auVar175 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar175;
  _local_2e0 = auVar175;
  auVar175 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar175;
  _local_300 = auVar175;
  auVar175 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar175;
  _local_320 = auVar175;
  auVar175 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar175;
  _local_340 = auVar175;
  auVar175 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar175;
  _local_360 = auVar175;
  auVar175 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar175;
  _local_380 = auVar175;
  auVar175 = ZEXT416((uint)(fVar239 * fVar239 + fVar318 * fVar318 + fVar258 * fVar258));
  auVar175 = vshufps_avx(auVar175,auVar175,0);
  local_3a0._16_16_ = auVar175;
  local_3a0._0_16_ = auVar175;
  fVar239 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)fVar129);
  auVar175 = vshufps_avx(ZEXT416((uint)(fVar239 - fVar129)),ZEXT416((uint)(fVar239 - fVar129)),0);
  local_3e0._16_16_ = auVar175;
  local_3e0._0_16_ = auVar175;
  auVar175 = vpshufd_avx(ZEXT416(uVar117),0);
  local_4e0._16_16_ = auVar175;
  local_4e0._0_16_ = auVar175;
  auVar175 = vpshufd_avx(ZEXT416(*(uint *)(local_930 + lVar121 * 4 + 6)),0);
  local_500._16_16_ = auVar175;
  local_500._0_16_ = auVar175;
  register0x00001210 = auVar180;
  _local_820 = auVar180;
  uVar118 = 0;
  uVar124 = 1;
  auVar146._8_4_ = 0x7fffffff;
  auVar146._0_8_ = 0x7fffffff7fffffff;
  auVar146._12_4_ = 0x7fffffff;
  auVar146._16_4_ = 0x7fffffff;
  auVar146._20_4_ = 0x7fffffff;
  auVar146._24_4_ = 0x7fffffff;
  auVar146._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_3a0,auVar146);
  auVar175 = vsqrtss_avx(local_9e0,local_9e0);
  auVar40 = vsqrtss_avx(local_9e0,local_9e0);
  local_950 = 0x3f80000000000000;
  uStack_948 = 0;
  auVar275._8_4_ = 0x3f800000;
  auVar275._0_8_ = &DAT_3f8000003f800000;
  auVar275._12_4_ = 0x3f800000;
  auVar275._16_4_ = 0x3f800000;
  auVar275._20_4_ = 0x3f800000;
  auVar275._24_4_ = 0x3f800000;
  auVar275._28_4_ = 0x3f800000;
  do {
    auVar113._8_8_ = uStack_948;
    auVar113._0_8_ = local_950;
    auVar180 = vmovshdup_avx(auVar113);
    fVar318 = auVar180._0_4_ - (float)local_950;
    auVar180 = vshufps_avx(auVar113,auVar113,0);
    local_a40._16_16_ = auVar180;
    local_a40._0_16_ = auVar180;
    auVar11 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
    local_7c0._16_16_ = auVar11;
    local_7c0._0_16_ = auVar11;
    fVar171 = auVar11._0_4_;
    fVar210 = auVar11._4_4_;
    fVar212 = auVar11._8_4_;
    fVar214 = auVar11._12_4_;
    fVar127 = auVar180._0_4_;
    auVar191._0_4_ = fVar127 + fVar171 * 0.0;
    fVar161 = auVar180._4_4_;
    auVar191._4_4_ = fVar161 + fVar210 * 0.14285715;
    fVar163 = auVar180._8_4_;
    auVar191._8_4_ = fVar163 + fVar212 * 0.2857143;
    fVar165 = auVar180._12_4_;
    auVar191._12_4_ = fVar165 + fVar214 * 0.42857146;
    auVar191._16_4_ = fVar127 + fVar171 * 0.5714286;
    auVar191._20_4_ = fVar161 + fVar210 * 0.71428573;
    auVar191._24_4_ = fVar163 + fVar212 * 0.8571429;
    auVar191._28_4_ = fVar165 + fVar214;
    auVar142 = vsubps_avx(auVar275,auVar191);
    fVar258 = auVar142._0_4_;
    fVar129 = auVar142._4_4_;
    fVar238 = auVar142._8_4_;
    fVar280 = auVar142._12_4_;
    fVar259 = auVar142._16_4_;
    fVar211 = auVar142._20_4_;
    fVar260 = auVar142._24_4_;
    fVar285 = auVar257._28_4_;
    fVar319 = (float)local_2a0._0_4_ * auVar191._0_4_ + (float)local_220._0_4_ * fVar258;
    fVar331 = (float)local_2a0._4_4_ * auVar191._4_4_ + (float)local_220._4_4_ * fVar129;
    fVar333 = fStack_298 * auVar191._8_4_ + fStack_218 * fVar238;
    fVar335 = fStack_294 * auVar191._12_4_ + fStack_214 * fVar280;
    fVar337 = fStack_290 * auVar191._16_4_ + fStack_210 * fVar259;
    fVar339 = fStack_28c * auVar191._20_4_ + fStack_20c * fVar211;
    fVar341 = fStack_288 * auVar191._24_4_ + fStack_208 * fVar260;
    fVar261 = (float)local_2c0._0_4_ * auVar191._0_4_ + (float)local_240._0_4_ * fVar258;
    fVar262 = (float)local_2c0._4_4_ * auVar191._4_4_ + (float)local_240._4_4_ * fVar129;
    fVar263 = fStack_2b8 * auVar191._8_4_ + fStack_238 * fVar238;
    fVar279 = fStack_2b4 * auVar191._12_4_ + fStack_234 * fVar280;
    fVar281 = fStack_2b0 * auVar191._16_4_ + fStack_230 * fVar259;
    fVar282 = fStack_2ac * auVar191._20_4_ + fStack_22c * fVar211;
    fVar283 = fStack_2a8 * auVar191._24_4_ + fStack_228 * fVar260;
    fVar287 = (float)local_2e0._0_4_ * auVar191._0_4_ + (float)local_260._0_4_ * fVar258;
    fVar289 = (float)local_2e0._4_4_ * auVar191._4_4_ + (float)local_260._4_4_ * fVar129;
    fVar306 = fStack_2d8 * auVar191._8_4_ + fStack_258 * fVar238;
    fVar308 = fStack_2d4 * auVar191._12_4_ + fStack_254 * fVar280;
    fVar310 = fStack_2d0 * auVar191._16_4_ + fStack_250 * fVar259;
    fVar312 = fStack_2cc * auVar191._20_4_ + fStack_24c * fVar211;
    fVar314 = fStack_2c8 * auVar191._24_4_ + fStack_248 * fVar260;
    fVar316 = (float)local_300._0_4_ * auVar191._0_4_ + (float)local_280._0_4_ * fVar258;
    fVar307 = (float)local_300._4_4_ * auVar191._4_4_ + (float)local_280._4_4_ * fVar129;
    fVar309 = fStack_2f8 * auVar191._8_4_ + fStack_278 * fVar238;
    fVar311 = fStack_2f4 * auVar191._12_4_ + fStack_274 * fVar280;
    fVar313 = fStack_2f0 * auVar191._16_4_ + fStack_270 * fVar259;
    fVar315 = fStack_2ec * auVar191._20_4_ + fStack_26c * fVar211;
    fVar317 = fStack_2e8 * auVar191._24_4_ + fStack_268 * fVar260;
    fVar434 = auVar433._28_4_;
    fVar447 = fStack_204 + fVar434;
    auVar405._0_4_ =
         ((float)local_220._0_4_ * auVar191._0_4_ + fVar258 * (float)local_1a0._0_4_) * fVar258 +
         auVar191._0_4_ * fVar319;
    auVar405._4_4_ =
         ((float)local_220._4_4_ * auVar191._4_4_ + fVar129 * (float)local_1a0._4_4_) * fVar129 +
         auVar191._4_4_ * fVar331;
    auVar405._8_4_ =
         (fStack_218 * auVar191._8_4_ + fVar238 * fStack_198) * fVar238 + auVar191._8_4_ * fVar333;
    auVar405._12_4_ =
         (fStack_214 * auVar191._12_4_ + fVar280 * fStack_194) * fVar280 + auVar191._12_4_ * fVar335
    ;
    auVar405._16_4_ =
         (fStack_210 * auVar191._16_4_ + fVar259 * fStack_190) * fVar259 + auVar191._16_4_ * fVar337
    ;
    auVar405._20_4_ =
         (fStack_20c * auVar191._20_4_ + fVar211 * fStack_18c) * fVar211 + auVar191._20_4_ * fVar339
    ;
    auVar405._24_4_ =
         (fStack_208 * auVar191._24_4_ + fVar260 * fStack_188) * fVar260 + auVar191._24_4_ * fVar341
    ;
    auVar405._28_4_ = fStack_2e4 + fVar434;
    auVar422._0_4_ =
         fVar258 * ((float)local_240._0_4_ * auVar191._0_4_ + fVar258 * (float)local_1c0._0_4_) +
         auVar191._0_4_ * fVar261;
    auVar422._4_4_ =
         fVar129 * ((float)local_240._4_4_ * auVar191._4_4_ + fVar129 * (float)local_1c0._4_4_) +
         auVar191._4_4_ * fVar262;
    auVar422._8_4_ =
         fVar238 * (fStack_238 * auVar191._8_4_ + fVar238 * fStack_1b8) + auVar191._8_4_ * fVar263;
    auVar422._12_4_ =
         fVar280 * (fStack_234 * auVar191._12_4_ + fVar280 * fStack_1b4) + auVar191._12_4_ * fVar279
    ;
    auVar422._16_4_ =
         fVar259 * (fStack_230 * auVar191._16_4_ + fVar259 * fStack_1b0) + auVar191._16_4_ * fVar281
    ;
    auVar422._20_4_ =
         fVar211 * (fStack_22c * auVar191._20_4_ + fVar211 * fStack_1ac) + auVar191._20_4_ * fVar282
    ;
    auVar422._24_4_ =
         fVar260 * (fStack_228 * auVar191._24_4_ + fVar260 * fStack_1a8) + auVar191._24_4_ * fVar283
    ;
    auVar422._28_4_ = fVar285 + auVar355._28_4_ + fVar434;
    auVar431._0_4_ =
         fVar258 * ((float)local_260._0_4_ * auVar191._0_4_ + fVar258 * (float)local_1e0._0_4_) +
         auVar191._0_4_ * fVar287;
    auVar431._4_4_ =
         fVar129 * ((float)local_260._4_4_ * auVar191._4_4_ + fVar129 * (float)local_1e0._4_4_) +
         auVar191._4_4_ * fVar289;
    auVar431._8_4_ =
         fVar238 * (fStack_258 * auVar191._8_4_ + fVar238 * fStack_1d8) + auVar191._8_4_ * fVar306;
    auVar431._12_4_ =
         fVar280 * (fStack_254 * auVar191._12_4_ + fVar280 * fStack_1d4) + auVar191._12_4_ * fVar308
    ;
    auVar431._16_4_ =
         fVar259 * (fStack_250 * auVar191._16_4_ + fVar259 * fStack_1d0) + auVar191._16_4_ * fVar310
    ;
    auVar431._20_4_ =
         fVar211 * (fStack_24c * auVar191._20_4_ + fVar211 * fStack_1cc) + auVar191._20_4_ * fVar312
    ;
    auVar431._24_4_ =
         fVar260 * (fStack_248 * auVar191._24_4_ + fVar260 * fStack_1c8) + auVar191._24_4_ * fVar314
    ;
    auVar431._28_4_ = fStack_2c4 + fVar434;
    auVar349._0_4_ =
         auVar191._0_4_ * fVar316 +
         fVar258 * ((float)local_280._0_4_ * auVar191._0_4_ + fVar258 * (float)local_200._0_4_);
    auVar349._4_4_ =
         auVar191._4_4_ * fVar307 +
         fVar129 * ((float)local_280._4_4_ * auVar191._4_4_ + fVar129 * (float)local_200._4_4_);
    auVar349._8_4_ =
         auVar191._8_4_ * fVar309 + fVar238 * (fStack_278 * auVar191._8_4_ + fVar238 * fStack_1f8);
    auVar349._12_4_ =
         auVar191._12_4_ * fVar311 + fVar280 * (fStack_274 * auVar191._12_4_ + fVar280 * fStack_1f4)
    ;
    auVar349._16_4_ =
         auVar191._16_4_ * fVar313 + fVar259 * (fStack_270 * auVar191._16_4_ + fVar259 * fStack_1f0)
    ;
    auVar349._20_4_ =
         auVar191._20_4_ * fVar315 + fVar211 * (fStack_26c * auVar191._20_4_ + fVar211 * fStack_1ec)
    ;
    auVar349._24_4_ =
         auVar191._24_4_ * fVar317 + fVar260 * (fStack_268 * auVar191._24_4_ + fVar260 * fStack_1e8)
    ;
    auVar349._28_4_ = fStack_2c4 + fStack_2a4;
    auVar464._0_4_ =
         (auVar191._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar258) *
         auVar191._0_4_ + fVar258 * fVar319;
    auVar464._4_4_ =
         (auVar191._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar129) *
         auVar191._4_4_ + fVar129 * fVar331;
    auVar464._8_4_ =
         (auVar191._8_4_ * fStack_318 + fStack_298 * fVar238) * auVar191._8_4_ + fVar238 * fVar333;
    auVar464._12_4_ =
         (auVar191._12_4_ * fStack_314 + fStack_294 * fVar280) * auVar191._12_4_ + fVar280 * fVar335
    ;
    auVar464._16_4_ =
         (auVar191._16_4_ * fStack_310 + fStack_290 * fVar259) * auVar191._16_4_ + fVar259 * fVar337
    ;
    auVar464._20_4_ =
         (auVar191._20_4_ * fStack_30c + fStack_28c * fVar211) * auVar191._20_4_ + fVar211 * fVar339
    ;
    auVar464._24_4_ =
         (auVar191._24_4_ * fStack_308 + fStack_288 * fVar260) * auVar191._24_4_ + fVar260 * fVar341
    ;
    auVar464._28_4_ = fStack_2c4 + fVar285 + auVar330._28_4_;
    auVar253._0_4_ =
         (auVar191._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar258) *
         auVar191._0_4_ + fVar258 * fVar261;
    auVar253._4_4_ =
         (auVar191._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar129) *
         auVar191._4_4_ + fVar129 * fVar262;
    auVar253._8_4_ =
         (auVar191._8_4_ * fStack_338 + fStack_2b8 * fVar238) * auVar191._8_4_ + fVar238 * fVar263;
    auVar253._12_4_ =
         (auVar191._12_4_ * fStack_334 + fStack_2b4 * fVar280) * auVar191._12_4_ + fVar280 * fVar279
    ;
    auVar253._16_4_ =
         (auVar191._16_4_ * fStack_330 + fStack_2b0 * fVar259) * auVar191._16_4_ + fVar259 * fVar281
    ;
    auVar253._20_4_ =
         (auVar191._20_4_ * fStack_32c + fStack_2ac * fVar211) * auVar191._20_4_ + fVar211 * fVar282
    ;
    auVar253._24_4_ =
         (auVar191._24_4_ * fStack_328 + fStack_2a8 * fVar260) * auVar191._24_4_ + fVar260 * fVar283
    ;
    auVar253._28_4_ = fStack_2c4 + auVar275._28_4_ + fVar285;
    auVar276._0_4_ =
         auVar191._0_4_ *
         (auVar191._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar258) +
         fVar258 * fVar287;
    auVar276._4_4_ =
         auVar191._4_4_ *
         (auVar191._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar129) +
         fVar129 * fVar289;
    auVar276._8_4_ =
         auVar191._8_4_ * (auVar191._8_4_ * fStack_358 + fStack_2d8 * fVar238) + fVar238 * fVar306;
    auVar276._12_4_ =
         auVar191._12_4_ * (auVar191._12_4_ * fStack_354 + fStack_2d4 * fVar280) + fVar280 * fVar308
    ;
    auVar276._16_4_ =
         auVar191._16_4_ * (auVar191._16_4_ * fStack_350 + fStack_2d0 * fVar259) + fVar259 * fVar310
    ;
    auVar276._20_4_ =
         auVar191._20_4_ * (auVar191._20_4_ * fStack_34c + fStack_2cc * fVar211) + fVar211 * fVar312
    ;
    auVar276._24_4_ =
         auVar191._24_4_ * (auVar191._24_4_ * fStack_348 + fStack_2c8 * fVar260) + fVar260 * fVar314
    ;
    auVar276._28_4_ = fVar447 + auVar275._28_4_ + 1.0;
    auVar298._0_4_ =
         (auVar191._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar258) *
         auVar191._0_4_ + fVar258 * fVar316;
    auVar298._4_4_ =
         (auVar191._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar129) *
         auVar191._4_4_ + fVar129 * fVar307;
    auVar298._8_4_ =
         (auVar191._8_4_ * fStack_378 + fStack_2f8 * fVar238) * auVar191._8_4_ + fVar238 * fVar309;
    auVar298._12_4_ =
         (auVar191._12_4_ * fStack_374 + fStack_2f4 * fVar280) * auVar191._12_4_ + fVar280 * fVar311
    ;
    auVar298._16_4_ =
         (auVar191._16_4_ * fStack_370 + fStack_2f0 * fVar259) * auVar191._16_4_ + fVar259 * fVar313
    ;
    auVar298._20_4_ =
         (auVar191._20_4_ * fStack_36c + fStack_2ec * fVar211) * auVar191._20_4_ + fVar211 * fVar315
    ;
    auVar298._24_4_ =
         (auVar191._24_4_ * fStack_368 + fStack_2e8 * fVar260) * auVar191._24_4_ + fVar260 * fVar317
    ;
    auVar298._28_4_ = fVar434 + fStack_224 + fVar434 + 1.0;
    fVar128 = auVar405._0_4_ * fVar258 + auVar464._0_4_ * auVar191._0_4_;
    fVar162 = auVar405._4_4_ * fVar129 + auVar464._4_4_ * auVar191._4_4_;
    fVar164 = auVar405._8_4_ * fVar238 + auVar464._8_4_ * auVar191._8_4_;
    fVar166 = auVar405._12_4_ * fVar280 + auVar464._12_4_ * auVar191._12_4_;
    fVar167 = auVar405._16_4_ * fVar259 + auVar464._16_4_ * auVar191._16_4_;
    fVar168 = auVar405._20_4_ * fVar211 + auVar464._20_4_ * auVar191._20_4_;
    fVar169 = auVar405._24_4_ * fVar260 + auVar464._24_4_ * auVar191._24_4_;
    fVar170 = fVar434 + fStack_224 + fStack_2c4;
    auVar451._0_4_ = auVar422._0_4_ * fVar258 + auVar191._0_4_ * auVar253._0_4_;
    auVar451._4_4_ = auVar422._4_4_ * fVar129 + auVar191._4_4_ * auVar253._4_4_;
    auVar451._8_4_ = auVar422._8_4_ * fVar238 + auVar191._8_4_ * auVar253._8_4_;
    auVar451._12_4_ = auVar422._12_4_ * fVar280 + auVar191._12_4_ * auVar253._12_4_;
    auVar451._16_4_ = auVar422._16_4_ * fVar259 + auVar191._16_4_ * auVar253._16_4_;
    auVar451._20_4_ = auVar422._20_4_ * fVar211 + auVar191._20_4_ * auVar253._20_4_;
    auVar451._24_4_ = auVar422._24_4_ * fVar260 + auVar191._24_4_ * auVar253._24_4_;
    auVar451._28_4_ = fStack_2c4 + fVar447;
    auVar475._0_4_ = auVar431._0_4_ * fVar258 + auVar191._0_4_ * auVar276._0_4_;
    auVar475._4_4_ = auVar431._4_4_ * fVar129 + auVar191._4_4_ * auVar276._4_4_;
    auVar475._8_4_ = auVar431._8_4_ * fVar238 + auVar191._8_4_ * auVar276._8_4_;
    auVar475._12_4_ = auVar431._12_4_ * fVar280 + auVar191._12_4_ * auVar276._12_4_;
    auVar475._16_4_ = auVar431._16_4_ * fVar259 + auVar191._16_4_ * auVar276._16_4_;
    auVar475._20_4_ = auVar431._20_4_ * fVar211 + auVar191._20_4_ * auVar276._20_4_;
    auVar475._24_4_ = auVar431._24_4_ * fVar260 + auVar191._24_4_ * auVar276._24_4_;
    auVar475._28_4_ = fVar447 + fStack_2c4;
    local_7e0._0_4_ = fVar258 * auVar349._0_4_ + auVar191._0_4_ * auVar298._0_4_;
    local_7e0._4_4_ = fVar129 * auVar349._4_4_ + auVar191._4_4_ * auVar298._4_4_;
    local_7e0._8_4_ = fVar238 * auVar349._8_4_ + auVar191._8_4_ * auVar298._8_4_;
    local_7e0._12_4_ = fVar280 * auVar349._12_4_ + auVar191._12_4_ * auVar298._12_4_;
    local_7e0._16_4_ = fVar259 * auVar349._16_4_ + auVar191._16_4_ * auVar298._16_4_;
    local_7e0._20_4_ = fVar211 * auVar349._20_4_ + auVar191._20_4_ * auVar298._20_4_;
    local_7e0._24_4_ = fVar260 * auVar349._24_4_ + auVar191._24_4_ * auVar298._24_4_;
    local_7e0._28_4_ = auVar142._28_4_ + auVar191._28_4_;
    auVar378 = vsubps_avx(auVar464,auVar405);
    auVar142 = vsubps_avx(auVar253,auVar422);
    auVar151 = vsubps_avx(auVar276,auVar431);
    auVar34 = vsubps_avx(auVar298,auVar349);
    auVar180 = vshufps_avx(ZEXT416((uint)(fVar318 * 0.04761905)),
                           ZEXT416((uint)(fVar318 * 0.04761905)),0);
    fVar289 = auVar180._0_4_;
    fVar343 = fVar289 * auVar378._0_4_ * 3.0;
    fVar306 = auVar180._4_4_;
    fVar356 = fVar306 * auVar378._4_4_ * 3.0;
    auVar45._4_4_ = fVar356;
    auVar45._0_4_ = fVar343;
    fVar316 = auVar180._8_4_;
    fVar357 = fVar316 * auVar378._8_4_ * 3.0;
    auVar45._8_4_ = fVar357;
    fVar281 = auVar180._12_4_;
    fVar359 = fVar281 * auVar378._12_4_ * 3.0;
    auVar45._12_4_ = fVar359;
    fVar361 = fVar289 * auVar378._16_4_ * 3.0;
    auVar45._16_4_ = fVar361;
    fVar363 = fVar306 * auVar378._20_4_ * 3.0;
    auVar45._20_4_ = fVar363;
    fVar365 = fVar316 * auVar378._24_4_ * 3.0;
    auVar45._24_4_ = fVar365;
    auVar45._28_4_ = auVar349._28_4_;
    fVar367 = fVar289 * auVar142._0_4_ * 3.0;
    fVar380 = fVar306 * auVar142._4_4_ * 3.0;
    local_9a0._4_4_ = fVar380;
    local_9a0._0_4_ = fVar367;
    fVar383 = fVar316 * auVar142._8_4_ * 3.0;
    local_9a0._8_4_ = fVar383;
    fVar386 = fVar281 * auVar142._12_4_ * 3.0;
    local_9a0._12_4_ = fVar386;
    fVar389 = fVar289 * auVar142._16_4_ * 3.0;
    local_9a0._16_4_ = fVar389;
    fVar392 = fVar306 * auVar142._20_4_ * 3.0;
    local_9a0._20_4_ = fVar392;
    fVar395 = fVar316 * auVar142._24_4_ * 3.0;
    local_9a0._24_4_ = fVar395;
    local_9a0._28_4_ = fStack_2c4;
    fVar435 = fVar289 * auVar151._0_4_ * 3.0;
    fVar441 = fVar306 * auVar151._4_4_ * 3.0;
    auVar46._4_4_ = fVar441;
    auVar46._0_4_ = fVar435;
    fVar442 = fVar316 * auVar151._8_4_ * 3.0;
    auVar46._8_4_ = fVar442;
    fVar443 = fVar281 * auVar151._12_4_ * 3.0;
    auVar46._12_4_ = fVar443;
    fVar444 = fVar289 * auVar151._16_4_ * 3.0;
    auVar46._16_4_ = fVar444;
    fVar445 = fVar306 * auVar151._20_4_ * 3.0;
    auVar46._20_4_ = fVar445;
    fVar446 = fVar316 * auVar151._24_4_ * 3.0;
    auVar46._24_4_ = fVar446;
    auVar46._28_4_ = fVar447;
    fVar259 = fVar289 * auVar34._0_4_ * 3.0;
    fVar211 = fVar306 * auVar34._4_4_ * 3.0;
    auVar47._4_4_ = fVar211;
    auVar47._0_4_ = fVar259;
    fVar279 = fVar316 * auVar34._8_4_ * 3.0;
    auVar47._8_4_ = fVar279;
    fVar281 = fVar281 * auVar34._12_4_ * 3.0;
    auVar47._12_4_ = fVar281;
    fVar289 = fVar289 * auVar34._16_4_ * 3.0;
    auVar47._16_4_ = fVar289;
    fVar306 = fVar306 * auVar34._20_4_ * 3.0;
    auVar47._20_4_ = fVar306;
    fVar316 = fVar316 * auVar34._24_4_ * 3.0;
    auVar47._24_4_ = fVar316;
    auVar47._28_4_ = auVar378._28_4_;
    auVar142 = vperm2f128_avx(auVar451,auVar451,1);
    auVar142 = vshufps_avx(auVar142,auVar451,0x30);
    local_aa0 = vshufps_avx(auVar451,auVar142,0x29);
    auVar142 = vperm2f128_avx(auVar475,auVar475,1);
    auVar142 = vshufps_avx(auVar142,auVar475,0x30);
    auVar36 = vshufps_avx(auVar475,auVar142,0x29);
    auVar151 = vsubps_avx(local_7e0,auVar47);
    auVar142 = vperm2f128_avx(auVar151,auVar151,1);
    auVar142 = vshufps_avx(auVar142,auVar151,0x30);
    local_800 = vshufps_avx(auVar151,auVar142,0x29);
    auVar34 = vsubps_avx(local_aa0,auVar451);
    auVar35 = vsubps_avx(auVar36,auVar475);
    fVar258 = auVar34._0_4_;
    fVar260 = auVar34._4_4_;
    auVar48._4_4_ = fVar441 * fVar260;
    auVar48._0_4_ = fVar435 * fVar258;
    fVar282 = auVar34._8_4_;
    auVar48._8_4_ = fVar442 * fVar282;
    fVar308 = auVar34._12_4_;
    auVar48._12_4_ = fVar443 * fVar308;
    fVar309 = auVar34._16_4_;
    auVar48._16_4_ = fVar444 * fVar309;
    fVar331 = auVar34._20_4_;
    auVar48._20_4_ = fVar445 * fVar331;
    fVar434 = auVar34._24_4_;
    auVar48._24_4_ = fVar446 * fVar434;
    auVar48._28_4_ = auVar151._28_4_;
    fVar129 = auVar35._0_4_;
    fVar261 = auVar35._4_4_;
    auVar49._4_4_ = fVar380 * fVar261;
    auVar49._0_4_ = fVar367 * fVar129;
    fVar283 = auVar35._8_4_;
    auVar49._8_4_ = fVar383 * fVar283;
    fVar310 = auVar35._12_4_;
    auVar49._12_4_ = fVar386 * fVar310;
    fVar311 = auVar35._16_4_;
    auVar49._16_4_ = fVar389 * fVar311;
    fVar333 = auVar35._20_4_;
    auVar49._20_4_ = fVar392 * fVar333;
    fVar41 = auVar35._24_4_;
    auVar49._24_4_ = fVar395 * fVar41;
    auVar49._28_4_ = auVar142._28_4_;
    auVar38 = vsubps_avx(auVar49,auVar48);
    auVar103._4_4_ = fVar162;
    auVar103._0_4_ = fVar128;
    auVar103._8_4_ = fVar164;
    auVar103._12_4_ = fVar166;
    auVar103._16_4_ = fVar167;
    auVar103._20_4_ = fVar168;
    auVar103._24_4_ = fVar169;
    auVar103._28_4_ = fVar170;
    auVar142 = vperm2f128_avx(auVar103,auVar103,1);
    auVar142 = vshufps_avx(auVar142,auVar103,0x30);
    auVar37 = vshufps_avx(auVar103,auVar142,0x29);
    auVar151 = vsubps_avx(auVar37,auVar103);
    auVar50._4_4_ = fVar261 * fVar356;
    auVar50._0_4_ = fVar129 * fVar343;
    auVar50._8_4_ = fVar283 * fVar357;
    auVar50._12_4_ = fVar310 * fVar359;
    auVar50._16_4_ = fVar311 * fVar361;
    auVar50._20_4_ = fVar333 * fVar363;
    auVar50._24_4_ = fVar41 * fVar365;
    auVar50._28_4_ = auVar37._28_4_;
    fVar238 = auVar151._0_4_;
    fVar262 = auVar151._4_4_;
    auVar51._4_4_ = fVar441 * fVar262;
    auVar51._0_4_ = fVar435 * fVar238;
    fVar285 = auVar151._8_4_;
    auVar51._8_4_ = fVar442 * fVar285;
    fVar312 = auVar151._12_4_;
    auVar51._12_4_ = fVar443 * fVar312;
    fVar313 = auVar151._16_4_;
    auVar51._16_4_ = fVar444 * fVar313;
    fVar335 = auVar151._20_4_;
    auVar51._20_4_ = fVar445 * fVar335;
    fVar42 = auVar151._24_4_;
    auVar51._24_4_ = fVar446 * fVar42;
    auVar51._28_4_ = fVar170;
    auVar39 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ = fVar380 * fVar262;
    auVar52._0_4_ = fVar367 * fVar238;
    auVar52._8_4_ = fVar383 * fVar285;
    auVar52._12_4_ = fVar386 * fVar312;
    auVar52._16_4_ = fVar389 * fVar313;
    auVar52._20_4_ = fVar392 * fVar335;
    auVar52._24_4_ = fVar395 * fVar42;
    auVar52._28_4_ = fVar170;
    auVar53._4_4_ = fVar356 * fVar260;
    auVar53._0_4_ = fVar343 * fVar258;
    auVar53._8_4_ = fVar357 * fVar282;
    auVar53._12_4_ = fVar359 * fVar308;
    auVar53._16_4_ = fVar361 * fVar309;
    auVar53._20_4_ = fVar363 * fVar331;
    auVar53._24_4_ = fVar365 * fVar434;
    auVar53._28_4_ = auVar422._28_4_;
    auVar44 = vsubps_avx(auVar53,auVar52);
    fVar318 = auVar44._28_4_;
    fVar307 = auVar39._28_4_ + fVar318;
    auVar254._0_4_ = fVar238 * fVar238 + fVar258 * fVar258 + fVar129 * fVar129;
    auVar254._4_4_ = fVar262 * fVar262 + fVar260 * fVar260 + fVar261 * fVar261;
    auVar254._8_4_ = fVar285 * fVar285 + fVar282 * fVar282 + fVar283 * fVar283;
    auVar254._12_4_ = fVar312 * fVar312 + fVar308 * fVar308 + fVar310 * fVar310;
    auVar254._16_4_ = fVar313 * fVar313 + fVar309 * fVar309 + fVar311 * fVar311;
    auVar254._20_4_ = fVar335 * fVar335 + fVar331 * fVar331 + fVar333 * fVar333;
    auVar254._24_4_ = fVar42 * fVar42 + fVar434 * fVar434 + fVar41 * fVar41;
    auVar254._28_4_ = fVar318 + fVar318 + fVar307;
    auVar142 = vrcpps_avx(auVar254);
    fVar317 = auVar142._0_4_;
    fVar319 = auVar142._4_4_;
    auVar54._4_4_ = fVar319 * auVar254._4_4_;
    auVar54._0_4_ = fVar317 * auVar254._0_4_;
    fVar339 = auVar142._8_4_;
    auVar54._8_4_ = fVar339 * auVar254._8_4_;
    fVar341 = auVar142._12_4_;
    auVar54._12_4_ = fVar341 * auVar254._12_4_;
    fVar284 = auVar142._16_4_;
    auVar54._16_4_ = fVar284 * auVar254._16_4_;
    fVar286 = auVar142._20_4_;
    auVar54._20_4_ = fVar286 * auVar254._20_4_;
    fVar288 = auVar142._24_4_;
    auVar54._24_4_ = fVar288 * auVar254._24_4_;
    auVar54._28_4_ = auVar422._28_4_;
    auVar452._8_4_ = 0x3f800000;
    auVar452._0_8_ = &DAT_3f8000003f800000;
    auVar452._12_4_ = 0x3f800000;
    auVar452._16_4_ = 0x3f800000;
    auVar452._20_4_ = 0x3f800000;
    auVar452._24_4_ = 0x3f800000;
    auVar452._28_4_ = 0x3f800000;
    auVar379 = vsubps_avx(auVar452,auVar54);
    fVar317 = auVar379._0_4_ * fVar317 + fVar317;
    fVar319 = auVar379._4_4_ * fVar319 + fVar319;
    fVar339 = auVar379._8_4_ * fVar339 + fVar339;
    fVar341 = auVar379._12_4_ * fVar341 + fVar341;
    fVar284 = auVar379._16_4_ * fVar284 + fVar284;
    fVar286 = auVar379._20_4_ * fVar286 + fVar286;
    fVar288 = auVar379._24_4_ * fVar288 + fVar288;
    auVar34 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar34 = vshufps_avx(auVar34,local_9a0,0x30);
    auVar34 = vshufps_avx(local_9a0,auVar34,0x29);
    auVar35 = vperm2f128_avx(auVar46,auVar46,1);
    auVar35 = vshufps_avx(auVar35,auVar46,0x30);
    local_a20 = vshufps_avx(auVar46,auVar35,0x29);
    fVar448 = local_a20._0_4_;
    fVar456 = local_a20._4_4_;
    auVar55._4_4_ = fVar456 * fVar260;
    auVar55._0_4_ = fVar448 * fVar258;
    fVar457 = local_a20._8_4_;
    auVar55._8_4_ = fVar457 * fVar282;
    fVar458 = local_a20._12_4_;
    auVar55._12_4_ = fVar458 * fVar308;
    fVar459 = local_a20._16_4_;
    auVar55._16_4_ = fVar459 * fVar309;
    fVar460 = local_a20._20_4_;
    auVar55._20_4_ = fVar460 * fVar331;
    fVar461 = local_a20._24_4_;
    auVar55._24_4_ = fVar461 * fVar434;
    auVar55._28_4_ = auVar35._28_4_;
    fVar368 = auVar34._0_4_;
    fVar381 = auVar34._4_4_;
    auVar56._4_4_ = fVar381 * fVar261;
    auVar56._0_4_ = fVar368 * fVar129;
    fVar384 = auVar34._8_4_;
    auVar56._8_4_ = fVar384 * fVar283;
    fVar387 = auVar34._12_4_;
    auVar56._12_4_ = fVar387 * fVar310;
    fVar390 = auVar34._16_4_;
    auVar56._16_4_ = fVar390 * fVar311;
    fVar393 = auVar34._20_4_;
    auVar56._20_4_ = fVar393 * fVar333;
    fVar396 = auVar34._24_4_;
    auVar56._24_4_ = fVar396 * fVar41;
    auVar56._28_4_ = fVar447;
    auVar35 = vsubps_avx(auVar56,auVar55);
    auVar34 = vperm2f128_avx(auVar45,auVar45,1);
    auVar34 = vshufps_avx(auVar34,auVar45,0x30);
    local_a00 = vshufps_avx(auVar45,auVar34,0x29);
    fVar280 = local_a00._0_4_;
    fVar263 = local_a00._4_4_;
    auVar57._4_4_ = fVar261 * fVar263;
    auVar57._0_4_ = fVar129 * fVar280;
    fVar287 = local_a00._8_4_;
    auVar57._8_4_ = fVar283 * fVar287;
    fVar314 = local_a00._12_4_;
    auVar57._12_4_ = fVar310 * fVar314;
    fVar315 = local_a00._16_4_;
    auVar57._16_4_ = fVar311 * fVar315;
    fVar337 = local_a00._20_4_;
    auVar57._20_4_ = fVar333 * fVar337;
    fVar447 = local_a00._24_4_;
    auVar57._24_4_ = fVar41 * fVar447;
    auVar57._28_4_ = auVar34._28_4_;
    auVar58._4_4_ = fVar456 * fVar262;
    auVar58._0_4_ = fVar448 * fVar238;
    auVar58._8_4_ = fVar457 * fVar285;
    auVar58._12_4_ = fVar458 * fVar312;
    auVar58._16_4_ = fVar459 * fVar313;
    auVar58._20_4_ = fVar460 * fVar335;
    uVar119 = local_a20._28_4_;
    auVar58._24_4_ = fVar461 * fVar42;
    auVar58._28_4_ = uVar119;
    auVar143 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ = fVar381 * fVar262;
    auVar59._0_4_ = fVar368 * fVar238;
    auVar59._8_4_ = fVar384 * fVar285;
    auVar59._12_4_ = fVar387 * fVar312;
    auVar59._16_4_ = fVar390 * fVar313;
    auVar59._20_4_ = fVar393 * fVar335;
    auVar59._24_4_ = fVar396 * fVar42;
    auVar59._28_4_ = uVar119;
    auVar60._4_4_ = fVar263 * fVar260;
    auVar60._0_4_ = fVar280 * fVar258;
    auVar60._8_4_ = fVar287 * fVar282;
    auVar60._12_4_ = fVar314 * fVar308;
    auVar60._16_4_ = fVar315 * fVar309;
    auVar60._20_4_ = fVar337 * fVar331;
    auVar60._24_4_ = fVar447 * fVar434;
    auVar60._28_4_ = auVar464._28_4_;
    auVar34 = vsubps_avx(auVar60,auVar59);
    fVar318 = auVar34._28_4_;
    auVar61._4_4_ =
         (auVar38._4_4_ * auVar38._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar44._4_4_ * auVar44._4_4_) * fVar319;
    auVar61._0_4_ =
         (auVar38._0_4_ * auVar38._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar44._0_4_ * auVar44._0_4_) * fVar317;
    auVar61._8_4_ =
         (auVar38._8_4_ * auVar38._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar44._8_4_ * auVar44._8_4_) * fVar339;
    auVar61._12_4_ =
         (auVar38._12_4_ * auVar38._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar44._12_4_ * auVar44._12_4_) * fVar341;
    auVar61._16_4_ =
         (auVar38._16_4_ * auVar38._16_4_ +
         auVar39._16_4_ * auVar39._16_4_ + auVar44._16_4_ * auVar44._16_4_) * fVar284;
    auVar61._20_4_ =
         (auVar38._20_4_ * auVar38._20_4_ +
         auVar39._20_4_ * auVar39._20_4_ + auVar44._20_4_ * auVar44._20_4_) * fVar286;
    auVar61._24_4_ =
         (auVar38._24_4_ * auVar38._24_4_ +
         auVar39._24_4_ * auVar39._24_4_ + auVar44._24_4_ * auVar44._24_4_) * fVar288;
    auVar61._28_4_ = auVar38._28_4_ + fVar307;
    auVar62._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar143._4_4_ * auVar143._4_4_ + auVar34._4_4_ * auVar34._4_4_) * fVar319;
    auVar62._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar143._0_4_ * auVar143._0_4_ + auVar34._0_4_ * auVar34._0_4_) * fVar317;
    auVar62._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar143._8_4_ * auVar143._8_4_ + auVar34._8_4_ * auVar34._8_4_) * fVar339;
    auVar62._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar143._12_4_ * auVar143._12_4_ + auVar34._12_4_ * auVar34._12_4_) * fVar341;
    auVar62._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar143._16_4_ * auVar143._16_4_ + auVar34._16_4_ * auVar34._16_4_) * fVar284;
    auVar62._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar143._20_4_ * auVar143._20_4_ + auVar34._20_4_ * auVar34._20_4_) * fVar286;
    auVar62._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar143._24_4_ * auVar143._24_4_ + auVar34._24_4_ * auVar34._24_4_) * fVar288;
    auVar62._28_4_ = auVar379._28_4_ + auVar142._28_4_;
    auVar142 = vmaxps_avx(auVar61,auVar62);
    auVar34 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar34 = vshufps_avx(auVar34,local_7e0,0x30);
    local_840 = vshufps_avx(local_7e0,auVar34,0x29);
    auVar192._0_4_ = (float)local_7e0._0_4_ + fVar259;
    auVar192._4_4_ = local_7e0._4_4_ + fVar211;
    auVar192._8_4_ = local_7e0._8_4_ + fVar279;
    auVar192._12_4_ = local_7e0._12_4_ + fVar281;
    auVar192._16_4_ = local_7e0._16_4_ + fVar289;
    auVar192._20_4_ = local_7e0._20_4_ + fVar306;
    auVar192._24_4_ = local_7e0._24_4_ + fVar316;
    auVar192._28_4_ = local_7e0._28_4_ + auVar378._28_4_;
    auVar34 = vmaxps_avx(local_7e0,auVar192);
    auVar35 = vmaxps_avx(local_800,local_840);
    auVar34 = vmaxps_avx(auVar34,auVar35);
    auVar35 = vrsqrtps_avx(auVar254);
    fVar259 = auVar35._0_4_;
    fVar211 = auVar35._4_4_;
    fVar279 = auVar35._8_4_;
    fVar281 = auVar35._12_4_;
    fVar289 = auVar35._16_4_;
    fVar306 = auVar35._20_4_;
    fVar316 = auVar35._24_4_;
    fVar369 = fVar259 * 1.5 + fVar259 * fVar259 * fVar259 * auVar254._0_4_ * -0.5;
    fVar382 = fVar211 * 1.5 + fVar211 * fVar211 * fVar211 * auVar254._4_4_ * -0.5;
    fVar385 = fVar279 * 1.5 + fVar279 * fVar279 * fVar279 * auVar254._8_4_ * -0.5;
    fVar388 = fVar281 * 1.5 + fVar281 * fVar281 * fVar281 * auVar254._12_4_ * -0.5;
    fVar391 = fVar289 * 1.5 + fVar289 * fVar289 * fVar289 * auVar254._16_4_ * -0.5;
    fVar394 = fVar306 * 1.5 + fVar306 * fVar306 * fVar306 * auVar254._20_4_ * -0.5;
    fVar397 = fVar316 * 1.5 + fVar316 * fVar316 * fVar316 * auVar254._24_4_ * -0.5;
    auVar378 = vsubps_avx(ZEXT432(0) << 0x20,auVar451);
    auVar35 = vsubps_avx(ZEXT432(0) << 0x20,auVar475);
    fVar474 = auVar35._0_4_;
    fVar477 = auVar35._4_4_;
    fVar478 = auVar35._8_4_;
    fVar479 = auVar35._12_4_;
    fVar480 = auVar35._16_4_;
    fVar481 = auVar35._20_4_;
    fVar482 = auVar35._24_4_;
    fVar259 = auVar378._0_4_;
    fVar279 = auVar378._4_4_;
    fVar289 = auVar378._8_4_;
    fVar316 = auVar378._12_4_;
    fVar317 = auVar378._16_4_;
    fVar339 = auVar378._20_4_;
    fVar284 = auVar378._24_4_;
    auVar104._4_4_ = fVar162;
    auVar104._0_4_ = fVar128;
    auVar104._8_4_ = fVar164;
    auVar104._12_4_ = fVar166;
    auVar104._16_4_ = fVar167;
    auVar104._20_4_ = fVar168;
    auVar104._24_4_ = fVar169;
    auVar104._28_4_ = fVar170;
    auVar38 = vsubps_avx(ZEXT832(0) << 0x20,auVar104);
    fVar211 = auVar38._0_4_;
    fVar281 = auVar38._4_4_;
    fVar306 = auVar38._8_4_;
    fVar307 = auVar38._12_4_;
    fVar319 = auVar38._16_4_;
    fVar341 = auVar38._20_4_;
    fVar286 = auVar38._24_4_;
    auVar440._0_4_ =
         (float)local_860._0_4_ * fVar211 +
         (float)local_880._0_4_ * fVar259 + fVar474 * (float)local_900._0_4_;
    auVar440._4_4_ =
         (float)local_860._4_4_ * fVar281 +
         (float)local_880._4_4_ * fVar279 + fVar477 * (float)local_900._4_4_;
    auVar440._8_4_ = fStack_858 * fVar306 + fStack_878 * fVar289 + fVar478 * fStack_8f8;
    auVar440._12_4_ = fStack_854 * fVar307 + fStack_874 * fVar316 + fVar479 * fStack_8f4;
    auVar440._16_4_ = fStack_850 * fVar319 + fStack_870 * fVar317 + fVar480 * fStack_8f0;
    auVar440._20_4_ = fStack_84c * fVar341 + fStack_86c * fVar339 + fVar481 * fStack_8ec;
    auVar440._24_4_ = fStack_848 * fVar286 + fStack_868 * fVar284 + fVar482 * fStack_8e8;
    auVar440._28_4_ = fVar318 + auVar143._28_4_ + fVar318 + 0.0;
    auVar453._0_4_ = fVar211 * fVar211 + fVar259 * fVar259 + fVar474 * fVar474;
    auVar453._4_4_ = fVar281 * fVar281 + fVar279 * fVar279 + fVar477 * fVar477;
    auVar453._8_4_ = fVar306 * fVar306 + fVar289 * fVar289 + fVar478 * fVar478;
    auVar453._12_4_ = fVar307 * fVar307 + fVar316 * fVar316 + fVar479 * fVar479;
    auVar453._16_4_ = fVar319 * fVar319 + fVar317 * fVar317 + fVar480 * fVar480;
    auVar453._20_4_ = fVar341 * fVar341 + fVar339 * fVar339 + fVar481 * fVar481;
    auVar453._24_4_ = fVar286 * fVar286 + fVar284 * fVar284 + fVar482 * fVar482;
    auVar453._28_4_ = auVar464._28_4_ + auVar464._28_4_ + fVar318;
    fVar398 = (float)local_860._0_4_ * fVar238 * fVar369 +
              fVar369 * fVar258 * (float)local_880._0_4_ +
              fVar129 * fVar369 * (float)local_900._0_4_;
    fVar408 = (float)local_860._4_4_ * fVar262 * fVar382 +
              fVar382 * fVar260 * (float)local_880._4_4_ +
              fVar261 * fVar382 * (float)local_900._4_4_;
    fVar409 = fStack_858 * fVar285 * fVar385 +
              fVar385 * fVar282 * fStack_878 + fVar283 * fVar385 * fStack_8f8;
    fVar410 = fStack_854 * fVar312 * fVar388 +
              fVar388 * fVar308 * fStack_874 + fVar310 * fVar388 * fStack_8f4;
    fVar411 = fStack_850 * fVar313 * fVar391 +
              fVar391 * fVar309 * fStack_870 + fVar311 * fVar391 * fStack_8f0;
    fVar413 = fStack_84c * fVar335 * fVar394 +
              fVar394 * fVar331 * fStack_86c + fVar333 * fVar394 * fStack_8ec;
    fVar415 = fStack_848 * fVar42 * fVar397 +
              fVar397 * fVar434 * fStack_868 + fVar41 * fVar397 * fStack_8e8;
    fVar318 = fStack_844 + fStack_864 + fStack_8e4;
    fVar462 = fVar211 * fVar238 * fVar369 +
              fVar369 * fVar258 * fVar259 + fVar474 * fVar129 * fVar369;
    fVar467 = fVar281 * fVar262 * fVar382 +
              fVar382 * fVar260 * fVar279 + fVar477 * fVar261 * fVar382;
    fVar468 = fVar306 * fVar285 * fVar385 +
              fVar385 * fVar282 * fVar289 + fVar478 * fVar283 * fVar385;
    fVar469 = fVar307 * fVar312 * fVar388 +
              fVar388 * fVar308 * fVar316 + fVar479 * fVar310 * fVar388;
    fVar470 = fVar319 * fVar313 * fVar391 +
              fVar391 * fVar309 * fVar317 + fVar480 * fVar311 * fVar391;
    fVar471 = fVar341 * fVar335 * fVar394 +
              fVar394 * fVar331 * fVar339 + fVar481 * fVar333 * fVar394;
    fVar472 = fVar286 * fVar42 * fVar397 + fVar397 * fVar434 * fVar284 + fVar482 * fVar41 * fVar397;
    fVar473 = fStack_864 + fVar318;
    auVar63._4_4_ = fVar408 * fVar467;
    auVar63._0_4_ = fVar398 * fVar462;
    auVar63._8_4_ = fVar409 * fVar468;
    auVar63._12_4_ = fVar410 * fVar469;
    auVar63._16_4_ = fVar411 * fVar470;
    auVar63._20_4_ = fVar413 * fVar471;
    auVar63._24_4_ = fVar415 * fVar472;
    auVar63._28_4_ = fVar318;
    auVar39 = vsubps_avx(auVar440,auVar63);
    auVar64._4_4_ = fVar467 * fVar467;
    auVar64._0_4_ = fVar462 * fVar462;
    auVar64._8_4_ = fVar468 * fVar468;
    auVar64._12_4_ = fVar469 * fVar469;
    auVar64._16_4_ = fVar470 * fVar470;
    auVar64._20_4_ = fVar471 * fVar471;
    auVar64._24_4_ = fVar472 * fVar472;
    auVar64._28_4_ = fStack_864;
    auVar44 = vsubps_avx(auVar453,auVar64);
    auVar330 = ZEXT3264(auVar44);
    auVar35 = vsqrtps_avx(auVar142);
    fVar318 = (auVar35._0_4_ + auVar34._0_4_) * 1.0000002;
    fVar288 = (auVar35._4_4_ + auVar34._4_4_) * 1.0000002;
    fVar213 = (auVar35._8_4_ + auVar34._8_4_) * 1.0000002;
    fVar215 = (auVar35._12_4_ + auVar34._12_4_) * 1.0000002;
    fVar216 = (auVar35._16_4_ + auVar34._16_4_) * 1.0000002;
    fVar217 = (auVar35._20_4_ + auVar34._20_4_) * 1.0000002;
    fVar218 = (auVar35._24_4_ + auVar34._24_4_) * 1.0000002;
    auVar65._4_4_ = fVar288 * fVar288;
    auVar65._0_4_ = fVar318 * fVar318;
    auVar65._8_4_ = fVar213 * fVar213;
    auVar65._12_4_ = fVar215 * fVar215;
    auVar65._16_4_ = fVar216 * fVar216;
    auVar65._20_4_ = fVar217 * fVar217;
    auVar65._24_4_ = fVar218 * fVar218;
    auVar65._28_4_ = auVar35._28_4_ + auVar34._28_4_;
    fVar288 = auVar39._0_4_ + auVar39._0_4_;
    fVar213 = auVar39._4_4_ + auVar39._4_4_;
    local_420._0_8_ = CONCAT44(fVar213,fVar288);
    local_420._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    local_420._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_420._16_4_ = auVar39._16_4_ + auVar39._16_4_;
    local_420._20_4_ = auVar39._20_4_ + auVar39._20_4_;
    local_420._24_4_ = auVar39._24_4_ + auVar39._24_4_;
    fVar318 = auVar39._28_4_;
    local_420._28_4_ = fVar318 + fVar318;
    auVar34 = vsubps_avx(auVar44,auVar65);
    auVar66._4_4_ = fVar408 * fVar408;
    auVar66._0_4_ = fVar398 * fVar398;
    auVar66._8_4_ = fVar409 * fVar409;
    auVar66._12_4_ = fVar410 * fVar410;
    auVar66._16_4_ = fVar411 * fVar411;
    auVar66._20_4_ = fVar413 * fVar413;
    auVar66._24_4_ = fVar415 * fVar415;
    auVar66._28_4_ = auVar151._28_4_;
    auVar433 = ZEXT3264(auVar66);
    auVar39 = vsubps_avx(local_3a0,auVar66);
    auVar67._4_4_ = fVar213 * fVar213;
    auVar67._0_4_ = fVar288 * fVar288;
    auVar67._8_4_ = local_420._8_4_ * local_420._8_4_;
    auVar67._12_4_ = local_420._12_4_ * local_420._12_4_;
    auVar67._16_4_ = local_420._16_4_ * local_420._16_4_;
    auVar67._20_4_ = local_420._20_4_ * local_420._20_4_;
    auVar67._24_4_ = local_420._24_4_ * local_420._24_4_;
    auVar67._28_4_ = fVar318;
    fVar215 = auVar39._0_4_;
    fVar216 = auVar39._4_4_;
    fVar217 = auVar39._8_4_;
    fVar218 = auVar39._12_4_;
    fVar412 = auVar39._16_4_;
    fVar414 = auVar39._20_4_;
    fVar416 = auVar39._24_4_;
    auVar68._4_4_ = fVar216 * 4.0 * auVar34._4_4_;
    auVar68._0_4_ = fVar215 * 4.0 * auVar34._0_4_;
    auVar68._8_4_ = fVar217 * 4.0 * auVar34._8_4_;
    auVar68._12_4_ = fVar218 * 4.0 * auVar34._12_4_;
    auVar68._16_4_ = fVar412 * 4.0 * auVar34._16_4_;
    auVar68._20_4_ = fVar414 * 4.0 * auVar34._20_4_;
    auVar68._24_4_ = fVar416 * 4.0 * auVar34._24_4_;
    auVar68._28_4_ = 0x40800000;
    auVar379 = vsubps_avx(auVar67,auVar68);
    auVar142 = vcmpps_avx(auVar379,ZEXT832(0) << 0x20,5);
    fVar318 = auVar39._28_4_;
    if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar142 >> 0x7f,0) == '\0') &&
          (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar142 >> 0xbf,0) == '\0') &&
        (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar142[0x1f])
    {
      auVar147._8_4_ = 0x7f800000;
      auVar147._0_8_ = 0x7f8000007f800000;
      auVar147._12_4_ = 0x7f800000;
      auVar147._16_4_ = 0x7f800000;
      auVar147._20_4_ = 0x7f800000;
      auVar147._24_4_ = 0x7f800000;
      auVar147._28_4_ = 0x7f800000;
      auVar465._8_4_ = 0xff800000;
      auVar465._0_8_ = 0xff800000ff800000;
      auVar465._12_4_ = 0xff800000;
      auVar465._16_4_ = 0xff800000;
      auVar465._20_4_ = 0xff800000;
      auVar465._24_4_ = 0xff800000;
      auVar465._28_4_ = 0xff800000;
    }
    else {
      auVar188 = vsqrtps_avx(auVar379);
      auVar325._0_4_ = fVar215 + fVar215;
      auVar325._4_4_ = fVar216 + fVar216;
      auVar325._8_4_ = fVar217 + fVar217;
      auVar325._12_4_ = fVar218 + fVar218;
      auVar325._16_4_ = fVar412 + fVar412;
      auVar325._20_4_ = fVar414 + fVar414;
      auVar325._24_4_ = fVar416 + fVar416;
      auVar325._28_4_ = fVar318 + fVar318;
      auVar144 = vrcpps_avx(auVar325);
      auVar143 = vcmpps_avx(auVar379,ZEXT832(0) << 0x20,5);
      fVar320 = auVar144._0_4_;
      fVar332 = auVar144._4_4_;
      auVar69._4_4_ = auVar325._4_4_ * fVar332;
      auVar69._0_4_ = auVar325._0_4_ * fVar320;
      fVar334 = auVar144._8_4_;
      auVar69._8_4_ = auVar325._8_4_ * fVar334;
      fVar336 = auVar144._12_4_;
      auVar69._12_4_ = auVar325._12_4_ * fVar336;
      fVar338 = auVar144._16_4_;
      auVar69._16_4_ = auVar325._16_4_ * fVar338;
      fVar340 = auVar144._20_4_;
      auVar69._20_4_ = auVar325._20_4_ * fVar340;
      fVar342 = auVar144._24_4_;
      auVar69._24_4_ = auVar325._24_4_ * fVar342;
      auVar69._28_4_ = auVar325._28_4_;
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = &DAT_3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      auVar379 = vsubps_avx(auVar148,auVar69);
      fVar320 = fVar320 + fVar320 * auVar379._0_4_;
      fVar332 = fVar332 + fVar332 * auVar379._4_4_;
      fVar334 = fVar334 + fVar334 * auVar379._8_4_;
      fVar336 = fVar336 + fVar336 * auVar379._12_4_;
      fVar338 = fVar338 + fVar338 * auVar379._16_4_;
      fVar340 = fVar340 + fVar340 * auVar379._20_4_;
      fVar342 = fVar342 + fVar342 * auVar379._24_4_;
      auVar350._0_8_ = CONCAT44(fVar213,fVar288) ^ 0x8000000080000000;
      auVar350._8_4_ = -local_420._8_4_;
      auVar350._12_4_ = -local_420._12_4_;
      auVar350._16_4_ = -local_420._16_4_;
      auVar350._20_4_ = -local_420._20_4_;
      auVar350._24_4_ = -local_420._24_4_;
      auVar350._28_4_ = -local_420._28_4_;
      auVar189 = vsubps_avx(auVar350,auVar188);
      fVar288 = auVar189._0_4_ * fVar320;
      fVar213 = auVar189._4_4_ * fVar332;
      auVar70._4_4_ = fVar213;
      auVar70._0_4_ = fVar288;
      fVar358 = auVar189._8_4_ * fVar334;
      auVar70._8_4_ = fVar358;
      fVar360 = auVar189._12_4_ * fVar336;
      auVar70._12_4_ = fVar360;
      fVar362 = auVar189._16_4_ * fVar338;
      auVar70._16_4_ = fVar362;
      fVar364 = auVar189._20_4_ * fVar340;
      auVar70._20_4_ = fVar364;
      fVar366 = auVar189._24_4_ * fVar342;
      auVar70._24_4_ = fVar366;
      auVar70._28_4_ = auVar189._28_4_;
      auVar188 = vsubps_avx(auVar188,local_420);
      fVar320 = auVar188._0_4_ * fVar320;
      fVar332 = auVar188._4_4_ * fVar332;
      auVar71._4_4_ = fVar332;
      auVar71._0_4_ = fVar320;
      fVar334 = auVar188._8_4_ * fVar334;
      auVar71._8_4_ = fVar334;
      fVar336 = auVar188._12_4_ * fVar336;
      auVar71._12_4_ = fVar336;
      fVar338 = auVar188._16_4_ * fVar338;
      auVar71._16_4_ = fVar338;
      fVar340 = auVar188._20_4_ * fVar340;
      auVar71._20_4_ = fVar340;
      fVar342 = auVar188._24_4_ * fVar342;
      auVar71._24_4_ = fVar342;
      auVar71._28_4_ = auVar188._28_4_;
      fStack_624 = fVar473 + auVar144._28_4_ + auVar379._28_4_;
      local_640[0] = fVar369 * (fVar462 + fVar398 * fVar288);
      local_640[1] = fVar382 * (fVar467 + fVar408 * fVar213);
      local_640[2] = fVar385 * (fVar468 + fVar409 * fVar358);
      local_640[3] = fVar388 * (fVar469 + fVar410 * fVar360);
      fStack_630 = fVar391 * (fVar470 + fVar411 * fVar362);
      fStack_62c = fVar394 * (fVar471 + fVar413 * fVar364);
      fStack_628 = fVar397 * (fVar472 + fVar415 * fVar366);
      local_660[0] = fVar369 * (fVar462 + fVar398 * fVar320);
      local_660[1] = fVar382 * (fVar467 + fVar408 * fVar332);
      local_660[2] = fVar385 * (fVar468 + fVar409 * fVar334);
      local_660[3] = fVar388 * (fVar469 + fVar410 * fVar336);
      fStack_650 = fVar391 * (fVar470 + fVar411 * fVar338);
      fStack_64c = fVar394 * (fVar471 + fVar413 * fVar340);
      fStack_648 = fVar397 * (fVar472 + fVar415 * fVar342);
      fStack_644 = fVar473 + fStack_624;
      auVar326._8_4_ = 0x7f800000;
      auVar326._0_8_ = 0x7f8000007f800000;
      auVar326._12_4_ = 0x7f800000;
      auVar326._16_4_ = 0x7f800000;
      auVar326._20_4_ = 0x7f800000;
      auVar326._24_4_ = 0x7f800000;
      auVar326._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar326,auVar70,auVar143);
      auVar351._8_4_ = 0x7fffffff;
      auVar351._0_8_ = 0x7fffffff7fffffff;
      auVar351._12_4_ = 0x7fffffff;
      auVar351._16_4_ = 0x7fffffff;
      auVar351._20_4_ = 0x7fffffff;
      auVar351._24_4_ = 0x7fffffff;
      auVar351._28_4_ = 0x7fffffff;
      auVar379 = vandps_avx(auVar66,auVar351);
      auVar379 = vmaxps_avx(local_4c0,auVar379);
      auVar72._4_4_ = auVar379._4_4_ * 1.9073486e-06;
      auVar72._0_4_ = auVar379._0_4_ * 1.9073486e-06;
      auVar72._8_4_ = auVar379._8_4_ * 1.9073486e-06;
      auVar72._12_4_ = auVar379._12_4_ * 1.9073486e-06;
      auVar72._16_4_ = auVar379._16_4_ * 1.9073486e-06;
      auVar72._20_4_ = auVar379._20_4_ * 1.9073486e-06;
      auVar72._24_4_ = auVar379._24_4_ * 1.9073486e-06;
      auVar72._28_4_ = auVar379._28_4_;
      auVar379 = vandps_avx(auVar39,auVar351);
      auVar379 = vcmpps_avx(auVar379,auVar72,1);
      auVar327._8_4_ = 0xff800000;
      auVar327._0_8_ = 0xff800000ff800000;
      auVar327._12_4_ = 0xff800000;
      auVar327._16_4_ = 0xff800000;
      auVar327._20_4_ = 0xff800000;
      auVar327._24_4_ = 0xff800000;
      auVar327._28_4_ = 0xff800000;
      auVar330 = ZEXT3264(auVar327);
      auVar465 = vblendvps_avx(auVar327,auVar71,auVar143);
      auVar144 = auVar143 & auVar379;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar142 = vandps_avx(auVar379,auVar143);
        auVar180 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
        auVar379 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,2);
        auVar455._8_4_ = 0xff800000;
        auVar455._0_8_ = 0xff800000ff800000;
        auVar455._12_4_ = 0xff800000;
        auVar455._16_4_ = 0xff800000;
        auVar455._20_4_ = 0xff800000;
        auVar455._24_4_ = 0xff800000;
        auVar455._28_4_ = 0xff800000;
        auVar424._8_4_ = 0x7f800000;
        auVar424._0_8_ = 0x7f8000007f800000;
        auVar424._12_4_ = 0x7f800000;
        auVar424._16_4_ = 0x7f800000;
        auVar424._20_4_ = 0x7f800000;
        auVar424._24_4_ = 0x7f800000;
        auVar424._28_4_ = 0x7f800000;
        auVar34 = vblendvps_avx(auVar424,auVar455,auVar379);
        auVar11 = vpmovsxwd_avx(auVar180);
        auVar180 = vpunpckhwd_avx(auVar180,auVar180);
        auVar305._16_16_ = auVar180;
        auVar305._0_16_ = auVar11;
        auVar147 = vblendvps_avx(auVar147,auVar34,auVar305);
        auVar34 = vblendvps_avx(auVar455,auVar424,auVar379);
        auVar330 = ZEXT3264(auVar34);
        auVar465 = vblendvps_avx(auVar465,auVar34,auVar305);
        auVar34 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar236._0_4_ = auVar142._0_4_ ^ auVar34._0_4_;
        auVar236._4_4_ = auVar142._4_4_ ^ auVar34._4_4_;
        auVar236._8_4_ = auVar142._8_4_ ^ auVar34._8_4_;
        auVar236._12_4_ = auVar142._12_4_ ^ auVar34._12_4_;
        auVar236._16_4_ = auVar142._16_4_ ^ auVar34._16_4_;
        auVar236._20_4_ = auVar142._20_4_ ^ auVar34._20_4_;
        auVar236._24_4_ = auVar142._24_4_ ^ auVar34._24_4_;
        auVar236._28_4_ = auVar142._28_4_ ^ auVar34._28_4_;
        auVar142 = vorps_avx(auVar379,auVar236);
        auVar142 = vandps_avx(auVar143,auVar142);
      }
    }
    auVar34 = local_3c0 & auVar142;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
      auVar275._8_4_ = 0x3f800000;
      auVar275._0_8_ = &DAT_3f8000003f800000;
      auVar275._12_4_ = 0x3f800000;
      auVar275._16_4_ = 0x3f800000;
      auVar275._20_4_ = 0x3f800000;
      auVar275._24_4_ = 0x3f800000;
      auVar275._28_4_ = 0x3f800000;
      auVar355 = ZEXT1664((undefined1  [16])0x0);
    }
    else {
      auVar180 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),0);
      auVar193._16_16_ = auVar180;
      auVar193._0_16_ = auVar180;
      auVar143 = vminps_avx(auVar193,auVar465);
      auVar149._0_4_ =
           (float)local_860._0_4_ * fVar343 +
           (float)local_880._0_4_ * fVar367 + fVar435 * (float)local_900._0_4_;
      auVar149._4_4_ =
           (float)local_860._4_4_ * fVar356 +
           (float)local_880._4_4_ * fVar380 + fVar441 * (float)local_900._4_4_;
      auVar149._8_4_ = fStack_858 * fVar357 + fStack_878 * fVar383 + fVar442 * fStack_8f8;
      auVar149._12_4_ = fStack_854 * fVar359 + fStack_874 * fVar386 + fVar443 * fStack_8f4;
      auVar149._16_4_ = fStack_850 * fVar361 + fStack_870 * fVar389 + fVar444 * fStack_8f0;
      auVar149._20_4_ = fStack_84c * fVar363 + fStack_86c * fVar392 + fVar445 * fStack_8ec;
      auVar149._24_4_ = fStack_848 * fVar365 + fStack_868 * fVar395 + fVar446 * fStack_8e8;
      auVar149._28_4_ = auVar349._28_4_ + auVar38._28_4_ + 1.0;
      auVar34 = vrcpps_avx(auVar149);
      fVar288 = auVar34._0_4_;
      fVar213 = auVar34._4_4_;
      auVar73._4_4_ = auVar149._4_4_ * fVar213;
      auVar73._0_4_ = auVar149._0_4_ * fVar288;
      fVar320 = auVar34._8_4_;
      auVar73._8_4_ = auVar149._8_4_ * fVar320;
      fVar332 = auVar34._12_4_;
      auVar73._12_4_ = auVar149._12_4_ * fVar332;
      fVar334 = auVar34._16_4_;
      auVar73._16_4_ = auVar149._16_4_ * fVar334;
      fVar336 = auVar34._20_4_;
      auVar73._20_4_ = auVar149._20_4_ * fVar336;
      fVar338 = auVar34._24_4_;
      auVar73._24_4_ = auVar149._24_4_ * fVar338;
      auVar73._28_4_ = 0x3f800000;
      auVar423._8_4_ = 0x3f800000;
      auVar423._0_8_ = &DAT_3f8000003f800000;
      auVar423._12_4_ = 0x3f800000;
      auVar423._16_4_ = 0x3f800000;
      auVar423._20_4_ = 0x3f800000;
      auVar423._24_4_ = 0x3f800000;
      auVar423._28_4_ = 0x3f800000;
      auVar144 = vsubps_avx(auVar423,auVar73);
      auVar352._8_4_ = 0x7fffffff;
      auVar352._0_8_ = 0x7fffffff7fffffff;
      auVar352._12_4_ = 0x7fffffff;
      auVar352._16_4_ = 0x7fffffff;
      auVar352._20_4_ = 0x7fffffff;
      auVar352._24_4_ = 0x7fffffff;
      auVar352._28_4_ = 0x7fffffff;
      auVar34 = vandps_avx(auVar149,auVar352);
      auVar406._8_4_ = 0x219392ef;
      auVar406._0_8_ = 0x219392ef219392ef;
      auVar406._12_4_ = 0x219392ef;
      auVar406._16_4_ = 0x219392ef;
      auVar406._20_4_ = 0x219392ef;
      auVar406._24_4_ = 0x219392ef;
      auVar406._28_4_ = 0x219392ef;
      auVar379 = vcmpps_avx(auVar34,auVar406,1);
      auVar74._4_4_ =
           (fVar213 + fVar213 * auVar144._4_4_) *
           -(fVar281 * fVar356 + fVar279 * fVar380 + fVar477 * fVar441);
      auVar74._0_4_ =
           (fVar288 + fVar288 * auVar144._0_4_) *
           -(fVar211 * fVar343 + fVar259 * fVar367 + fVar474 * fVar435);
      auVar74._8_4_ =
           (fVar320 + fVar320 * auVar144._8_4_) *
           -(fVar306 * fVar357 + fVar289 * fVar383 + fVar478 * fVar442);
      auVar74._12_4_ =
           (fVar332 + fVar332 * auVar144._12_4_) *
           -(fVar307 * fVar359 + fVar316 * fVar386 + fVar479 * fVar443);
      auVar74._16_4_ =
           (fVar334 + fVar334 * auVar144._16_4_) *
           -(fVar319 * fVar361 + fVar317 * fVar389 + fVar480 * fVar444);
      auVar74._20_4_ =
           (fVar336 + fVar336 * auVar144._20_4_) *
           -(fVar341 * fVar363 + fVar339 * fVar392 + fVar481 * fVar445);
      auVar74._24_4_ =
           (fVar338 + fVar338 * auVar144._24_4_) *
           -(fVar286 * fVar365 + fVar284 * fVar395 + fVar482 * fVar446);
      auVar74._28_4_ = -(auVar38._28_4_ + auVar378._28_4_ + 1.0);
      auVar378 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar34 = vcmpps_avx(auVar149,auVar378,1);
      auVar34 = vorps_avx(auVar379,auVar34);
      auVar432._8_4_ = 0xff800000;
      auVar432._0_8_ = 0xff800000ff800000;
      auVar432._12_4_ = 0xff800000;
      auVar432._16_4_ = 0xff800000;
      auVar432._20_4_ = 0xff800000;
      auVar432._24_4_ = 0xff800000;
      auVar432._28_4_ = 0xff800000;
      auVar433 = ZEXT3264(auVar432);
      auVar34 = vblendvps_avx(auVar74,auVar432,auVar34);
      auVar378 = vcmpps_avx(auVar149,auVar378,6);
      auVar378 = vorps_avx(auVar379,auVar378);
      auVar454._8_4_ = 0x7f800000;
      auVar454._0_8_ = 0x7f8000007f800000;
      auVar454._12_4_ = 0x7f800000;
      auVar454._16_4_ = 0x7f800000;
      auVar454._20_4_ = 0x7f800000;
      auVar454._24_4_ = 0x7f800000;
      auVar454._28_4_ = 0x7f800000;
      auVar378 = vblendvps_avx(auVar74,auVar454,auVar378);
      auVar38 = vmaxps_avx(local_3e0,auVar147);
      auVar38 = vmaxps_avx(auVar38,auVar34);
      auVar378 = vminps_avx(auVar143,auVar378);
      auVar379 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar34 = vsubps_avx(auVar379,local_aa0);
      auVar36 = vsubps_avx(auVar379,auVar36);
      auVar75._4_4_ = auVar36._4_4_ * -fVar456;
      auVar75._0_4_ = auVar36._0_4_ * -fVar448;
      auVar75._8_4_ = auVar36._8_4_ * -fVar457;
      auVar75._12_4_ = auVar36._12_4_ * -fVar458;
      auVar75._16_4_ = auVar36._16_4_ * -fVar459;
      auVar75._20_4_ = auVar36._20_4_ * -fVar460;
      auVar75._24_4_ = auVar36._24_4_ * -fVar461;
      auVar75._28_4_ = auVar36._28_4_;
      auVar76._4_4_ = fVar381 * auVar34._4_4_;
      auVar76._0_4_ = fVar368 * auVar34._0_4_;
      auVar76._8_4_ = fVar384 * auVar34._8_4_;
      auVar76._12_4_ = fVar387 * auVar34._12_4_;
      auVar76._16_4_ = fVar390 * auVar34._16_4_;
      auVar76._20_4_ = fVar393 * auVar34._20_4_;
      auVar76._24_4_ = fVar396 * auVar34._24_4_;
      auVar76._28_4_ = auVar34._28_4_;
      auVar34 = vsubps_avx(auVar75,auVar76);
      auVar36 = vsubps_avx(auVar379,auVar37);
      auVar77._4_4_ = fVar263 * auVar36._4_4_;
      auVar77._0_4_ = fVar280 * auVar36._0_4_;
      auVar77._8_4_ = fVar287 * auVar36._8_4_;
      auVar77._12_4_ = fVar314 * auVar36._12_4_;
      auVar77._16_4_ = fVar315 * auVar36._16_4_;
      auVar77._20_4_ = fVar337 * auVar36._20_4_;
      uVar9 = auVar36._28_4_;
      auVar77._24_4_ = fVar447 * auVar36._24_4_;
      auVar77._28_4_ = uVar9;
      auVar379 = vsubps_avx(auVar34,auVar77);
      auVar78._4_4_ = -fVar456 * (float)local_900._4_4_;
      auVar78._0_4_ = -fVar448 * (float)local_900._0_4_;
      auVar78._8_4_ = -fVar457 * fStack_8f8;
      auVar78._12_4_ = -fVar458 * fStack_8f4;
      auVar78._16_4_ = -fVar459 * fStack_8f0;
      auVar78._20_4_ = -fVar460 * fStack_8ec;
      auVar78._24_4_ = -fVar461 * fStack_8e8;
      auVar78._28_4_ = uVar119 ^ 0x80000000;
      auVar79._4_4_ = (float)local_880._4_4_ * fVar381;
      auVar79._0_4_ = (float)local_880._0_4_ * fVar368;
      auVar79._8_4_ = fStack_878 * fVar384;
      auVar79._12_4_ = fStack_874 * fVar387;
      auVar79._16_4_ = fStack_870 * fVar390;
      auVar79._20_4_ = fStack_86c * fVar393;
      auVar79._24_4_ = fStack_868 * fVar396;
      auVar79._28_4_ = uVar9;
      auVar275._8_4_ = 0x3f800000;
      auVar275._0_8_ = &DAT_3f8000003f800000;
      auVar275._12_4_ = 0x3f800000;
      auVar275._16_4_ = 0x3f800000;
      auVar275._20_4_ = 0x3f800000;
      auVar275._24_4_ = 0x3f800000;
      auVar275._28_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar78,auVar79);
      auVar80._4_4_ = fVar263 * (float)local_860._4_4_;
      auVar80._0_4_ = fVar280 * (float)local_860._0_4_;
      auVar80._8_4_ = fVar287 * fStack_858;
      auVar80._12_4_ = fVar314 * fStack_854;
      auVar80._16_4_ = fVar315 * fStack_850;
      auVar80._20_4_ = fVar337 * fStack_84c;
      auVar80._24_4_ = fVar447 * fStack_848;
      auVar80._28_4_ = uVar9;
      auVar143 = vsubps_avx(auVar34,auVar80);
      auVar34 = vrcpps_avx(auVar143);
      fVar280 = auVar34._0_4_;
      fVar259 = auVar34._4_4_;
      auVar81._4_4_ = auVar143._4_4_ * fVar259;
      auVar81._0_4_ = auVar143._0_4_ * fVar280;
      fVar211 = auVar34._8_4_;
      auVar81._8_4_ = auVar143._8_4_ * fVar211;
      fVar263 = auVar34._12_4_;
      auVar81._12_4_ = auVar143._12_4_ * fVar263;
      fVar279 = auVar34._16_4_;
      auVar81._16_4_ = auVar143._16_4_ * fVar279;
      fVar281 = auVar34._20_4_;
      auVar81._20_4_ = auVar143._20_4_ * fVar281;
      fVar287 = auVar34._24_4_;
      auVar81._24_4_ = auVar143._24_4_ * fVar287;
      auVar81._28_4_ = fStack_844;
      auVar144 = vsubps_avx(auVar275,auVar81);
      auVar34 = vandps_avx(auVar143,auVar352);
      auVar36 = vcmpps_avx(auVar34,auVar406,1);
      auVar330 = ZEXT3264(auVar36);
      auVar82._4_4_ = (fVar259 + fVar259 * auVar144._4_4_) * -auVar379._4_4_;
      auVar82._0_4_ = (fVar280 + fVar280 * auVar144._0_4_) * -auVar379._0_4_;
      auVar82._8_4_ = (fVar211 + fVar211 * auVar144._8_4_) * -auVar379._8_4_;
      auVar82._12_4_ = (fVar263 + fVar263 * auVar144._12_4_) * -auVar379._12_4_;
      auVar82._16_4_ = (fVar279 + fVar279 * auVar144._16_4_) * -auVar379._16_4_;
      auVar82._20_4_ = (fVar281 + fVar281 * auVar144._20_4_) * -auVar379._20_4_;
      auVar82._24_4_ = (fVar287 + fVar287 * auVar144._24_4_) * -auVar379._24_4_;
      auVar82._28_4_ = auVar379._28_4_ ^ 0x80000000;
      auVar34 = vcmpps_avx(auVar143,ZEXT832(0) << 0x20,1);
      auVar34 = vorps_avx(auVar36,auVar34);
      auVar34 = vblendvps_avx(auVar82,auVar432,auVar34);
      _local_a60 = vmaxps_avx(auVar38,auVar34);
      auVar34 = vcmpps_avx(auVar143,ZEXT832(0) << 0x20,6);
      auVar34 = vorps_avx(auVar36,auVar34);
      auVar34 = vblendvps_avx(auVar82,auVar454,auVar34);
      auVar142 = vandps_avx(local_3c0,auVar142);
      local_440 = vminps_avx(auVar378,auVar34);
      auVar34 = vcmpps_avx(_local_a60,local_440,2);
      auVar36 = auVar142 & auVar34;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0x7f,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0xbf,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar36[0x1f] < '\0') {
        auVar36 = vminps_avx(local_7e0,auVar192);
        auVar378 = vminps_avx(local_800,local_840);
        auVar36 = vminps_avx(auVar36,auVar378);
        auVar35 = vsubps_avx(auVar36,auVar35);
        auVar142 = vandps_avx(auVar34,auVar142);
        auVar116._4_4_ = local_640[1];
        auVar116._0_4_ = local_640[0];
        auVar116._8_4_ = local_640[2];
        auVar116._12_4_ = local_640[3];
        auVar116._16_4_ = fStack_630;
        auVar116._20_4_ = fStack_62c;
        auVar116._24_4_ = fStack_628;
        auVar116._28_4_ = fStack_624;
        auVar34 = vminps_avx(auVar116,auVar275);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_640[0] = fVar127 + fVar171 * (auVar34._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar161 + fVar210 * (auVar34._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar163 + fVar212 * (auVar34._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar165 + fVar214 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar127 + fVar171 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar161 + fVar210 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar163 + fVar212 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar165 + auVar34._28_4_ + 7.0;
        auVar115._4_4_ = local_660[1];
        auVar115._0_4_ = local_660[0];
        auVar115._8_4_ = local_660[2];
        auVar115._12_4_ = local_660[3];
        auVar115._16_4_ = fStack_650;
        auVar115._20_4_ = fStack_64c;
        auVar115._24_4_ = fStack_648;
        auVar115._28_4_ = fStack_644;
        auVar34 = vminps_avx(auVar115,auVar275);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_660[0] = fVar127 + fVar171 * (auVar34._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar161 + fVar210 * (auVar34._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar163 + fVar212 * (auVar34._8_4_ + 2.0) * 0.125;
        local_660[3] = fVar165 + fVar214 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar127 + fVar171 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar161 + fVar210 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar163 + fVar212 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_644 = fVar165 + auVar34._28_4_ + 7.0;
        auVar83._4_4_ = auVar35._4_4_ * 0.99999976;
        auVar83._0_4_ = auVar35._0_4_ * 0.99999976;
        auVar83._8_4_ = auVar35._8_4_ * 0.99999976;
        auVar83._12_4_ = auVar35._12_4_ * 0.99999976;
        auVar83._16_4_ = auVar35._16_4_ * 0.99999976;
        auVar83._20_4_ = auVar35._20_4_ * 0.99999976;
        auVar83._24_4_ = auVar35._24_4_ * 0.99999976;
        auVar83._28_4_ = 0x3f7ffffc;
        auVar34 = vmaxps_avx(ZEXT832(0) << 0x20,auVar83);
        auVar84._4_4_ = auVar34._4_4_ * auVar34._4_4_;
        auVar84._0_4_ = auVar34._0_4_ * auVar34._0_4_;
        auVar84._8_4_ = auVar34._8_4_ * auVar34._8_4_;
        auVar84._12_4_ = auVar34._12_4_ * auVar34._12_4_;
        auVar84._16_4_ = auVar34._16_4_ * auVar34._16_4_;
        auVar84._20_4_ = auVar34._20_4_ * auVar34._20_4_;
        auVar84._24_4_ = auVar34._24_4_ * auVar34._24_4_;
        auVar84._28_4_ = auVar34._28_4_;
        local_980 = vsubps_avx(auVar44,auVar84);
        auVar85._4_4_ = local_980._4_4_ * fVar216 * 4.0;
        auVar85._0_4_ = local_980._0_4_ * fVar215 * 4.0;
        auVar85._8_4_ = local_980._8_4_ * fVar217 * 4.0;
        auVar85._12_4_ = local_980._12_4_ * fVar218 * 4.0;
        auVar85._16_4_ = local_980._16_4_ * fVar412 * 4.0;
        auVar85._20_4_ = local_980._20_4_ * fVar414 * 4.0;
        auVar85._24_4_ = local_980._24_4_ * fVar416 * 4.0;
        auVar85._28_4_ = auVar34._28_4_;
        auVar35 = vsubps_avx(auVar67,auVar85);
        _local_920 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar34 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,5);
        if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar34 >> 0x7f,0) == '\0') &&
              (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar34 >> 0xbf,0) == '\0') &&
            (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar34[0x1f]) {
          _local_780 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar249 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar274 = ZEXT828(0) << 0x20;
          auVar400 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar194._8_4_ = 0x7f800000;
          auVar194._0_8_ = 0x7f8000007f800000;
          auVar194._12_4_ = 0x7f800000;
          auVar194._16_4_ = 0x7f800000;
          auVar194._20_4_ = 0x7f800000;
          auVar194._24_4_ = 0x7f800000;
          auVar194._28_4_ = 0x7f800000;
          auVar299._8_4_ = 0xff800000;
          auVar299._0_8_ = 0xff800000ff800000;
          auVar299._12_4_ = 0xff800000;
          auVar299._16_4_ = 0xff800000;
          auVar299._20_4_ = 0xff800000;
          auVar299._24_4_ = 0xff800000;
          auVar299._28_4_ = 0xff800000;
          local_980 = auVar37;
          _local_8e0 = _local_920;
        }
        else {
          auVar37 = vsqrtps_avx(auVar35);
          auVar195._0_4_ = fVar215 + fVar215;
          auVar195._4_4_ = fVar216 + fVar216;
          auVar195._8_4_ = fVar217 + fVar217;
          auVar195._12_4_ = fVar218 + fVar218;
          auVar195._16_4_ = fVar412 + fVar412;
          auVar195._20_4_ = fVar414 + fVar414;
          auVar195._24_4_ = fVar416 + fVar416;
          auVar195._28_4_ = fVar318 + fVar318;
          auVar36 = vrcpps_avx(auVar195);
          fVar318 = auVar36._0_4_;
          fVar280 = auVar36._4_4_;
          auVar86._4_4_ = auVar195._4_4_ * fVar280;
          auVar86._0_4_ = auVar195._0_4_ * fVar318;
          fVar259 = auVar36._8_4_;
          auVar86._8_4_ = auVar195._8_4_ * fVar259;
          fVar211 = auVar36._12_4_;
          auVar86._12_4_ = auVar195._12_4_ * fVar211;
          fVar263 = auVar36._16_4_;
          auVar86._16_4_ = auVar195._16_4_ * fVar263;
          fVar279 = auVar36._20_4_;
          auVar86._20_4_ = auVar195._20_4_ * fVar279;
          fVar281 = auVar36._24_4_;
          auVar86._24_4_ = auVar195._24_4_ * fVar281;
          auVar86._28_4_ = auVar195._28_4_;
          auVar378 = vsubps_avx(auVar275,auVar86);
          fVar318 = fVar318 + fVar318 * auVar378._0_4_;
          fVar280 = fVar280 + fVar280 * auVar378._4_4_;
          fVar259 = fVar259 + fVar259 * auVar378._8_4_;
          fVar211 = fVar211 + fVar211 * auVar378._12_4_;
          fVar263 = fVar263 + fVar263 * auVar378._16_4_;
          fVar279 = fVar279 + fVar279 * auVar378._20_4_;
          fVar281 = fVar281 + fVar281 * auVar378._24_4_;
          fVar317 = auVar36._28_4_ + auVar378._28_4_;
          auVar196._0_8_ = local_420._0_8_ ^ 0x8000000080000000;
          auVar196._8_4_ = -local_420._8_4_;
          auVar196._12_4_ = -local_420._12_4_;
          auVar196._16_4_ = -local_420._16_4_;
          auVar196._20_4_ = -local_420._20_4_;
          auVar196._24_4_ = -local_420._24_4_;
          auVar196._28_4_ = -local_420._28_4_;
          auVar36 = vsubps_avx(auVar196,auVar37);
          fVar287 = auVar36._0_4_ * fVar318;
          fVar289 = auVar36._4_4_ * fVar280;
          auVar87._4_4_ = fVar289;
          auVar87._0_4_ = fVar287;
          fVar306 = auVar36._8_4_ * fVar259;
          auVar87._8_4_ = fVar306;
          fVar314 = auVar36._12_4_ * fVar211;
          auVar87._12_4_ = fVar314;
          fVar316 = auVar36._16_4_ * fVar263;
          auVar87._16_4_ = fVar316;
          fVar307 = auVar36._20_4_ * fVar279;
          auVar87._20_4_ = fVar307;
          fVar315 = auVar36._24_4_ * fVar281;
          auVar87._24_4_ = fVar315;
          auVar87._28_4_ = auVar36._28_4_;
          auVar36 = vsubps_avx(auVar37,local_420);
          fVar318 = auVar36._0_4_ * fVar318;
          fVar280 = auVar36._4_4_ * fVar280;
          auVar88._4_4_ = fVar280;
          auVar88._0_4_ = fVar318;
          fVar259 = auVar36._8_4_ * fVar259;
          auVar88._8_4_ = fVar259;
          fVar211 = auVar36._12_4_ * fVar211;
          auVar88._12_4_ = fVar211;
          fVar263 = auVar36._16_4_ * fVar263;
          auVar88._16_4_ = fVar263;
          fVar279 = auVar36._20_4_ * fVar279;
          auVar88._20_4_ = fVar279;
          fVar281 = auVar36._24_4_ * fVar281;
          auVar88._24_4_ = fVar281;
          auVar88._28_4_ = 0x7f800000;
          fVar319 = (fVar398 * fVar287 + fVar462) * fVar369;
          fVar337 = (fVar408 * fVar289 + fVar467) * fVar382;
          fVar339 = (fVar409 * fVar306 + fVar468) * fVar385;
          fVar341 = (fVar410 * fVar314 + fVar469) * fVar388;
          fVar447 = (fVar411 * fVar316 + fVar470) * fVar391;
          fVar284 = (fVar413 * fVar307 + fVar471) * fVar394;
          fVar286 = (fVar415 * fVar315 + fVar472) * fVar397;
          auVar255._0_4_ = fVar128 + fVar238 * fVar319;
          auVar255._4_4_ = fVar162 + fVar262 * fVar337;
          auVar255._8_4_ = fVar164 + fVar285 * fVar339;
          auVar255._12_4_ = fVar166 + fVar312 * fVar341;
          auVar255._16_4_ = fVar167 + fVar313 * fVar447;
          auVar255._20_4_ = fVar168 + fVar335 * fVar284;
          auVar255._24_4_ = fVar169 + fVar42 * fVar286;
          auVar255._28_4_ = fVar170 + auVar36._28_4_ + fVar473;
          auVar89._4_4_ = (float)local_860._4_4_ * fVar289;
          auVar89._0_4_ = (float)local_860._0_4_ * fVar287;
          auVar89._8_4_ = fStack_858 * fVar306;
          auVar89._12_4_ = fStack_854 * fVar314;
          auVar89._16_4_ = fStack_850 * fVar316;
          auVar89._20_4_ = fStack_84c * fVar307;
          auVar89._24_4_ = fStack_848 * fVar315;
          auVar89._28_4_ = fVar317;
          local_aa0 = vsubps_avx(auVar89,auVar255);
          auVar277._0_4_ = auVar451._0_4_ + fVar258 * fVar319;
          auVar277._4_4_ = auVar451._4_4_ + fVar260 * fVar337;
          auVar277._8_4_ = auVar451._8_4_ + fVar282 * fVar339;
          auVar277._12_4_ = auVar451._12_4_ + fVar308 * fVar341;
          auVar277._16_4_ = auVar451._16_4_ + fVar309 * fVar447;
          auVar277._20_4_ = auVar451._20_4_ + fVar331 * fVar284;
          auVar277._24_4_ = auVar451._24_4_ + fVar434 * fVar286;
          auVar277._28_4_ = auVar451._28_4_ + fVar317;
          auVar90._4_4_ = (float)local_880._4_4_ * fVar289;
          auVar90._0_4_ = (float)local_880._0_4_ * fVar287;
          auVar90._8_4_ = fStack_878 * fVar306;
          auVar90._12_4_ = fStack_874 * fVar314;
          auVar90._16_4_ = fStack_870 * fVar316;
          auVar90._20_4_ = fStack_86c * fVar307;
          auVar90._24_4_ = fStack_868 * fVar315;
          auVar90._28_4_ = fVar165;
          auVar37 = vsubps_avx(auVar90,auVar277);
          auVar300._0_4_ = auVar475._0_4_ + fVar129 * fVar319;
          auVar300._4_4_ = auVar475._4_4_ + fVar261 * fVar337;
          auVar300._8_4_ = auVar475._8_4_ + fVar283 * fVar339;
          auVar300._12_4_ = auVar475._12_4_ + fVar310 * fVar341;
          auVar300._16_4_ = auVar475._16_4_ + fVar311 * fVar447;
          auVar300._20_4_ = auVar475._20_4_ + fVar333 * fVar284;
          auVar300._24_4_ = auVar475._24_4_ + fVar41 * fVar286;
          auVar300._28_4_ = auVar475._28_4_ + 0.0;
          auVar91._4_4_ = (float)local_900._4_4_ * fVar289;
          auVar91._0_4_ = (float)local_900._0_4_ * fVar287;
          auVar91._8_4_ = fStack_8f8 * fVar306;
          auVar91._12_4_ = fStack_8f4 * fVar314;
          auVar91._16_4_ = fStack_8f0 * fVar316;
          auVar91._20_4_ = fStack_8ec * fVar307;
          auVar91._24_4_ = fStack_8e8 * fVar315;
          auVar91._28_4_ = fVar165;
          auVar378 = vsubps_avx(auVar91,auVar300);
          fVar369 = (fVar398 * fVar318 + fVar462) * fVar369;
          fVar382 = (fVar408 * fVar280 + fVar467) * fVar382;
          fVar385 = (fVar409 * fVar259 + fVar468) * fVar385;
          fVar388 = (fVar410 * fVar211 + fVar469) * fVar388;
          fVar391 = (fVar411 * fVar263 + fVar470) * fVar391;
          fVar394 = (fVar413 * fVar279 + fVar471) * fVar394;
          fVar397 = (fVar415 * fVar281 + fVar472) * fVar397;
          auVar328._0_4_ = fVar128 + fVar238 * fVar369;
          auVar328._4_4_ = fVar162 + fVar262 * fVar382;
          auVar328._8_4_ = fVar164 + fVar285 * fVar385;
          auVar328._12_4_ = fVar166 + fVar312 * fVar388;
          auVar328._16_4_ = fVar167 + fVar313 * fVar391;
          auVar328._20_4_ = fVar168 + fVar335 * fVar394;
          auVar328._24_4_ = fVar169 + fVar42 * fVar397;
          auVar328._28_4_ = fVar170 + fVar165;
          auVar92._4_4_ = fVar280 * (float)local_860._4_4_;
          auVar92._0_4_ = fVar318 * (float)local_860._0_4_;
          auVar92._8_4_ = fVar259 * fStack_858;
          auVar92._12_4_ = fVar211 * fStack_854;
          auVar92._16_4_ = fVar263 * fStack_850;
          auVar92._20_4_ = fVar279 * fStack_84c;
          auVar92._24_4_ = fVar281 * fStack_848;
          auVar92._28_4_ = fStack_844;
          _local_920 = vsubps_avx(auVar92,auVar328);
          auVar329._0_4_ = auVar451._0_4_ + fVar258 * fVar369;
          auVar329._4_4_ = auVar451._4_4_ + fVar260 * fVar382;
          auVar329._8_4_ = auVar451._8_4_ + fVar282 * fVar385;
          auVar329._12_4_ = auVar451._12_4_ + fVar308 * fVar388;
          auVar329._16_4_ = auVar451._16_4_ + fVar309 * fVar391;
          auVar329._20_4_ = auVar451._20_4_ + fVar331 * fVar394;
          auVar329._24_4_ = auVar451._24_4_ + fVar434 * fVar397;
          auVar329._28_4_ = auVar451._28_4_ + local_920._28_4_;
          auVar93._4_4_ = (float)local_880._4_4_ * fVar280;
          auVar93._0_4_ = (float)local_880._0_4_ * fVar318;
          auVar93._8_4_ = fStack_878 * fVar259;
          auVar93._12_4_ = fStack_874 * fVar211;
          auVar93._16_4_ = fStack_870 * fVar263;
          auVar93._20_4_ = fStack_86c * fVar279;
          auVar93._24_4_ = fStack_868 * fVar281;
          auVar93._28_4_ = fStack_844;
          _local_8e0 = vsubps_avx(auVar93,auVar329);
          auVar301._0_4_ = auVar475._0_4_ + fVar129 * fVar369;
          auVar301._4_4_ = auVar475._4_4_ + fVar261 * fVar382;
          auVar301._8_4_ = auVar475._8_4_ + fVar283 * fVar385;
          auVar301._12_4_ = auVar475._12_4_ + fVar310 * fVar388;
          auVar301._16_4_ = auVar475._16_4_ + fVar311 * fVar391;
          auVar301._20_4_ = auVar475._20_4_ + fVar333 * fVar394;
          auVar301._24_4_ = auVar475._24_4_ + fVar41 * fVar397;
          auVar301._28_4_ = auVar475._28_4_ + auVar378._28_4_ + fVar473;
          auVar94._4_4_ = (float)local_900._4_4_ * fVar280;
          auVar94._0_4_ = (float)local_900._0_4_ * fVar318;
          auVar94._8_4_ = fStack_8f8 * fVar259;
          auVar94._12_4_ = fStack_8f4 * fVar211;
          auVar94._16_4_ = fStack_8f0 * fVar263;
          auVar94._20_4_ = fStack_8ec * fVar279;
          auVar94._24_4_ = fStack_8e8 * fVar281;
          auVar94._28_4_ = local_8e0._28_4_;
          _local_780 = vsubps_avx(auVar94,auVar301);
          auVar36 = vcmpps_avx(auVar35,_DAT_02020f00,5);
          auVar302._8_4_ = 0x7f800000;
          auVar302._0_8_ = 0x7f8000007f800000;
          auVar302._12_4_ = 0x7f800000;
          auVar302._16_4_ = 0x7f800000;
          auVar302._20_4_ = 0x7f800000;
          auVar302._24_4_ = 0x7f800000;
          auVar302._28_4_ = 0x7f800000;
          auVar194 = vblendvps_avx(auVar302,auVar87,auVar36);
          auVar353._8_4_ = 0x7fffffff;
          auVar353._0_8_ = 0x7fffffff7fffffff;
          auVar353._12_4_ = 0x7fffffff;
          auVar353._16_4_ = 0x7fffffff;
          auVar353._20_4_ = 0x7fffffff;
          auVar353._24_4_ = 0x7fffffff;
          auVar353._28_4_ = 0x7fffffff;
          auVar35 = vandps_avx(auVar353,auVar66);
          auVar35 = vmaxps_avx(local_4c0,auVar35);
          auVar95._4_4_ = auVar35._4_4_ * 1.9073486e-06;
          auVar95._0_4_ = auVar35._0_4_ * 1.9073486e-06;
          auVar95._8_4_ = auVar35._8_4_ * 1.9073486e-06;
          auVar95._12_4_ = auVar35._12_4_ * 1.9073486e-06;
          auVar95._16_4_ = auVar35._16_4_ * 1.9073486e-06;
          auVar95._20_4_ = auVar35._20_4_ * 1.9073486e-06;
          auVar95._24_4_ = auVar35._24_4_ * 1.9073486e-06;
          auVar95._28_4_ = auVar35._28_4_;
          auVar35 = vandps_avx(auVar353,auVar39);
          auVar35 = vcmpps_avx(auVar35,auVar95,1);
          auVar303._8_4_ = 0xff800000;
          auVar303._0_8_ = 0xff800000ff800000;
          auVar303._12_4_ = 0xff800000;
          auVar303._16_4_ = 0xff800000;
          auVar303._20_4_ = 0xff800000;
          auVar303._24_4_ = 0xff800000;
          auVar303._28_4_ = 0xff800000;
          auVar299 = vblendvps_avx(auVar303,auVar88,auVar36);
          auVar38 = auVar36 & auVar35;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            auVar34 = vandps_avx(auVar35,auVar36);
            auVar180 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
            auVar35 = vcmpps_avx(local_980,ZEXT832(0) << 0x20,2);
            auVar466._8_4_ = 0xff800000;
            auVar466._0_8_ = 0xff800000ff800000;
            auVar466._12_4_ = 0xff800000;
            auVar466._16_4_ = 0xff800000;
            auVar466._20_4_ = 0xff800000;
            auVar466._24_4_ = 0xff800000;
            auVar466._28_4_ = 0xff800000;
            auVar476._8_4_ = 0x7f800000;
            auVar476._0_8_ = 0x7f8000007f800000;
            auVar476._12_4_ = 0x7f800000;
            auVar476._16_4_ = 0x7f800000;
            auVar476._20_4_ = 0x7f800000;
            auVar476._24_4_ = 0x7f800000;
            auVar476._28_4_ = 0x7f800000;
            auVar151 = vblendvps_avx(auVar476,auVar466,auVar35);
            auVar11 = vpmovsxwd_avx(auVar180);
            auVar180 = vpunpckhwd_avx(auVar180,auVar180);
            auVar354._16_16_ = auVar180;
            auVar354._0_16_ = auVar11;
            auVar194 = vblendvps_avx(auVar194,auVar151,auVar354);
            auVar151 = vblendvps_avx(auVar466,auVar476,auVar35);
            auVar299 = vblendvps_avx(auVar299,auVar151,auVar354);
            auVar38 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar237._0_4_ = auVar34._0_4_ ^ auVar38._0_4_;
            auVar237._4_4_ = auVar34._4_4_ ^ auVar38._4_4_;
            auVar237._8_4_ = auVar34._8_4_ ^ auVar38._8_4_;
            auVar237._12_4_ = auVar34._12_4_ ^ auVar38._12_4_;
            auVar237._16_4_ = auVar34._16_4_ ^ auVar38._16_4_;
            auVar237._20_4_ = auVar34._20_4_ ^ auVar38._20_4_;
            auVar237._24_4_ = auVar34._24_4_ ^ auVar38._24_4_;
            auVar237._28_4_ = auVar34._28_4_ ^ auVar38._28_4_;
            auVar34 = vorps_avx(auVar35,auVar237);
            auVar34 = vandps_avx(auVar36,auVar34);
          }
          auVar433 = ZEXT3264(auVar151);
          auVar249 = local_aa0._0_28_;
          auVar274 = auVar37._0_28_;
          auVar400 = auVar378._0_28_;
          local_9a0 = auVar142;
        }
        _local_4a0 = _local_a60;
        local_480 = vminps_avx(local_440,auVar194);
        _local_6c0 = vmaxps_avx(_local_a60,auVar299);
        _local_460 = _local_6c0;
        auVar151 = vcmpps_avx(_local_a60,local_480,2);
        local_680 = vandps_avx(auVar142,auVar151);
        auVar151 = vcmpps_avx(_local_6c0,local_440,2);
        _local_8a0 = vandps_avx(auVar142,auVar151);
        auVar330 = ZEXT3264(_local_8a0);
        auVar142 = vorps_avx(_local_8a0,local_680);
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0x7f,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar142 >> 0xbf,0) != '\0') ||
            (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar142[0x1f] < '\0') {
          local_9c0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_700._0_4_ = auVar34._0_4_ ^ local_9c0._0_4_;
          local_700._4_4_ = auVar34._4_4_ ^ local_9c0._4_4_;
          local_700._8_4_ = auVar34._8_4_ ^ local_9c0._8_4_;
          local_700._12_4_ = auVar34._12_4_ ^ local_9c0._12_4_;
          local_700._16_4_ = auVar34._16_4_ ^ local_9c0._16_4_;
          local_700._20_4_ = auVar34._20_4_ ^ local_9c0._20_4_;
          local_700._24_4_ = auVar34._24_4_ ^ local_9c0._24_4_;
          local_700._28_4_ = (uint)auVar34._28_4_ ^ (uint)local_9c0._28_4_;
          auVar152._0_4_ =
               auVar249._0_4_ * (float)local_860._0_4_ +
               auVar274._0_4_ * (float)local_880._0_4_ + auVar400._0_4_ * (float)local_900._0_4_;
          auVar152._4_4_ =
               auVar249._4_4_ * (float)local_860._4_4_ +
               auVar274._4_4_ * (float)local_880._4_4_ + auVar400._4_4_ * (float)local_900._4_4_;
          auVar152._8_4_ =
               auVar249._8_4_ * fStack_858 +
               auVar274._8_4_ * fStack_878 + auVar400._8_4_ * fStack_8f8;
          auVar152._12_4_ =
               auVar249._12_4_ * fStack_854 +
               auVar274._12_4_ * fStack_874 + auVar400._12_4_ * fStack_8f4;
          auVar152._16_4_ =
               auVar249._16_4_ * fStack_850 +
               auVar274._16_4_ * fStack_870 + auVar400._16_4_ * fStack_8f0;
          auVar152._20_4_ =
               auVar249._20_4_ * fStack_84c +
               auVar274._20_4_ * fStack_86c + auVar400._20_4_ * fStack_8ec;
          auVar152._24_4_ =
               auVar249._24_4_ * fStack_848 +
               auVar274._24_4_ * fStack_868 + auVar400._24_4_ * fStack_8e8;
          auVar152._28_4_ = local_9c0._28_4_ + local_6c0._28_4_ + auVar34._28_4_;
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar197._16_4_ = 0x7fffffff;
          auVar197._20_4_ = 0x7fffffff;
          auVar197._24_4_ = 0x7fffffff;
          auVar197._28_4_ = 0x7fffffff;
          auVar142 = vandps_avx(auVar152,auVar197);
          auVar198._8_4_ = 0x3e99999a;
          auVar198._0_8_ = 0x3e99999a3e99999a;
          auVar198._12_4_ = 0x3e99999a;
          auVar198._16_4_ = 0x3e99999a;
          auVar198._20_4_ = 0x3e99999a;
          auVar198._24_4_ = 0x3e99999a;
          auVar198._28_4_ = 0x3e99999a;
          auVar142 = vcmpps_avx(auVar142,auVar198,1);
          auVar142 = vorps_avx(auVar142,local_700);
          auVar199._8_4_ = 3;
          auVar199._0_8_ = 0x300000003;
          auVar199._12_4_ = 3;
          auVar199._16_4_ = 3;
          auVar199._20_4_ = 3;
          auVar199._24_4_ = 3;
          auVar199._28_4_ = 3;
          auVar232._8_4_ = 2;
          auVar232._0_8_ = 0x200000002;
          auVar232._12_4_ = 2;
          auVar232._16_4_ = 2;
          auVar232._20_4_ = 2;
          auVar232._24_4_ = 2;
          auVar232._28_4_ = 2;
          auVar142 = vblendvps_avx(auVar232,auVar199,auVar142);
          local_6e0 = ZEXT432((uint)uVar124);
          local_7a0 = vpshufd_avx(ZEXT416((uint)uVar124),0);
          auVar180 = vpcmpgtd_avx(auVar142._16_16_,local_7a0);
          auStack_790 = auVar39._16_16_;
          auVar11 = vpcmpgtd_avx(auVar142._0_16_,local_7a0);
          auVar200._16_16_ = auVar180;
          auVar200._0_16_ = auVar11;
          local_6a0 = vblendps_avx(ZEXT1632(auVar11),auVar200,0xf0);
          auVar142 = vandnps_avx(local_6a0,local_680);
          auVar151 = local_680 & ~local_6a0;
          auVar355 = ZEXT464(0) << 0x20;
          auVar257 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_758 = auVar192._8_24_;
          local_760 = uVar124;
          local_720 = auVar142;
          if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar151 >> 0x7f,0) != '\0') ||
                (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar151 >> 0xbf,0) != '\0') ||
              (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar151[0x1f] < '\0') {
            local_8c0._4_4_ = (float)local_a60._4_4_ + (float)local_820._4_4_;
            local_8c0._0_4_ = (float)local_a60._0_4_ + (float)local_820._0_4_;
            fStack_8b8 = fStack_a58 + fStack_818;
            fStack_8b4 = fStack_a54 + fStack_814;
            fStack_8b0 = fStack_a50 + fStack_810;
            fStack_8ac = fStack_a4c + fStack_80c;
            fStack_8a8 = fStack_a48 + fStack_808;
            fStack_8a4 = fStack_a44 + fStack_804;
            local_740 = _local_8a0;
            do {
              auVar266 = auVar257._0_16_;
              auVar201._8_4_ = 0x7f800000;
              auVar201._0_8_ = 0x7f8000007f800000;
              auVar201._12_4_ = 0x7f800000;
              auVar201._16_4_ = 0x7f800000;
              auVar201._20_4_ = 0x7f800000;
              auVar201._24_4_ = 0x7f800000;
              auVar201._28_4_ = 0x7f800000;
              auVar151 = vblendvps_avx(auVar201,_local_a60,auVar142);
              auVar34 = vshufps_avx(auVar151,auVar151,0xb1);
              auVar34 = vminps_avx(auVar151,auVar34);
              auVar35 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar35 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar34 = vcmpps_avx(auVar151,auVar34,0);
              auVar35 = auVar142 & auVar34;
              auVar151 = auVar142;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0x7f,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0xbf,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar35[0x1f] < '\0') {
                auVar151 = vandps_avx(auVar34,auVar142);
              }
              uVar122 = vmovmskps_avx(auVar151);
              uVar119 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
                }
              }
              uVar124 = (ulong)uVar119;
              local_720 = auVar142;
              *(undefined4 *)(local_720 + uVar124 * 4) = 0;
              fVar318 = local_640[uVar124];
              uVar119 = *(uint *)(local_4a0 + uVar124 * 4);
              fVar258 = auVar175._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar258 = sqrtf((float)local_9e0._0_4_);
                auVar266._8_4_ = 0x7fffffff;
                auVar266._0_8_ = 0x7fffffff7fffffff;
                auVar266._12_4_ = 0x7fffffff;
                auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar407 = ZEXT464(uVar119);
              auVar11 = vminps_avx(_local_ae0,_local_b00);
              auVar180 = vmaxps_avx(_local_ae0,_local_b00);
              auVar43 = vminps_avx(_local_af0,_local_b10);
              auVar134 = vminps_avx(auVar11,auVar43);
              auVar11 = vmaxps_avx(_local_af0,_local_b10);
              auVar43 = vmaxps_avx(auVar180,auVar11);
              auVar180 = vandps_avx(auVar134,auVar266);
              auVar11 = vandps_avx(auVar43,auVar266);
              auVar180 = vmaxps_avx(auVar180,auVar11);
              auVar11 = vmovshdup_avx(auVar180);
              auVar11 = vmaxss_avx(auVar11,auVar180);
              auVar180 = vshufpd_avx(auVar180,auVar180,1);
              auVar180 = vmaxss_avx(auVar180,auVar11);
              local_aa0._0_4_ = auVar180._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar258 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar43,auVar43,0xff);
              lVar121 = 4;
              do {
                fVar259 = 1.0 - fVar318;
                auVar180 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
                fVar258 = auVar180._0_4_;
                fVar129 = auVar180._4_4_;
                fVar238 = auVar180._8_4_;
                fVar280 = auVar180._12_4_;
                auVar180 = vshufps_avx(ZEXT416((uint)fVar259),ZEXT416((uint)fVar259),0);
                fVar211 = auVar180._0_4_;
                fVar260 = auVar180._4_4_;
                fVar261 = auVar180._8_4_;
                fVar262 = auVar180._12_4_;
                fVar263 = (float)local_af0._0_4_ * fVar258 + (float)local_b00._0_4_ * fVar211;
                fVar279 = (float)local_af0._4_4_ * fVar129 + (float)local_b00._4_4_ * fVar260;
                fVar281 = fStack_ae8 * fVar238 + fStack_af8 * fVar261;
                fVar282 = fStack_ae4 * fVar280 + fStack_af4 * fVar262;
                auVar291._0_4_ =
                     fVar211 * ((float)local_b00._0_4_ * fVar258 + fVar211 * (float)local_ae0._0_4_)
                     + fVar258 * fVar263;
                auVar291._4_4_ =
                     fVar260 * ((float)local_b00._4_4_ * fVar129 + fVar260 * (float)local_ae0._4_4_)
                     + fVar129 * fVar279;
                auVar291._8_4_ =
                     fVar261 * (fStack_af8 * fVar238 + fVar261 * fStack_ad8) + fVar238 * fVar281;
                auVar291._12_4_ =
                     fVar262 * (fStack_af4 * fVar280 + fVar262 * fStack_ad4) + fVar280 * fVar282;
                auVar242._0_4_ =
                     fVar211 * fVar263 +
                     fVar258 * (fVar258 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar211)
                ;
                auVar242._4_4_ =
                     fVar260 * fVar279 +
                     fVar129 * (fVar129 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar260)
                ;
                auVar242._8_4_ =
                     fVar261 * fVar281 + fVar238 * (fVar238 * fStack_b08 + fStack_ae8 * fVar261);
                auVar242._12_4_ =
                     fVar262 * fVar282 + fVar280 * (fVar280 * fStack_b04 + fStack_ae4 * fVar262);
                auVar180 = vshufps_avx(auVar407._0_16_,auVar407._0_16_,0);
                auVar176._0_4_ = auVar180._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar176._4_4_ = auVar180._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar176._8_4_ = auVar180._8_4_ * fStack_9c8 + 0.0;
                auVar176._12_4_ = auVar180._12_4_ * fStack_9c4 + 0.0;
                auVar133._0_4_ = fVar211 * auVar291._0_4_ + fVar258 * auVar242._0_4_;
                auVar133._4_4_ = fVar260 * auVar291._4_4_ + fVar129 * auVar242._4_4_;
                auVar133._8_4_ = fVar261 * auVar291._8_4_ + fVar238 * auVar242._8_4_;
                auVar133._12_4_ = fVar262 * auVar291._12_4_ + fVar280 * auVar242._12_4_;
                local_9a0._0_16_ = auVar133;
                auVar11 = vsubps_avx(auVar176,auVar133);
                auVar180 = vdpps_avx(auVar11,auVar11,0x7f);
                fVar258 = auVar180._0_4_;
                if (fVar258 < 0.0) {
                  fVar129 = sqrtf(fVar258);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar43 = vsqrtss_avx(auVar180,auVar180);
                  fVar129 = auVar43._0_4_;
                }
                auVar43 = vsubps_avx(auVar242,auVar291);
                auVar322._0_4_ = auVar43._0_4_ * 3.0;
                auVar322._4_4_ = auVar43._4_4_ * 3.0;
                auVar322._8_4_ = auVar43._8_4_ * 3.0;
                auVar322._12_4_ = auVar43._12_4_ * 3.0;
                auVar43 = vshufps_avx(ZEXT416((uint)(fVar318 * 6.0)),ZEXT416((uint)(fVar318 * 6.0)),
                                      0);
                auVar134 = ZEXT416((uint)((fVar259 - (fVar318 + fVar318)) * 6.0));
                auVar221 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = ZEXT416((uint)((fVar318 - (fVar259 + fVar259)) * 6.0));
                auVar243 = vshufps_avx(auVar134,auVar134,0);
                auVar12 = vshufps_avx(ZEXT416((uint)(fVar259 * 6.0)),ZEXT416((uint)(fVar259 * 6.0)),
                                      0);
                auVar134 = vdpps_avx(auVar322,auVar322,0x7f);
                auVar177._0_4_ =
                     auVar12._0_4_ * (float)local_ae0._0_4_ +
                     auVar243._0_4_ * (float)local_b00._0_4_ +
                     auVar43._0_4_ * (float)local_b10._0_4_ +
                     auVar221._0_4_ * (float)local_af0._0_4_;
                auVar177._4_4_ =
                     auVar12._4_4_ * (float)local_ae0._4_4_ +
                     auVar243._4_4_ * (float)local_b00._4_4_ +
                     auVar43._4_4_ * (float)local_b10._4_4_ +
                     auVar221._4_4_ * (float)local_af0._4_4_;
                auVar177._8_4_ =
                     auVar12._8_4_ * fStack_ad8 +
                     auVar243._8_4_ * fStack_af8 +
                     auVar43._8_4_ * fStack_b08 + auVar221._8_4_ * fStack_ae8;
                auVar177._12_4_ =
                     auVar12._12_4_ * fStack_ad4 +
                     auVar243._12_4_ * fStack_af4 +
                     auVar43._12_4_ * fStack_b04 + auVar221._12_4_ * fStack_ae4;
                auVar43 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar221 = vrsqrtss_avx(auVar43,auVar43);
                fVar280 = auVar221._0_4_;
                fVar238 = auVar134._0_4_;
                auVar221 = vdpps_avx(auVar322,auVar177,0x7f);
                auVar243 = vshufps_avx(auVar134,auVar134,0);
                auVar178._0_4_ = auVar177._0_4_ * auVar243._0_4_;
                auVar178._4_4_ = auVar177._4_4_ * auVar243._4_4_;
                auVar178._8_4_ = auVar177._8_4_ * auVar243._8_4_;
                auVar178._12_4_ = auVar177._12_4_ * auVar243._12_4_;
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar267._0_4_ = auVar322._0_4_ * auVar221._0_4_;
                auVar267._4_4_ = auVar322._4_4_ * auVar221._4_4_;
                auVar267._8_4_ = auVar322._8_4_ * auVar221._8_4_;
                auVar267._12_4_ = auVar322._12_4_ * auVar221._12_4_;
                auVar12 = vsubps_avx(auVar178,auVar267);
                auVar221 = vrcpss_avx(auVar43,auVar43);
                auVar43 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar407._0_4_ * (float)local_980._0_4_)));
                auVar221 = ZEXT416((uint)(auVar221._0_4_ * (2.0 - fVar238 * auVar221._0_4_)));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                uVar124 = CONCAT44(auVar322._4_4_,auVar322._0_4_);
                auVar292._0_8_ = uVar124 ^ 0x8000000080000000;
                auVar292._8_4_ = -auVar322._8_4_;
                auVar292._12_4_ = -auVar322._12_4_;
                auVar243 = ZEXT416((uint)(fVar280 * 1.5 +
                                         fVar238 * -0.5 * fVar280 * fVar280 * fVar280));
                auVar243 = vshufps_avx(auVar243,auVar243,0);
                auVar244._0_4_ = auVar243._0_4_ * auVar12._0_4_ * auVar221._0_4_;
                auVar244._4_4_ = auVar243._4_4_ * auVar12._4_4_ * auVar221._4_4_;
                auVar244._8_4_ = auVar243._8_4_ * auVar12._8_4_ * auVar221._8_4_;
                auVar244._12_4_ = auVar243._12_4_ * auVar12._12_4_ * auVar221._12_4_;
                auVar370._0_4_ = auVar322._0_4_ * auVar243._0_4_;
                auVar370._4_4_ = auVar322._4_4_ * auVar243._4_4_;
                auVar370._8_4_ = auVar322._8_4_ * auVar243._8_4_;
                auVar370._12_4_ = auVar322._12_4_ * auVar243._12_4_;
                if (fVar238 < 0.0) {
                  local_a00._0_16_ = auVar292;
                  local_a20._0_16_ = auVar370;
                  local_a40._0_16_ = auVar244;
                  fVar238 = sqrtf(fVar238);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar244 = local_a40._0_16_;
                  auVar292 = local_a00._0_16_;
                  auVar370 = local_a20._0_16_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar238 = auVar134._0_4_;
                }
                auVar134 = vdpps_avx(auVar11,auVar370,0x7f);
                fVar129 = ((float)local_aa0._0_4_ / fVar238) * (fVar129 + 1.0) +
                          auVar43._0_4_ + fVar129 * (float)local_aa0._0_4_;
                auVar221 = vdpps_avx(auVar292,auVar370,0x7f);
                auVar243 = vdpps_avx(auVar11,auVar244,0x7f);
                auVar12 = vdpps_avx(_local_9d0,auVar370,0x7f);
                auVar13 = vdpps_avx(auVar11,auVar292,0x7f);
                fVar238 = auVar221._0_4_ + auVar243._0_4_;
                fVar280 = auVar134._0_4_;
                auVar135._0_4_ = fVar280 * fVar280;
                auVar135._4_4_ = auVar134._4_4_ * auVar134._4_4_;
                auVar135._8_4_ = auVar134._8_4_ * auVar134._8_4_;
                auVar135._12_4_ = auVar134._12_4_ * auVar134._12_4_;
                auVar243 = vsubps_avx(auVar180,auVar135);
                auVar221 = vdpps_avx(auVar11,_local_9d0,0x7f);
                fVar259 = auVar13._0_4_ - fVar280 * fVar238;
                fVar211 = auVar221._0_4_ - fVar280 * auVar12._0_4_;
                auVar221 = vrsqrtss_avx(auVar243,auVar243);
                fVar260 = auVar243._0_4_;
                fVar280 = auVar221._0_4_;
                fVar280 = fVar280 * 1.5 + fVar260 * -0.5 * fVar280 * fVar280 * fVar280;
                if (fVar260 < 0.0) {
                  local_a00._0_4_ = fVar129;
                  local_a20._0_16_ = ZEXT416((uint)fVar238);
                  local_a40._0_16_ = auVar12;
                  local_7c0._0_4_ = fVar259;
                  local_7e0._0_4_ = fVar211;
                  local_800._0_4_ = fVar280;
                  fVar260 = sqrtf(fVar260);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar129 = (float)local_a00._0_4_;
                  fVar280 = (float)local_800._0_4_;
                  fVar259 = (float)local_7c0._0_4_;
                  fVar211 = (float)local_7e0._0_4_;
                  auVar12 = local_a40._0_16_;
                  auVar221 = local_a20._0_16_;
                }
                else {
                  auVar221 = vsqrtss_avx(auVar243,auVar243);
                  fVar260 = auVar221._0_4_;
                  auVar221 = ZEXT416((uint)fVar238);
                }
                auVar433 = ZEXT1664(auVar322);
                auVar179 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar14 = vshufps_avx(auVar322,auVar322,0xff);
                fVar238 = fVar259 * fVar280 - auVar14._0_4_;
                auVar268._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
                auVar268._8_4_ = auVar12._8_4_ ^ 0x80000000;
                auVar268._12_4_ = auVar12._12_4_ ^ 0x80000000;
                auVar293._0_4_ = -fVar238;
                auVar293._4_4_ = 0x80000000;
                auVar293._8_4_ = 0x80000000;
                auVar293._12_4_ = 0x80000000;
                fVar259 = auVar221._0_4_ * fVar211 * fVar280;
                auVar330 = ZEXT464((uint)fVar259);
                auVar243 = vinsertps_avx(ZEXT416((uint)(fVar211 * fVar280)),auVar268,0x10);
                auVar13 = vmovsldup_avx(ZEXT416((uint)(fVar259 - auVar12._0_4_ * fVar238)));
                auVar243 = vdivps_avx(auVar243,auVar13);
                auVar179 = ZEXT416((uint)(fVar260 - auVar179._0_4_));
                auVar12 = vinsertps_avx(auVar134,auVar179,0x10);
                auVar245._0_4_ = auVar12._0_4_ * auVar243._0_4_;
                auVar245._4_4_ = auVar12._4_4_ * auVar243._4_4_;
                auVar245._8_4_ = auVar12._8_4_ * auVar243._8_4_;
                auVar245._12_4_ = auVar12._12_4_ * auVar243._12_4_;
                auVar221 = vinsertps_avx(auVar293,auVar221,0x1c);
                auVar221 = vdivps_avx(auVar221,auVar13);
                auVar222._0_4_ = auVar12._0_4_ * auVar221._0_4_;
                auVar222._4_4_ = auVar12._4_4_ * auVar221._4_4_;
                auVar222._8_4_ = auVar12._8_4_ * auVar221._8_4_;
                auVar222._12_4_ = auVar12._12_4_ * auVar221._12_4_;
                auVar221 = vhaddps_avx(auVar245,auVar245);
                auVar243 = vhaddps_avx(auVar222,auVar222);
                fVar318 = fVar318 - auVar221._0_4_;
                fVar238 = auVar407._0_4_ - auVar243._0_4_;
                auVar407 = ZEXT464((uint)fVar238);
                auVar269._8_4_ = 0x7fffffff;
                auVar269._0_8_ = 0x7fffffff7fffffff;
                auVar269._12_4_ = 0x7fffffff;
                auVar257 = ZEXT1664(auVar269);
                auVar134 = vandps_avx(auVar134,auVar269);
                if (fVar129 <= auVar134._0_4_) {
LAB_01252baa:
                  bVar96 = false;
                }
                else {
                  auVar134 = vandps_avx(auVar179,auVar269);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar43._0_4_ + fVar129 <=
                      auVar134._0_4_) goto LAB_01252baa;
                  fVar238 = fVar238 + (float)local_940._0_4_;
                  auVar407 = ZEXT464((uint)fVar238);
                  bVar96 = true;
                  if ((((fVar239 <= fVar238) &&
                       (fVar129 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar129)) &&
                      (0.0 <= fVar318)) && (fVar318 <= 1.0)) {
                    auVar180 = vrsqrtss_avx(auVar180,auVar180);
                    fVar280 = auVar180._0_4_;
                    pGVar28 = (context->scene->geometries).items[uVar117].ptr;
                    if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar180 = ZEXT416((uint)(fVar280 * 1.5 +
                                               fVar258 * -0.5 * fVar280 * fVar280 * fVar280));
                      auVar180 = vshufps_avx(auVar180,auVar180,0);
                      local_ba0 = auVar11._0_4_;
                      fStack_b9c = auVar11._4_4_;
                      fStack_b98 = auVar11._8_4_;
                      fStack_b94 = auVar11._12_4_;
                      auVar181._0_4_ = auVar180._0_4_ * local_ba0;
                      auVar181._4_4_ = auVar180._4_4_ * fStack_b9c;
                      auVar181._8_4_ = auVar180._8_4_ * fStack_b98;
                      auVar181._12_4_ = auVar180._12_4_ * fStack_b94;
                      auVar136._0_4_ = auVar322._0_4_ + auVar14._0_4_ * auVar181._0_4_;
                      auVar136._4_4_ = auVar322._4_4_ + auVar14._4_4_ * auVar181._4_4_;
                      auVar136._8_4_ = auVar322._8_4_ + auVar14._8_4_ * auVar181._8_4_;
                      auVar136._12_4_ = auVar322._12_4_ + auVar14._12_4_ * auVar181._12_4_;
                      auVar180 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar11 = vshufps_avx(auVar322,auVar322,0xc9);
                      auVar182._0_4_ = auVar11._0_4_ * auVar181._0_4_;
                      auVar182._4_4_ = auVar11._4_4_ * auVar181._4_4_;
                      auVar182._8_4_ = auVar11._8_4_ * auVar181._8_4_;
                      auVar182._12_4_ = auVar11._12_4_ * auVar181._12_4_;
                      auVar223._0_4_ = auVar322._0_4_ * auVar180._0_4_;
                      auVar223._4_4_ = auVar322._4_4_ * auVar180._4_4_;
                      auVar223._8_4_ = auVar322._8_4_ * auVar180._8_4_;
                      auVar223._12_4_ = auVar322._12_4_ * auVar180._12_4_;
                      auVar43 = vsubps_avx(auVar223,auVar182);
                      auVar180 = vshufps_avx(auVar43,auVar43,0xc9);
                      auVar11 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar224._0_4_ = auVar11._0_4_ * auVar180._0_4_;
                      auVar224._4_4_ = auVar11._4_4_ * auVar180._4_4_;
                      auVar224._8_4_ = auVar11._8_4_ * auVar180._8_4_;
                      auVar224._12_4_ = auVar11._12_4_ * auVar180._12_4_;
                      auVar180 = vshufps_avx(auVar43,auVar43,0xd2);
                      auVar137._0_4_ = auVar136._0_4_ * auVar180._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar180._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar180._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar180._12_4_;
                      auVar180 = vsubps_avx(auVar224,auVar137);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        uVar9 = vextractps_avx(auVar180,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                        uVar9 = vextractps_avx(auVar180,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar180._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar318;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar117;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar33 = context->user;
                        auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
                        auStack_610 = vshufps_avx(auVar180,auVar180,0x55);
                        auStack_5f0 = vshufps_avx(auVar180,auVar180,0xaa);
                        auStack_5d0 = vshufps_avx(auVar180,auVar180,0);
                        local_620 = (RTCHitN  [16])auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = ZEXT832(0) << 0x20;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_a70[1] = local_9c0;
                        *local_a70 = local_9c0;
                        local_540 = pRVar33->instID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        local_520 = pRVar33->instPrimID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar28->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_620;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar28->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar330 = ZEXT464((uint)fVar259);
                          auVar433 = ZEXT1664(auVar322);
                          (*pGVar28->intersectionFilterN)(&local_ad0);
                        }
                        auVar105._8_8_ = uStack_b38;
                        auVar105._0_8_ = local_b40;
                        auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,auVar105);
                        auVar109._8_8_ = uStack_b28;
                        auVar109._0_8_ = local_b30;
                        auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,auVar109);
                        auVar153._16_16_ = auVar11;
                        auVar153._0_16_ = auVar180;
                        auVar142 = local_9c0 & ~auVar153;
                        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar142 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar142 >> 0x7f,0) == '\0')
                              && (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar142 >> 0xbf,0) == '\0') &&
                            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar142[0x1f]) {
                          auVar154._0_4_ = auVar180._0_4_ ^ local_9c0._0_4_;
                          auVar154._4_4_ = auVar180._4_4_ ^ local_9c0._4_4_;
                          auVar154._8_4_ = auVar180._8_4_ ^ local_9c0._8_4_;
                          auVar154._12_4_ = auVar180._12_4_ ^ local_9c0._12_4_;
                          auVar154._16_4_ = auVar11._0_4_ ^ local_9c0._16_4_;
                          auVar154._20_4_ = auVar11._4_4_ ^ local_9c0._20_4_;
                          auVar154._24_4_ = auVar11._8_4_ ^ local_9c0._24_4_;
                          auVar154._28_4_ = auVar11._12_4_ ^ local_9c0._28_4_;
                          auVar355 = ZEXT864(0);
                          auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var32 = context->args->filter;
                          auVar355 = ZEXT1664(ZEXT816(0));
                          auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar330 = ZEXT1664(auVar330._0_16_);
                            auVar433 = ZEXT1664(auVar433._0_16_);
                            (*p_Var32)(&local_ad0);
                            auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar106._8_8_ = uStack_b38;
                          auVar106._0_8_ = local_b40;
                          auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,auVar106);
                          auVar110._8_8_ = uStack_b28;
                          auVar110._0_8_ = local_b30;
                          auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                          auVar202._16_16_ = auVar11;
                          auVar202._0_16_ = auVar180;
                          auVar154._0_4_ = auVar180._0_4_ ^ local_9c0._0_4_;
                          auVar154._4_4_ = auVar180._4_4_ ^ local_9c0._4_4_;
                          auVar154._8_4_ = auVar180._8_4_ ^ local_9c0._8_4_;
                          auVar154._12_4_ = auVar180._12_4_ ^ local_9c0._12_4_;
                          auVar154._16_4_ = auVar11._0_4_ ^ local_9c0._16_4_;
                          auVar154._20_4_ = auVar11._4_4_ ^ local_9c0._20_4_;
                          auVar154._24_4_ = auVar11._8_4_ ^ local_9c0._24_4_;
                          auVar154._28_4_ = auVar11._12_4_ ^ local_9c0._28_4_;
                          auVar142 = local_9c0 & ~auVar202;
                          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar142 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar142 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar142 >> 0x7f,0) != '\0') ||
                                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar142 >> 0xbf,0) != '\0') ||
                              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar142[0x1f] < '\0') {
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar154,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar142;
                          }
                        }
                        auVar407 = ZEXT464((uint)fVar238);
                        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar154 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar154 >> 0x7f,0) == '\0')
                              && (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar154 >> 0xbf,0) == '\0') &&
                            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar154[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar129;
                        }
                      }
                    }
                  }
                }
                bVar126 = lVar121 != 0;
                lVar121 = lVar121 + -1;
              } while ((!bVar96) && (bVar126));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar155._4_4_ = uVar9;
              auVar155._0_4_ = uVar9;
              auVar155._8_4_ = uVar9;
              auVar155._12_4_ = uVar9;
              auVar155._16_4_ = uVar9;
              auVar155._20_4_ = uVar9;
              auVar155._24_4_ = uVar9;
              auVar155._28_4_ = uVar9;
              auVar151 = vcmpps_avx(_local_8c0,auVar155,2);
              auVar142 = vandps_avx(auVar151,local_720);
              auVar151 = local_720 & auVar151;
              uVar124 = local_760;
              local_720 = auVar142;
            } while ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar151 >> 0x7f,0) != '\0') ||
                       (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar151 >> 0xbf,0) != '\0') ||
                     (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar151[0x1f] < '\0');
          }
          auVar156._0_4_ =
               (float)local_920._0_4_ * (float)local_860._0_4_ +
               (float)local_8e0._0_4_ * (float)local_880._0_4_ +
               (float)local_780._0_4_ * (float)local_900._0_4_;
          auVar156._4_4_ =
               (float)local_920._4_4_ * (float)local_860._4_4_ +
               (float)local_8e0._4_4_ * (float)local_880._4_4_ +
               (float)local_780._4_4_ * (float)local_900._4_4_;
          auVar156._8_4_ =
               fStack_918 * fStack_858 + fStack_8d8 * fStack_878 + fStack_778 * fStack_8f8;
          auVar156._12_4_ =
               fStack_914 * fStack_854 + fStack_8d4 * fStack_874 + fStack_774 * fStack_8f4;
          auVar156._16_4_ =
               fStack_910 * fStack_850 + fStack_8d0 * fStack_870 + fStack_770 * fStack_8f0;
          auVar156._20_4_ =
               fStack_90c * fStack_84c + fStack_8cc * fStack_86c + fStack_76c * fStack_8ec;
          auVar156._24_4_ =
               fStack_908 * fStack_848 + fStack_8c8 * fStack_868 + fStack_768 * fStack_8e8;
          auVar156._28_4_ = fStack_904 + fStack_8c4 + fStack_764;
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar203._16_4_ = 0x7fffffff;
          auVar203._20_4_ = 0x7fffffff;
          auVar203._24_4_ = 0x7fffffff;
          auVar203._28_4_ = 0x7fffffff;
          auVar142 = vandps_avx(auVar156,auVar203);
          auVar204._8_4_ = 0x3e99999a;
          auVar204._0_8_ = 0x3e99999a3e99999a;
          auVar204._12_4_ = 0x3e99999a;
          auVar204._16_4_ = 0x3e99999a;
          auVar204._20_4_ = 0x3e99999a;
          auVar204._24_4_ = 0x3e99999a;
          auVar204._28_4_ = 0x3e99999a;
          auVar142 = vcmpps_avx(auVar142,auVar204,1);
          auVar151 = vorps_avx(auVar142,local_700);
          auVar205._0_4_ = (float)local_6c0._0_4_ + (float)local_820._0_4_;
          auVar205._4_4_ = (float)local_6c0._4_4_ + (float)local_820._4_4_;
          auVar205._8_4_ = fStack_6b8 + fStack_818;
          auVar205._12_4_ = fStack_6b4 + fStack_814;
          auVar205._16_4_ = fStack_6b0 + fStack_810;
          auVar205._20_4_ = fStack_6ac + fStack_80c;
          auVar205._24_4_ = fStack_6a8 + fStack_808;
          auVar205._28_4_ = fStack_6a4 + fStack_804;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar233._4_4_ = uVar9;
          auVar233._0_4_ = uVar9;
          auVar233._8_4_ = uVar9;
          auVar233._12_4_ = uVar9;
          auVar233._16_4_ = uVar9;
          auVar233._20_4_ = uVar9;
          auVar233._24_4_ = uVar9;
          auVar233._28_4_ = uVar9;
          auVar142 = vcmpps_avx(auVar205,auVar233,2);
          _local_8c0 = vandps_avx(auVar142,_local_8a0);
          auVar206._8_4_ = 3;
          auVar206._0_8_ = 0x300000003;
          auVar206._12_4_ = 3;
          auVar206._16_4_ = 3;
          auVar206._20_4_ = 3;
          auVar206._24_4_ = 3;
          auVar206._28_4_ = 3;
          auVar234._8_4_ = 2;
          auVar234._0_8_ = 0x200000002;
          auVar234._12_4_ = 2;
          auVar234._16_4_ = 2;
          auVar234._20_4_ = 2;
          auVar234._24_4_ = 2;
          auVar234._28_4_ = 2;
          auVar142 = vblendvps_avx(auVar234,auVar206,auVar151);
          auVar180 = vpcmpgtd_avx(auVar142._16_16_,local_7a0);
          auVar11 = vpshufd_avx(local_6e0._0_16_,0);
          auVar11 = vpcmpgtd_avx(auVar142._0_16_,auVar11);
          auVar207._16_16_ = auVar180;
          auVar207._0_16_ = auVar11;
          _local_920 = vblendps_avx(ZEXT1632(auVar11),auVar207,0xf0);
          auVar142 = vandnps_avx(_local_920,_local_8c0);
          auVar151 = _local_8c0 & ~_local_920;
          if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar151 >> 0x7f,0) != '\0') ||
                (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar151 >> 0xbf,0) != '\0') ||
              (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar151[0x1f] < '\0') {
            _local_a60 = _local_460;
            local_8a0._4_4_ = (float)local_460._4_4_ + (float)local_820._4_4_;
            local_8a0._0_4_ = (float)local_460._0_4_ + (float)local_820._0_4_;
            fStack_898 = fStack_458 + fStack_818;
            fStack_894 = fStack_454 + fStack_814;
            fStack_890 = fStack_450 + fStack_810;
            fStack_88c = fStack_44c + fStack_80c;
            fStack_888 = fStack_448 + fStack_808;
            fStack_884 = fStack_444 + fStack_804;
            do {
              auVar270 = auVar257._0_16_;
              auVar208._8_4_ = 0x7f800000;
              auVar208._0_8_ = 0x7f8000007f800000;
              auVar208._12_4_ = 0x7f800000;
              auVar208._16_4_ = 0x7f800000;
              auVar208._20_4_ = 0x7f800000;
              auVar208._24_4_ = 0x7f800000;
              auVar208._28_4_ = 0x7f800000;
              auVar151 = vblendvps_avx(auVar208,_local_a60,auVar142);
              auVar34 = vshufps_avx(auVar151,auVar151,0xb1);
              auVar34 = vminps_avx(auVar151,auVar34);
              auVar35 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar35 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar34 = vcmpps_avx(auVar151,auVar34,0);
              auVar35 = auVar142 & auVar34;
              auVar151 = auVar142;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0x7f,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0xbf,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar35[0x1f] < '\0') {
                auVar151 = vandps_avx(auVar34,auVar142);
              }
              uVar122 = vmovmskps_avx(auVar151);
              uVar119 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
                }
              }
              uVar124 = (ulong)uVar119;
              local_740 = auVar142;
              *(undefined4 *)(local_740 + uVar124 * 4) = 0;
              fVar318 = local_660[uVar124];
              uVar119 = *(uint *)(local_440 + uVar124 * 4);
              fVar258 = auVar40._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar258 = sqrtf((float)local_9e0._0_4_);
                auVar270._8_4_ = 0x7fffffff;
                auVar270._0_8_ = 0x7fffffff7fffffff;
                auVar270._12_4_ = 0x7fffffff;
                auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar407 = ZEXT464(uVar119);
              auVar11 = vminps_avx(_local_ae0,_local_b00);
              auVar180 = vmaxps_avx(_local_ae0,_local_b00);
              auVar43 = vminps_avx(_local_af0,_local_b10);
              auVar134 = vminps_avx(auVar11,auVar43);
              auVar11 = vmaxps_avx(_local_af0,_local_b10);
              auVar43 = vmaxps_avx(auVar180,auVar11);
              auVar180 = vandps_avx(auVar134,auVar270);
              auVar11 = vandps_avx(auVar43,auVar270);
              auVar180 = vmaxps_avx(auVar180,auVar11);
              auVar11 = vmovshdup_avx(auVar180);
              auVar11 = vmaxss_avx(auVar11,auVar180);
              auVar180 = vshufpd_avx(auVar180,auVar180,1);
              auVar180 = vmaxss_avx(auVar180,auVar11);
              local_aa0._0_4_ = auVar180._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar258 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar43,auVar43,0xff);
              lVar121 = 4;
              do {
                fVar259 = 1.0 - fVar318;
                auVar180 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
                fVar258 = auVar180._0_4_;
                fVar129 = auVar180._4_4_;
                fVar238 = auVar180._8_4_;
                fVar280 = auVar180._12_4_;
                auVar180 = vshufps_avx(ZEXT416((uint)fVar259),ZEXT416((uint)fVar259),0);
                fVar211 = auVar180._0_4_;
                fVar260 = auVar180._4_4_;
                fVar261 = auVar180._8_4_;
                fVar262 = auVar180._12_4_;
                fVar263 = (float)local_af0._0_4_ * fVar258 + (float)local_b00._0_4_ * fVar211;
                fVar279 = (float)local_af0._4_4_ * fVar129 + (float)local_b00._4_4_ * fVar260;
                fVar281 = fStack_ae8 * fVar238 + fStack_af8 * fVar261;
                fVar282 = fStack_ae4 * fVar280 + fStack_af4 * fVar262;
                auVar294._0_4_ =
                     fVar211 * ((float)local_b00._0_4_ * fVar258 + fVar211 * (float)local_ae0._0_4_)
                     + fVar258 * fVar263;
                auVar294._4_4_ =
                     fVar260 * ((float)local_b00._4_4_ * fVar129 + fVar260 * (float)local_ae0._4_4_)
                     + fVar129 * fVar279;
                auVar294._8_4_ =
                     fVar261 * (fStack_af8 * fVar238 + fVar261 * fStack_ad8) + fVar238 * fVar281;
                auVar294._12_4_ =
                     fVar262 * (fStack_af4 * fVar280 + fVar262 * fStack_ad4) + fVar280 * fVar282;
                auVar246._0_4_ =
                     fVar211 * fVar263 +
                     fVar258 * (fVar258 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar211)
                ;
                auVar246._4_4_ =
                     fVar260 * fVar279 +
                     fVar129 * (fVar129 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar260)
                ;
                auVar246._8_4_ =
                     fVar261 * fVar281 + fVar238 * (fVar238 * fStack_b08 + fStack_ae8 * fVar261);
                auVar246._12_4_ =
                     fVar262 * fVar282 + fVar280 * (fVar280 * fStack_b04 + fStack_ae4 * fVar262);
                auVar180 = vshufps_avx(auVar407._0_16_,auVar407._0_16_,0);
                auVar183._0_4_ = auVar180._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar183._4_4_ = auVar180._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar183._8_4_ = auVar180._8_4_ * fStack_9c8 + 0.0;
                auVar183._12_4_ = auVar180._12_4_ * fStack_9c4 + 0.0;
                auVar138._0_4_ = fVar211 * auVar294._0_4_ + fVar258 * auVar246._0_4_;
                auVar138._4_4_ = fVar260 * auVar294._4_4_ + fVar129 * auVar246._4_4_;
                auVar138._8_4_ = fVar261 * auVar294._8_4_ + fVar238 * auVar246._8_4_;
                auVar138._12_4_ = fVar262 * auVar294._12_4_ + fVar280 * auVar246._12_4_;
                local_9a0._0_16_ = auVar138;
                auVar11 = vsubps_avx(auVar183,auVar138);
                auVar180 = vdpps_avx(auVar11,auVar11,0x7f);
                fVar258 = auVar180._0_4_;
                if (fVar258 < 0.0) {
                  fVar129 = sqrtf(fVar258);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar43 = vsqrtss_avx(auVar180,auVar180);
                  fVar129 = auVar43._0_4_;
                }
                auVar43 = vsubps_avx(auVar246,auVar294);
                auVar323._0_4_ = auVar43._0_4_ * 3.0;
                auVar323._4_4_ = auVar43._4_4_ * 3.0;
                auVar323._8_4_ = auVar43._8_4_ * 3.0;
                auVar323._12_4_ = auVar43._12_4_ * 3.0;
                auVar43 = vshufps_avx(ZEXT416((uint)(fVar318 * 6.0)),ZEXT416((uint)(fVar318 * 6.0)),
                                      0);
                auVar134 = ZEXT416((uint)((fVar259 - (fVar318 + fVar318)) * 6.0));
                auVar221 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = ZEXT416((uint)((fVar318 - (fVar259 + fVar259)) * 6.0));
                auVar243 = vshufps_avx(auVar134,auVar134,0);
                auVar12 = vshufps_avx(ZEXT416((uint)(fVar259 * 6.0)),ZEXT416((uint)(fVar259 * 6.0)),
                                      0);
                auVar134 = vdpps_avx(auVar323,auVar323,0x7f);
                auVar184._0_4_ =
                     auVar12._0_4_ * (float)local_ae0._0_4_ +
                     auVar243._0_4_ * (float)local_b00._0_4_ +
                     auVar43._0_4_ * (float)local_b10._0_4_ +
                     auVar221._0_4_ * (float)local_af0._0_4_;
                auVar184._4_4_ =
                     auVar12._4_4_ * (float)local_ae0._4_4_ +
                     auVar243._4_4_ * (float)local_b00._4_4_ +
                     auVar43._4_4_ * (float)local_b10._4_4_ +
                     auVar221._4_4_ * (float)local_af0._4_4_;
                auVar184._8_4_ =
                     auVar12._8_4_ * fStack_ad8 +
                     auVar243._8_4_ * fStack_af8 +
                     auVar43._8_4_ * fStack_b08 + auVar221._8_4_ * fStack_ae8;
                auVar184._12_4_ =
                     auVar12._12_4_ * fStack_ad4 +
                     auVar243._12_4_ * fStack_af4 +
                     auVar43._12_4_ * fStack_b04 + auVar221._12_4_ * fStack_ae4;
                auVar43 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar221 = vrsqrtss_avx(auVar43,auVar43);
                fVar280 = auVar221._0_4_;
                fVar238 = auVar134._0_4_;
                auVar221 = vdpps_avx(auVar323,auVar184,0x7f);
                auVar243 = vshufps_avx(auVar134,auVar134,0);
                auVar185._0_4_ = auVar184._0_4_ * auVar243._0_4_;
                auVar185._4_4_ = auVar184._4_4_ * auVar243._4_4_;
                auVar185._8_4_ = auVar184._8_4_ * auVar243._8_4_;
                auVar185._12_4_ = auVar184._12_4_ * auVar243._12_4_;
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar271._0_4_ = auVar323._0_4_ * auVar221._0_4_;
                auVar271._4_4_ = auVar323._4_4_ * auVar221._4_4_;
                auVar271._8_4_ = auVar323._8_4_ * auVar221._8_4_;
                auVar271._12_4_ = auVar323._12_4_ * auVar221._12_4_;
                auVar12 = vsubps_avx(auVar185,auVar271);
                auVar221 = vrcpss_avx(auVar43,auVar43);
                auVar43 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar407._0_4_ * (float)local_980._0_4_)));
                auVar221 = ZEXT416((uint)(auVar221._0_4_ * (2.0 - fVar238 * auVar221._0_4_)));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                uVar124 = CONCAT44(auVar323._4_4_,auVar323._0_4_);
                auVar295._0_8_ = uVar124 ^ 0x8000000080000000;
                auVar295._8_4_ = -auVar323._8_4_;
                auVar295._12_4_ = -auVar323._12_4_;
                auVar243 = ZEXT416((uint)(fVar280 * 1.5 +
                                         fVar238 * -0.5 * fVar280 * fVar280 * fVar280));
                auVar243 = vshufps_avx(auVar243,auVar243,0);
                auVar247._0_4_ = auVar243._0_4_ * auVar12._0_4_ * auVar221._0_4_;
                auVar247._4_4_ = auVar243._4_4_ * auVar12._4_4_ * auVar221._4_4_;
                auVar247._8_4_ = auVar243._8_4_ * auVar12._8_4_ * auVar221._8_4_;
                auVar247._12_4_ = auVar243._12_4_ * auVar12._12_4_ * auVar221._12_4_;
                auVar371._0_4_ = auVar323._0_4_ * auVar243._0_4_;
                auVar371._4_4_ = auVar323._4_4_ * auVar243._4_4_;
                auVar371._8_4_ = auVar323._8_4_ * auVar243._8_4_;
                auVar371._12_4_ = auVar323._12_4_ * auVar243._12_4_;
                if (fVar238 < 0.0) {
                  local_a00._0_16_ = auVar295;
                  local_a20._0_16_ = auVar371;
                  local_a40._0_16_ = auVar247;
                  fVar238 = sqrtf(fVar238);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar247 = local_a40._0_16_;
                  auVar295 = local_a00._0_16_;
                  auVar371 = local_a20._0_16_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar238 = auVar134._0_4_;
                }
                auVar134 = vdpps_avx(auVar11,auVar371,0x7f);
                fVar129 = ((float)local_aa0._0_4_ / fVar238) * (fVar129 + 1.0) +
                          auVar43._0_4_ + fVar129 * (float)local_aa0._0_4_;
                auVar221 = vdpps_avx(auVar295,auVar371,0x7f);
                auVar243 = vdpps_avx(auVar11,auVar247,0x7f);
                auVar12 = vdpps_avx(_local_9d0,auVar371,0x7f);
                auVar13 = vdpps_avx(auVar11,auVar295,0x7f);
                fVar238 = auVar221._0_4_ + auVar243._0_4_;
                fVar280 = auVar134._0_4_;
                auVar139._0_4_ = fVar280 * fVar280;
                auVar139._4_4_ = auVar134._4_4_ * auVar134._4_4_;
                auVar139._8_4_ = auVar134._8_4_ * auVar134._8_4_;
                auVar139._12_4_ = auVar134._12_4_ * auVar134._12_4_;
                auVar243 = vsubps_avx(auVar180,auVar139);
                auVar221 = vdpps_avx(auVar11,_local_9d0,0x7f);
                fVar259 = auVar13._0_4_ - fVar280 * fVar238;
                fVar211 = auVar221._0_4_ - fVar280 * auVar12._0_4_;
                auVar221 = vrsqrtss_avx(auVar243,auVar243);
                fVar260 = auVar243._0_4_;
                fVar280 = auVar221._0_4_;
                fVar280 = fVar280 * 1.5 + fVar260 * -0.5 * fVar280 * fVar280 * fVar280;
                if (fVar260 < 0.0) {
                  local_a00._0_4_ = fVar129;
                  local_a20._0_16_ = ZEXT416((uint)fVar238);
                  local_a40._0_16_ = auVar12;
                  local_7c0._0_4_ = fVar259;
                  local_7e0._0_4_ = fVar211;
                  local_800._0_4_ = fVar280;
                  fVar260 = sqrtf(fVar260);
                  auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar129 = (float)local_a00._0_4_;
                  fVar280 = (float)local_800._0_4_;
                  fVar259 = (float)local_7c0._0_4_;
                  fVar211 = (float)local_7e0._0_4_;
                  auVar12 = local_a40._0_16_;
                  auVar221 = local_a20._0_16_;
                }
                else {
                  auVar221 = vsqrtss_avx(auVar243,auVar243);
                  fVar260 = auVar221._0_4_;
                  auVar221 = ZEXT416((uint)fVar238);
                }
                auVar433 = ZEXT1664(auVar323);
                auVar179 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar14 = vshufps_avx(auVar323,auVar323,0xff);
                fVar238 = fVar259 * fVar280 - auVar14._0_4_;
                auVar272._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
                auVar272._8_4_ = auVar12._8_4_ ^ 0x80000000;
                auVar272._12_4_ = auVar12._12_4_ ^ 0x80000000;
                auVar296._0_4_ = -fVar238;
                auVar296._4_4_ = 0x80000000;
                auVar296._8_4_ = 0x80000000;
                auVar296._12_4_ = 0x80000000;
                fVar259 = auVar221._0_4_ * fVar211 * fVar280;
                auVar330 = ZEXT464((uint)fVar259);
                auVar243 = vinsertps_avx(ZEXT416((uint)(fVar211 * fVar280)),auVar272,0x10);
                auVar13 = vmovsldup_avx(ZEXT416((uint)(fVar259 - auVar12._0_4_ * fVar238)));
                auVar243 = vdivps_avx(auVar243,auVar13);
                auVar179 = ZEXT416((uint)(fVar260 - auVar179._0_4_));
                auVar12 = vinsertps_avx(auVar134,auVar179,0x10);
                auVar248._0_4_ = auVar12._0_4_ * auVar243._0_4_;
                auVar248._4_4_ = auVar12._4_4_ * auVar243._4_4_;
                auVar248._8_4_ = auVar12._8_4_ * auVar243._8_4_;
                auVar248._12_4_ = auVar12._12_4_ * auVar243._12_4_;
                auVar221 = vinsertps_avx(auVar296,auVar221,0x1c);
                auVar221 = vdivps_avx(auVar221,auVar13);
                auVar225._0_4_ = auVar12._0_4_ * auVar221._0_4_;
                auVar225._4_4_ = auVar12._4_4_ * auVar221._4_4_;
                auVar225._8_4_ = auVar12._8_4_ * auVar221._8_4_;
                auVar225._12_4_ = auVar12._12_4_ * auVar221._12_4_;
                auVar221 = vhaddps_avx(auVar248,auVar248);
                auVar243 = vhaddps_avx(auVar225,auVar225);
                fVar318 = fVar318 - auVar221._0_4_;
                fVar238 = auVar407._0_4_ - auVar243._0_4_;
                auVar407 = ZEXT464((uint)fVar238);
                auVar273._8_4_ = 0x7fffffff;
                auVar273._0_8_ = 0x7fffffff7fffffff;
                auVar273._12_4_ = 0x7fffffff;
                auVar257 = ZEXT1664(auVar273);
                auVar134 = vandps_avx(auVar134,auVar273);
                if (fVar129 <= auVar134._0_4_) {
LAB_012537fb:
                  bVar96 = false;
                }
                else {
                  auVar134 = vandps_avx(auVar179,auVar273);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar43._0_4_ + fVar129 <=
                      auVar134._0_4_) goto LAB_012537fb;
                  fVar238 = fVar238 + (float)local_940._0_4_;
                  auVar407 = ZEXT464((uint)fVar238);
                  bVar96 = true;
                  if ((((fVar239 <= fVar238) &&
                       (fVar129 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar129)) &&
                      (0.0 <= fVar318)) && (fVar318 <= 1.0)) {
                    auVar180 = vrsqrtss_avx(auVar180,auVar180);
                    fVar280 = auVar180._0_4_;
                    pGVar28 = (context->scene->geometries).items[uVar117].ptr;
                    if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar180 = ZEXT416((uint)(fVar280 * 1.5 +
                                               fVar258 * -0.5 * fVar280 * fVar280 * fVar280));
                      auVar180 = vshufps_avx(auVar180,auVar180,0);
                      local_ba0 = auVar11._0_4_;
                      fStack_b9c = auVar11._4_4_;
                      fStack_b98 = auVar11._8_4_;
                      fStack_b94 = auVar11._12_4_;
                      auVar186._0_4_ = auVar180._0_4_ * local_ba0;
                      auVar186._4_4_ = auVar180._4_4_ * fStack_b9c;
                      auVar186._8_4_ = auVar180._8_4_ * fStack_b98;
                      auVar186._12_4_ = auVar180._12_4_ * fStack_b94;
                      auVar140._0_4_ = auVar323._0_4_ + auVar14._0_4_ * auVar186._0_4_;
                      auVar140._4_4_ = auVar323._4_4_ + auVar14._4_4_ * auVar186._4_4_;
                      auVar140._8_4_ = auVar323._8_4_ + auVar14._8_4_ * auVar186._8_4_;
                      auVar140._12_4_ = auVar323._12_4_ + auVar14._12_4_ * auVar186._12_4_;
                      auVar180 = vshufps_avx(auVar186,auVar186,0xc9);
                      auVar11 = vshufps_avx(auVar323,auVar323,0xc9);
                      auVar187._0_4_ = auVar11._0_4_ * auVar186._0_4_;
                      auVar187._4_4_ = auVar11._4_4_ * auVar186._4_4_;
                      auVar187._8_4_ = auVar11._8_4_ * auVar186._8_4_;
                      auVar187._12_4_ = auVar11._12_4_ * auVar186._12_4_;
                      auVar226._0_4_ = auVar323._0_4_ * auVar180._0_4_;
                      auVar226._4_4_ = auVar323._4_4_ * auVar180._4_4_;
                      auVar226._8_4_ = auVar323._8_4_ * auVar180._8_4_;
                      auVar226._12_4_ = auVar323._12_4_ * auVar180._12_4_;
                      auVar43 = vsubps_avx(auVar226,auVar187);
                      auVar180 = vshufps_avx(auVar43,auVar43,0xc9);
                      auVar11 = vshufps_avx(auVar140,auVar140,0xc9);
                      auVar227._0_4_ = auVar11._0_4_ * auVar180._0_4_;
                      auVar227._4_4_ = auVar11._4_4_ * auVar180._4_4_;
                      auVar227._8_4_ = auVar11._8_4_ * auVar180._8_4_;
                      auVar227._12_4_ = auVar11._12_4_ * auVar180._12_4_;
                      auVar180 = vshufps_avx(auVar43,auVar43,0xd2);
                      auVar141._0_4_ = auVar140._0_4_ * auVar180._0_4_;
                      auVar141._4_4_ = auVar140._4_4_ * auVar180._4_4_;
                      auVar141._8_4_ = auVar140._8_4_ * auVar180._8_4_;
                      auVar141._12_4_ = auVar140._12_4_ * auVar180._12_4_;
                      auVar180 = vsubps_avx(auVar227,auVar141);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        uVar9 = vextractps_avx(auVar180,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                        uVar9 = vextractps_avx(auVar180,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar180._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar318;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar117;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar33 = context->user;
                        auStack_5b0 = vshufps_avx(ZEXT416((uint)fVar318),ZEXT416((uint)fVar318),0);
                        auStack_610 = vshufps_avx(auVar180,auVar180,0x55);
                        auStack_5f0 = vshufps_avx(auVar180,auVar180,0xaa);
                        auStack_5d0 = vshufps_avx(auVar180,auVar180,0);
                        local_620 = (RTCHitN  [16])auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = ZEXT832(0) << 0x20;
                        local_580 = local_500._0_8_;
                        uStack_578 = local_500._8_8_;
                        uStack_570 = local_500._16_8_;
                        uStack_568 = local_500._24_8_;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_a70[1] = local_9c0;
                        *local_a70 = local_9c0;
                        local_540 = pRVar33->instID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        local_520 = pRVar33->instPrimID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar28->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_620;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar28->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar330 = ZEXT464((uint)fVar259);
                          auVar433 = ZEXT1664(auVar323);
                          (*pGVar28->intersectionFilterN)(&local_ad0);
                        }
                        auVar107._8_8_ = uStack_b38;
                        auVar107._0_8_ = local_b40;
                        auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,auVar107);
                        auVar111._8_8_ = uStack_b28;
                        auVar111._0_8_ = local_b30;
                        auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,auVar111);
                        auVar157._16_16_ = auVar11;
                        auVar157._0_16_ = auVar180;
                        auVar142 = local_9c0 & ~auVar157;
                        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar142 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar142 >> 0x7f,0) == '\0')
                              && (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar142 >> 0xbf,0) == '\0') &&
                            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar142[0x1f]) {
                          auVar158._0_4_ = auVar180._0_4_ ^ local_9c0._0_4_;
                          auVar158._4_4_ = auVar180._4_4_ ^ local_9c0._4_4_;
                          auVar158._8_4_ = auVar180._8_4_ ^ local_9c0._8_4_;
                          auVar158._12_4_ = auVar180._12_4_ ^ local_9c0._12_4_;
                          auVar158._16_4_ = auVar11._0_4_ ^ local_9c0._16_4_;
                          auVar158._20_4_ = auVar11._4_4_ ^ local_9c0._20_4_;
                          auVar158._24_4_ = auVar11._8_4_ ^ local_9c0._24_4_;
                          auVar158._28_4_ = auVar11._12_4_ ^ local_9c0._28_4_;
                          auVar355 = ZEXT864(0);
                          auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var32 = context->args->filter;
                          auVar355 = ZEXT1664(ZEXT816(0));
                          auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar330 = ZEXT1664(auVar330._0_16_);
                            auVar433 = ZEXT1664(auVar433._0_16_);
                            (*p_Var32)(&local_ad0);
                            auVar257 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar108._8_8_ = uStack_b38;
                          auVar108._0_8_ = local_b40;
                          auVar180 = vpcmpeqd_avx((undefined1  [16])0x0,auVar108);
                          auVar112._8_8_ = uStack_b28;
                          auVar112._0_8_ = local_b30;
                          auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                          auVar209._16_16_ = auVar11;
                          auVar209._0_16_ = auVar180;
                          auVar158._0_4_ = auVar180._0_4_ ^ local_9c0._0_4_;
                          auVar158._4_4_ = auVar180._4_4_ ^ local_9c0._4_4_;
                          auVar158._8_4_ = auVar180._8_4_ ^ local_9c0._8_4_;
                          auVar158._12_4_ = auVar180._12_4_ ^ local_9c0._12_4_;
                          auVar158._16_4_ = auVar11._0_4_ ^ local_9c0._16_4_;
                          auVar158._20_4_ = auVar11._4_4_ ^ local_9c0._20_4_;
                          auVar158._24_4_ = auVar11._8_4_ ^ local_9c0._24_4_;
                          auVar158._28_4_ = auVar11._12_4_ ^ local_9c0._28_4_;
                          auVar142 = local_9c0 & ~auVar209;
                          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar142 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar142 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar142 >> 0x7f,0) != '\0') ||
                                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar142 >> 0xbf,0) != '\0') ||
                              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar142[0x1f] < '\0') {
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar142;
                            auVar142 = vmaskmovps_avx(auVar158,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar142;
                          }
                        }
                        auVar407 = ZEXT464((uint)fVar238);
                        if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar158 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar158 >> 0x7f,0) == '\0')
                              && (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar158 >> 0xbf,0) == '\0') &&
                            (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar158[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar129;
                        }
                      }
                    }
                  }
                }
                bVar126 = lVar121 != 0;
                lVar121 = lVar121 + -1;
              } while ((!bVar96) && (bVar126));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar159._4_4_ = uVar9;
              auVar159._0_4_ = uVar9;
              auVar159._8_4_ = uVar9;
              auVar159._12_4_ = uVar9;
              auVar159._16_4_ = uVar9;
              auVar159._20_4_ = uVar9;
              auVar159._24_4_ = uVar9;
              auVar159._28_4_ = uVar9;
              auVar151 = vcmpps_avx(_local_8a0,auVar159,2);
              auVar142 = vandps_avx(auVar151,local_740);
              local_740 = local_740 & auVar151;
              uVar124 = local_760;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar142 = vandps_avx(local_6a0,local_680);
          auVar151 = vandps_avx(_local_920,_local_8c0);
          auVar235._0_4_ = (float)local_820._0_4_ + local_4a0._0_4_;
          auVar235._4_4_ = (float)local_820._4_4_ + local_4a0._4_4_;
          auVar235._8_4_ = fStack_818 + local_4a0._8_4_;
          auVar235._12_4_ = fStack_814 + local_4a0._12_4_;
          auVar235._16_4_ = fStack_810 + local_4a0._16_4_;
          auVar235._20_4_ = fStack_80c + local_4a0._20_4_;
          auVar235._24_4_ = fStack_808 + local_4a0._24_4_;
          auVar235._28_4_ = fStack_804 + local_4a0._28_4_;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar278._4_4_ = uVar9;
          auVar278._0_4_ = uVar9;
          auVar278._8_4_ = uVar9;
          auVar278._12_4_ = uVar9;
          auVar278._16_4_ = uVar9;
          auVar278._20_4_ = uVar9;
          auVar278._24_4_ = uVar9;
          auVar278._28_4_ = uVar9;
          auVar34 = vcmpps_avx(auVar235,auVar278,2);
          auVar142 = vandps_avx(auVar34,auVar142);
          auVar304._0_4_ = (float)local_820._0_4_ + local_460._0_4_;
          auVar304._4_4_ = (float)local_820._4_4_ + local_460._4_4_;
          auVar304._8_4_ = fStack_818 + local_460._8_4_;
          auVar304._12_4_ = fStack_814 + local_460._12_4_;
          auVar304._16_4_ = fStack_810 + local_460._16_4_;
          auVar304._20_4_ = fStack_80c + local_460._20_4_;
          auVar304._24_4_ = fStack_808 + local_460._24_4_;
          auVar304._28_4_ = fStack_804 + local_460._28_4_;
          auVar34 = vcmpps_avx(auVar304,auVar278,2);
          auVar151 = vandps_avx(auVar34,auVar151);
          auVar151 = vorps_avx(auVar142,auVar151);
          if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar151 >> 0x7f,0) != '\0') ||
                (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar151 >> 0xbf,0) != '\0') ||
              (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar151[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar118 * 0x60) = auVar151;
            auVar142 = vblendvps_avx(_local_460,_local_4a0,auVar142);
            *(undefined1 (*) [32])(auStack_160 + uVar118 * 0x60) = auVar142;
            auVar114._8_8_ = uStack_948;
            auVar114._0_8_ = local_950;
            uVar10 = vmovlps_avx(auVar114);
            *(undefined8 *)(afStack_140 + uVar118 * 0x18) = uVar10;
            auStack_138[uVar118 * 0x18] = (int)uVar124 + 1;
            uVar118 = (ulong)((int)uVar118 + 1);
          }
          auVar275._8_4_ = 0x3f800000;
          auVar275._0_8_ = &DAT_3f8000003f800000;
          auVar275._12_4_ = 0x3f800000;
          auVar275._16_4_ = 0x3f800000;
          auVar275._20_4_ = 0x3f800000;
          auVar275._24_4_ = 0x3f800000;
          auVar275._28_4_ = 0x3f800000;
          goto LAB_012521be;
        }
        auVar275._8_4_ = 0x3f800000;
        auVar275._0_8_ = &DAT_3f8000003f800000;
        auVar275._12_4_ = 0x3f800000;
        auVar275._16_4_ = 0x3f800000;
        auVar275._20_4_ = 0x3f800000;
        auVar275._24_4_ = 0x3f800000;
        auVar275._28_4_ = 0x3f800000;
      }
      auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
    }
LAB_012521be:
    do {
      if ((int)uVar118 == 0) {
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar160._4_4_ = uVar9;
        auVar160._0_4_ = uVar9;
        auVar160._8_4_ = uVar9;
        auVar160._12_4_ = uVar9;
        auVar160._16_4_ = uVar9;
        auVar160._20_4_ = uVar9;
        auVar160._24_4_ = uVar9;
        auVar160._28_4_ = uVar9;
        auVar142 = vcmpps_avx(local_400,auVar160,2);
        uVar117 = vmovmskps_avx(auVar142);
        uVar117 = (uint)local_928 - 1 & (uint)local_928 & uVar117;
        if (uVar117 == 0) {
          return;
        }
        goto LAB_0125101d;
      }
      uVar125 = (ulong)((int)uVar118 - 1);
      lVar121 = uVar125 * 0x60;
      auVar142 = *(undefined1 (*) [32])(auStack_160 + lVar121);
      auVar150._0_4_ = auVar142._0_4_ + (float)local_820._0_4_;
      auVar150._4_4_ = auVar142._4_4_ + (float)local_820._4_4_;
      auVar150._8_4_ = auVar142._8_4_ + fStack_818;
      auVar150._12_4_ = auVar142._12_4_ + fStack_814;
      auVar150._16_4_ = auVar142._16_4_ + fStack_810;
      auVar150._20_4_ = auVar142._20_4_ + fStack_80c;
      auVar150._24_4_ = auVar142._24_4_ + fStack_808;
      auVar150._28_4_ = auVar142._28_4_ + fStack_804;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar256._4_4_ = uVar9;
      auVar256._0_4_ = uVar9;
      auVar256._8_4_ = uVar9;
      auVar256._12_4_ = uVar9;
      auVar256._16_4_ = uVar9;
      auVar256._20_4_ = uVar9;
      auVar256._24_4_ = uVar9;
      auVar256._28_4_ = uVar9;
      auVar34 = vcmpps_avx(auVar150,auVar256,2);
      auVar151 = vandps_avx(auVar34,*(undefined1 (*) [32])(auStack_180 + lVar121));
      _local_620 = auVar151;
      auVar35 = *(undefined1 (*) [32])(auStack_180 + lVar121) & auVar34;
      bVar101 = (auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar102 = (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar100 = (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar99 = SUB321(auVar35 >> 0x7f,0) == '\0';
      bVar98 = (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar97 = SUB321(auVar35 >> 0xbf,0) == '\0';
      bVar126 = (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar96 = -1 < auVar35[0x1f];
      if (((((((!bVar101 || !bVar102) || !bVar100) || !bVar99) || !bVar98) || !bVar97) || !bVar126)
          || !bVar96) {
        auVar231._8_4_ = 0x7f800000;
        auVar231._0_8_ = 0x7f8000007f800000;
        auVar231._12_4_ = 0x7f800000;
        auVar231._16_4_ = 0x7f800000;
        auVar231._20_4_ = 0x7f800000;
        auVar231._24_4_ = 0x7f800000;
        auVar231._28_4_ = 0x7f800000;
        auVar142 = vblendvps_avx(auVar231,auVar142,auVar151);
        auVar34 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar34 = vminps_avx(auVar142,auVar34);
        auVar35 = vshufpd_avx(auVar34,auVar34,5);
        auVar35 = vminps_avx(auVar34,auVar35);
        auVar34 = vperm2f128_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar35,auVar34);
        auVar142 = vcmpps_avx(auVar142,auVar35,0);
        auVar35 = auVar151 & auVar142;
        if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0x7f,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0xbf,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar35[0x1f] < '\0') {
          auVar151 = vandps_avx(auVar142,auVar151);
        }
        fVar318 = afStack_140[uVar125 * 0x18 + 1];
        uVar124 = (ulong)auStack_138[uVar125 * 0x18];
        uVar122 = vmovmskps_avx(auVar151);
        uVar119 = 0;
        if (uVar122 != 0) {
          for (; (uVar122 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
          }
        }
        fVar258 = afStack_140[uVar125 * 0x18];
        *(undefined4 *)(local_620 + (ulong)uVar119 * 4) = 0;
        if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_620 >> 0x7f,0) != '\0') ||
              (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_620 >> 0xbf,0) != '\0') ||
            (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_620[0x1f] < '\0') {
          uVar125 = uVar118;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar121) = _local_620;
        auVar180 = vshufps_avx(ZEXT416((uint)(fVar318 - fVar258)),ZEXT416((uint)(fVar318 - fVar258))
                               ,0);
        local_4a0._4_4_ = fVar258 + auVar180._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar258 + auVar180._0_4_ * 0.0;
        fStack_498 = fVar258 + auVar180._8_4_ * 0.2857143;
        fStack_494 = fVar258 + auVar180._12_4_ * 0.42857146;
        fStack_490 = fVar258 + auVar180._0_4_ * 0.5714286;
        fStack_48c = fVar258 + auVar180._4_4_ * 0.71428573;
        fStack_488 = fVar258 + auVar180._8_4_ * 0.8571429;
        fStack_484 = fVar258 + auVar180._12_4_;
        local_950 = *(undefined8 *)(local_4a0 + (ulong)uVar119 * 4);
        uStack_948 = 0;
      }
      uVar118 = uVar125;
      auVar257 = ZEXT3264(auVar34);
    } while (((((((bVar101 && bVar102) && bVar100) && bVar99) && bVar98) && bVar97) && bVar126) &&
             bVar96);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }